

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [24];
  undefined1 auVar260 [24];
  undefined1 auVar261 [24];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined8 in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar271;
  double dVar272;
  float fVar276;
  float fVar277;
  undefined1 auVar273 [32];
  float fVar275;
  undefined1 auVar274 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 in_ZMM16 [64];
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  Mat tmp;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  __m256 two;
  __m256 one_2;
  __m256 two_2;
  __m256 one_12;
  __m256 y_1;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 y_7;
  __m256 z_2;
  __m256 tmp_8;
  __m256 mask_7;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_11;
  __m256i imm0_4;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp_1;
  __m256 pow2n_4;
  __m256 y_6;
  __m256 mask_6;
  __m256 one_10;
  __m256i imm0_3;
  __m256 fx_4;
  __m256 tmp_7;
  __m256 one_13;
  __m256 pow2n_5;
  __m256 y_8;
  __m256 mask_8;
  __m256 one_14;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_9;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_3;
  __m128 two_1;
  __m128 one_7;
  __m128 two_3;
  __m128 one_17;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_5;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf y_10;
  v4sf z_3;
  v4sf tmp_11;
  v4sf mask_10;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_16;
  v4si emm0_4;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_4;
  v4sf pow2n_6;
  v4sf y_9;
  v4sf mask_9;
  v4sf one_15;
  v4si emm0_3;
  v4sf fx_6;
  v4sf tmp_10;
  __m128 one_18;
  v4sf pow2n_7;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_19;
  v4si emm0_5;
  v4sf fx_7;
  v4sf tmp_12;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_6;
  Option *in_stack_ffffffffffff81d0;
  undefined8 in_stack_ffffffffffff81d8;
  int _elempack;
  Mat *in_stack_ffffffffffff81e0;
  Mat *in_stack_ffffffffffff81e8;
  undefined8 local_7d10;
  undefined8 uStack_7d08;
  undefined8 local_7d00;
  undefined8 uStack_7cf8;
  undefined8 uStack_7cf0;
  undefined8 uStack_7ce8;
  int local_7ccc;
  undefined8 local_7cc8;
  undefined8 local_7cc0;
  undefined8 local_7cb8;
  undefined4 local_7cb0;
  long local_7ca8;
  undefined4 local_7ca0;
  undefined4 local_7c9c;
  undefined4 local_7c98;
  undefined4 local_7c94;
  undefined4 local_7c90;
  undefined8 local_7c88;
  undefined1 (*local_7c80) [32];
  int local_7c74;
  undefined8 local_7c70;
  undefined8 uStack_7c68;
  int local_7c5c;
  undefined1 (*local_7c10) [16];
  int local_7c04;
  undefined8 local_7c00;
  undefined8 uStack_7bf8;
  undefined8 uStack_7bf0;
  undefined8 uStack_7be8;
  int local_7bd4;
  undefined1 (*local_7b88) [32];
  int local_7b80;
  void *local_7b70;
  int *local_7b68;
  undefined8 local_7b60;
  undefined4 local_7b58;
  long *local_7b50;
  undefined4 local_7b48;
  undefined4 local_7b44;
  undefined4 local_7b40;
  undefined4 local_7b3c;
  undefined4 local_7b38;
  undefined8 local_7b30;
  int local_7b24;
  int local_7b20;
  int local_7b1c;
  int local_7b18;
  int local_7b14;
  undefined8 local_7b10;
  long *local_7b08;
  int local_7af4;
  void **local_7af0;
  void **local_7ae8;
  undefined8 *local_7ab8;
  undefined1 local_7aa5;
  int local_7aa4;
  undefined8 *local_7a98;
  undefined8 *local_7a48;
  undefined1 (*local_7a30) [32];
  undefined8 local_7a20;
  undefined8 uStack_7a18;
  undefined8 uStack_7a10;
  undefined8 uStack_7a08;
  undefined8 local_79e0;
  undefined8 uStack_79d8;
  undefined8 uStack_79d0;
  undefined8 uStack_79c8;
  undefined1 (*local_79a8) [32];
  undefined1 (*local_7970) [32];
  undefined8 local_7960;
  undefined8 uStack_7958;
  undefined8 local_7940;
  undefined8 uStack_7938;
  undefined1 (*local_7928) [32];
  undefined8 *local_78b8;
  int local_7860;
  undefined4 local_785c;
  void **local_7858;
  void *local_7850;
  long local_7788;
  undefined4 local_777c;
  long local_7778;
  undefined1 (*local_7770) [32];
  undefined4 local_7764;
  int local_7760;
  int local_775c;
  undefined8 *local_7758;
  undefined4 local_774c;
  long local_7748;
  float local_7720;
  float fStack_771c;
  float fStack_7718;
  float fStack_7714;
  float local_7700;
  float fStack_76fc;
  float fStack_76f8;
  float fStack_76f4;
  float fStack_76f0;
  float fStack_76ec;
  float fStack_76e8;
  undefined4 uStack_76e4;
  undefined1 local_76e0 [8];
  float fStack_76d8;
  float fStack_76d4;
  undefined1 local_76c0 [8];
  float fStack_76b8;
  float fStack_76b4;
  float fStack_76b0;
  float fStack_76ac;
  float fStack_76a8;
  undefined4 uStack_76a4;
  undefined8 local_7600;
  undefined8 uStack_75f8;
  undefined8 uStack_75f0;
  undefined8 uStack_75e8;
  undefined8 local_75e0;
  undefined8 uStack_75d8;
  undefined8 uStack_75d0;
  undefined8 uStack_75c8;
  undefined8 local_75c0;
  undefined8 uStack_75b8;
  undefined8 uStack_75b0;
  undefined8 uStack_75a8;
  undefined8 local_75a0;
  undefined8 uStack_7598;
  undefined8 uStack_7590;
  undefined8 uStack_7588;
  undefined8 local_7580;
  undefined8 uStack_7578;
  undefined8 uStack_7570;
  undefined8 uStack_7568;
  undefined1 local_7560 [16];
  undefined8 uStack_7550;
  undefined8 uStack_7548;
  undefined1 local_74e0 [8];
  float fStack_74d8;
  float fStack_74d4;
  undefined8 uStack_74d0;
  undefined8 uStack_74c8;
  undefined1 local_7460 [8];
  float fStack_7458;
  float fStack_7454;
  undefined8 uStack_7450;
  undefined8 uStack_7448;
  undefined1 local_7380 [32];
  undefined1 local_7360 [32];
  undefined1 local_7340 [32];
  undefined1 local_7320 [32];
  undefined1 local_7300 [8];
  undefined8 uStack_72f8;
  undefined8 uStack_72f0;
  undefined8 uStack_72e8;
  undefined1 local_72e0 [32];
  undefined4 local_72c0;
  undefined4 uStack_72bc;
  undefined4 uStack_72b8;
  undefined4 uStack_72b4;
  undefined4 uStack_72b0;
  undefined4 uStack_72ac;
  undefined4 uStack_72a8;
  undefined4 uStack_72a4;
  undefined1 local_72a0 [32];
  undefined1 local_7280 [8];
  undefined8 uStack_7278;
  undefined8 uStack_7270;
  undefined8 uStack_7268;
  undefined8 local_7260;
  undefined8 uStack_7258;
  undefined8 uStack_7250;
  undefined8 uStack_7248;
  undefined8 local_7240;
  undefined8 uStack_7238;
  undefined8 uStack_7230;
  undefined8 uStack_7228;
  undefined8 local_7220;
  undefined8 uStack_7218;
  undefined8 uStack_7210;
  undefined8 uStack_7208;
  undefined8 local_7200;
  undefined8 uStack_71f8;
  undefined8 uStack_71f0;
  undefined8 uStack_71e8;
  undefined8 local_71e0;
  undefined8 uStack_71d8;
  undefined8 uStack_71d0;
  undefined8 uStack_71c8;
  undefined8 local_71c0;
  undefined8 uStack_71b8;
  undefined8 uStack_71b0;
  undefined8 uStack_71a8;
  undefined8 local_71a0;
  undefined8 uStack_7198;
  undefined8 uStack_7190;
  undefined8 uStack_7188;
  undefined8 local_7180;
  undefined8 uStack_7178;
  undefined8 uStack_7170;
  undefined8 uStack_7168;
  undefined8 local_7160;
  undefined8 uStack_7158;
  undefined8 uStack_7150;
  undefined8 uStack_7148;
  undefined8 local_7140;
  undefined8 uStack_7138;
  undefined8 uStack_7130;
  undefined8 uStack_7128;
  undefined8 local_7120;
  undefined8 uStack_7118;
  undefined8 uStack_7110;
  undefined8 uStack_7108;
  undefined8 local_7100;
  undefined8 uStack_70f8;
  undefined8 uStack_70f0;
  undefined8 uStack_70e8;
  float local_7040;
  float fStack_703c;
  float fStack_7038;
  float fStack_7034;
  float fStack_7030;
  float fStack_702c;
  float fStack_7028;
  float fStack_7024;
  float local_7020;
  float fStack_701c;
  float fStack_7018;
  float fStack_7014;
  float fStack_7010;
  float fStack_700c;
  float fStack_7008;
  float fStack_7004;
  undefined8 local_6fe0;
  undefined8 uStack_6fd8;
  undefined8 uStack_6fd0;
  undefined8 uStack_6fc8;
  undefined8 local_6fc0;
  undefined8 uStack_6fb8;
  undefined8 uStack_6fb0;
  undefined8 uStack_6fa8;
  undefined1 local_6f80 [16];
  undefined8 uStack_6f70;
  undefined8 uStack_6f68;
  undefined1 local_6f20 [16];
  undefined8 uStack_6f10;
  undefined8 uStack_6f08;
  undefined1 local_6ee0 [8];
  float fStack_6ed8;
  float fStack_6ed4;
  float local_6ea0;
  float fStack_6e9c;
  float fStack_6e98;
  float fStack_6e94;
  float fStack_6e90;
  float fStack_6e8c;
  float fStack_6e88;
  float local_6e40;
  float fStack_6e3c;
  float fStack_6e38;
  float fStack_6e34;
  float local_6e00;
  float fStack_6dfc;
  float fStack_6df8;
  float fStack_6df4;
  float fStack_6df0;
  float fStack_6dec;
  float fStack_6de8;
  float fStack_6de4;
  undefined8 local_6de0;
  undefined8 uStack_6dd8;
  undefined8 uStack_6dd0;
  undefined8 uStack_6dc8;
  undefined1 local_6dc0 [8];
  undefined8 uStack_6db8;
  undefined8 uStack_6db0;
  undefined8 uStack_6da8;
  undefined1 local_6da0 [32];
  undefined4 local_6d80;
  undefined4 uStack_6d7c;
  undefined4 uStack_6d78;
  undefined4 uStack_6d74;
  undefined4 uStack_6d70;
  undefined4 uStack_6d6c;
  undefined4 uStack_6d68;
  undefined4 uStack_6d64;
  undefined1 local_6d60 [32];
  undefined1 local_6d40 [32];
  undefined1 local_6d20 [8];
  undefined8 uStack_6d18;
  undefined8 uStack_6d10;
  undefined8 uStack_6d08;
  undefined1 local_6d00 [32];
  undefined8 local_6ce0;
  undefined8 uStack_6cd8;
  undefined8 uStack_6cd0;
  undefined8 uStack_6cc8;
  undefined8 local_6cc0;
  undefined8 uStack_6cb8;
  undefined8 uStack_6cb0;
  undefined8 uStack_6ca8;
  undefined8 local_6ca0;
  undefined8 uStack_6c98;
  undefined8 uStack_6c90;
  undefined8 uStack_6c88;
  undefined8 local_6c80;
  undefined8 uStack_6c78;
  undefined8 uStack_6c70;
  undefined8 uStack_6c68;
  undefined8 local_6c60;
  undefined8 uStack_6c58;
  undefined8 uStack_6c50;
  undefined8 uStack_6c48;
  undefined8 local_6c40;
  undefined8 uStack_6c38;
  undefined8 uStack_6c30;
  undefined8 uStack_6c28;
  undefined4 local_6c18;
  undefined4 local_6c14;
  undefined4 local_6c04;
  undefined8 local_6c00;
  undefined8 uStack_6bf8;
  undefined8 uStack_6bf0;
  undefined8 uStack_6be8;
  undefined8 local_6be0;
  undefined8 uStack_6bd8;
  undefined8 uStack_6bd0;
  undefined8 uStack_6bc8;
  undefined1 local_6bc0 [32];
  undefined8 local_6b40;
  undefined8 uStack_6b38;
  undefined8 uStack_6b30;
  undefined8 uStack_6b28;
  undefined1 local_6b20 [32];
  undefined8 local_6b00;
  undefined8 uStack_6af8;
  undefined8 uStack_6af0;
  undefined8 uStack_6ae8;
  float local_6ae0;
  float fStack_6adc;
  float fStack_6ad8;
  float fStack_6ad4;
  float fStack_6ad0;
  float fStack_6acc;
  float fStack_6ac8;
  float fStack_6ac4;
  undefined8 local_6ac0;
  undefined8 uStack_6ab8;
  undefined8 uStack_6ab0;
  undefined8 uStack_6aa8;
  undefined1 local_6aa0 [8];
  undefined8 uStack_6a98;
  undefined8 uStack_6a90;
  undefined8 uStack_6a88;
  undefined1 local_6a80 [32];
  undefined4 local_6a60;
  undefined4 uStack_6a5c;
  undefined4 uStack_6a58;
  undefined4 uStack_6a54;
  undefined4 uStack_6a50;
  undefined4 uStack_6a4c;
  undefined4 uStack_6a48;
  undefined4 uStack_6a44;
  undefined1 local_6a40 [32];
  undefined1 local_6a20 [32];
  undefined1 local_6a00 [8];
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  undefined1 local_69e0 [32];
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 local_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined8 local_6960;
  undefined8 uStack_6958;
  undefined8 uStack_6950;
  undefined8 uStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6938;
  undefined8 uStack_6930;
  undefined8 uStack_6928;
  undefined8 local_6920;
  undefined8 uStack_6918;
  undefined8 uStack_6910;
  undefined8 uStack_6908;
  undefined4 local_68e4;
  float local_68e0;
  float fStack_68dc;
  float fStack_68d8;
  float fStack_68d4;
  float fStack_68d0;
  float fStack_68cc;
  float fStack_68c8;
  float fStack_68c4;
  undefined1 local_6840 [16];
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined1 local_67e0 [16];
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined1 local_67a0 [8];
  float fStack_6798;
  float fStack_6794;
  float local_6760;
  float fStack_675c;
  float fStack_6758;
  float fStack_6754;
  float fStack_6750;
  float fStack_674c;
  float fStack_6748;
  float local_6700;
  float fStack_66fc;
  float fStack_66f8;
  float fStack_66f4;
  float local_66c0;
  float fStack_66bc;
  float fStack_66b8;
  float fStack_66b4;
  float local_6640;
  float fStack_663c;
  float fStack_6638;
  float fStack_6634;
  float fStack_6630;
  float fStack_662c;
  float fStack_6628;
  float fStack_6624;
  float local_6620;
  float fStack_661c;
  float fStack_6618;
  float fStack_6614;
  float fStack_6610;
  float fStack_660c;
  float fStack_6608;
  float fStack_6604;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined1 local_6480 [32];
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined8 local_6320;
  undefined8 uStack_6318;
  undefined8 uStack_6310;
  undefined8 uStack_6308;
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined4 local_6240;
  undefined4 uStack_623c;
  undefined4 uStack_6238;
  undefined4 uStack_6234;
  undefined4 uStack_6230;
  undefined4 uStack_622c;
  undefined4 uStack_6228;
  undefined4 uStack_6224;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined4 local_6200;
  undefined4 uStack_61fc;
  undefined4 uStack_61f8;
  undefined4 uStack_61f4;
  undefined4 uStack_61f0;
  undefined4 uStack_61ec;
  undefined4 uStack_61e8;
  undefined4 uStack_61e4;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined4 local_6180;
  undefined4 uStack_617c;
  undefined4 uStack_6178;
  undefined4 uStack_6174;
  undefined4 uStack_6170;
  undefined4 uStack_616c;
  undefined4 uStack_6168;
  undefined4 uStack_6164;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined4 local_60e4;
  undefined8 local_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined4 local_5ec0;
  undefined4 uStack_5ebc;
  undefined4 uStack_5eb8;
  undefined4 uStack_5eb4;
  undefined4 uStack_5eb0;
  undefined4 uStack_5eac;
  undefined4 uStack_5ea8;
  undefined4 uStack_5ea4;
  undefined8 local_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined4 local_5d80;
  undefined4 uStack_5d7c;
  undefined4 uStack_5d78;
  undefined4 uStack_5d74;
  undefined4 uStack_5d70;
  undefined4 uStack_5d6c;
  undefined4 uStack_5d68;
  undefined4 uStack_5d64;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined4 local_5900;
  undefined4 uStack_58fc;
  undefined4 uStack_58f8;
  undefined4 uStack_58f4;
  undefined4 uStack_58f0;
  undefined4 uStack_58ec;
  undefined4 uStack_58e8;
  undefined4 uStack_58e4;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 uStack_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  undefined4 local_58a0;
  undefined4 uStack_589c;
  undefined4 uStack_5898;
  undefined4 uStack_5894;
  undefined4 uStack_5890;
  undefined4 uStack_588c;
  undefined4 uStack_5888;
  undefined4 uStack_5884;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined4 local_5840;
  undefined4 uStack_583c;
  undefined4 uStack_5838;
  undefined4 uStack_5834;
  undefined4 uStack_5830;
  undefined4 uStack_582c;
  undefined4 uStack_5828;
  undefined4 uStack_5824;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined4 local_57e0;
  undefined4 uStack_57dc;
  undefined4 uStack_57d8;
  undefined4 uStack_57d4;
  undefined4 uStack_57d0;
  undefined4 uStack_57cc;
  undefined4 uStack_57c8;
  undefined4 uStack_57c4;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined4 local_5780;
  undefined4 uStack_577c;
  undefined4 uStack_5778;
  undefined4 uStack_5774;
  undefined4 uStack_5770;
  undefined4 uStack_576c;
  undefined4 uStack_5768;
  undefined4 uStack_5764;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined4 local_5720;
  undefined4 uStack_571c;
  undefined4 uStack_5718;
  undefined4 uStack_5714;
  undefined4 uStack_5710;
  undefined4 uStack_570c;
  undefined4 uStack_5708;
  undefined4 uStack_5704;
  undefined4 local_5700;
  undefined4 uStack_56fc;
  undefined4 uStack_56f8;
  undefined4 uStack_56f4;
  undefined4 uStack_56f0;
  undefined4 uStack_56ec;
  undefined4 uStack_56e8;
  undefined4 uStack_56e4;
  undefined8 local_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined4 local_5660;
  undefined4 uStack_565c;
  undefined4 uStack_5658;
  undefined4 uStack_5654;
  undefined4 uStack_5650;
  undefined4 uStack_564c;
  undefined4 uStack_5648;
  undefined4 uStack_5644;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  undefined4 local_5600;
  undefined4 uStack_55fc;
  undefined4 uStack_55f8;
  undefined4 uStack_55f4;
  undefined4 uStack_55f0;
  undefined4 uStack_55ec;
  undefined4 uStack_55e8;
  undefined4 uStack_55e4;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined4 local_55a0;
  undefined4 uStack_559c;
  undefined4 uStack_5598;
  undefined4 uStack_5594;
  undefined4 uStack_5590;
  undefined4 uStack_558c;
  undefined4 uStack_5588;
  undefined4 uStack_5584;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  undefined4 local_5540;
  undefined4 uStack_553c;
  undefined4 uStack_5538;
  undefined4 uStack_5534;
  undefined4 uStack_5530;
  undefined4 uStack_552c;
  undefined4 uStack_5528;
  undefined4 uStack_5524;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined4 local_54e0;
  undefined4 uStack_54dc;
  undefined4 uStack_54d8;
  undefined4 uStack_54d4;
  undefined4 uStack_54d0;
  undefined4 uStack_54cc;
  undefined4 uStack_54c8;
  undefined4 uStack_54c4;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined4 local_5480;
  undefined4 uStack_547c;
  undefined4 uStack_5478;
  undefined4 uStack_5474;
  undefined4 uStack_5470;
  undefined4 uStack_546c;
  undefined4 uStack_5468;
  undefined4 uStack_5464;
  undefined4 local_5460;
  undefined4 uStack_545c;
  undefined4 uStack_5458;
  undefined4 uStack_5454;
  undefined4 uStack_5450;
  undefined4 uStack_544c;
  undefined4 uStack_5448;
  undefined4 uStack_5444;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined4 local_5160;
  undefined4 uStack_515c;
  undefined4 uStack_5158;
  undefined4 uStack_5154;
  undefined4 uStack_5150;
  undefined4 uStack_514c;
  undefined4 uStack_5148;
  undefined4 uStack_5144;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined4 local_5100;
  undefined4 uStack_50fc;
  undefined4 uStack_50f8;
  undefined4 uStack_50f4;
  undefined4 uStack_50f0;
  undefined4 uStack_50ec;
  undefined4 uStack_50e8;
  undefined4 uStack_50e4;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined4 local_50c0;
  undefined4 uStack_50bc;
  undefined4 uStack_50b8;
  undefined4 uStack_50b4;
  undefined4 uStack_50b0;
  undefined4 uStack_50ac;
  undefined4 uStack_50a8;
  undefined4 uStack_50a4;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined4 local_5060;
  undefined4 uStack_505c;
  undefined4 uStack_5058;
  undefined4 uStack_5054;
  undefined4 uStack_5050;
  undefined4 uStack_504c;
  undefined4 uStack_5048;
  undefined4 uStack_5044;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined4 local_5000;
  undefined4 uStack_4ffc;
  undefined4 uStack_4ff8;
  undefined4 uStack_4ff4;
  undefined4 uStack_4ff0;
  undefined4 uStack_4fec;
  undefined4 uStack_4fe8;
  undefined4 uStack_4fe4;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined4 local_4fa0;
  undefined4 uStack_4f9c;
  undefined4 uStack_4f98;
  undefined4 uStack_4f94;
  undefined4 uStack_4f90;
  undefined4 uStack_4f8c;
  undefined4 uStack_4f88;
  undefined4 uStack_4f84;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined4 local_4f40;
  undefined4 uStack_4f3c;
  undefined4 uStack_4f38;
  undefined4 uStack_4f34;
  undefined4 uStack_4f30;
  undefined4 uStack_4f2c;
  undefined4 uStack_4f28;
  undefined4 uStack_4f24;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined4 local_4ee0;
  undefined4 uStack_4edc;
  undefined4 uStack_4ed8;
  undefined4 uStack_4ed4;
  undefined4 uStack_4ed0;
  undefined4 uStack_4ecc;
  undefined4 uStack_4ec8;
  undefined4 uStack_4ec4;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined4 local_4e80;
  undefined4 uStack_4e7c;
  undefined4 uStack_4e78;
  undefined4 uStack_4e74;
  undefined4 uStack_4e70;
  undefined4 uStack_4e6c;
  undefined4 uStack_4e68;
  undefined4 uStack_4e64;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined4 local_4e20;
  undefined4 uStack_4e1c;
  undefined4 uStack_4e18;
  undefined4 uStack_4e14;
  undefined4 uStack_4e10;
  undefined4 uStack_4e0c;
  undefined4 uStack_4e08;
  undefined4 uStack_4e04;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined4 local_4920;
  undefined4 uStack_491c;
  undefined4 uStack_4918;
  undefined4 uStack_4914;
  undefined4 uStack_4910;
  undefined4 uStack_490c;
  undefined4 uStack_4908;
  undefined4 uStack_4904;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined4 local_48c0;
  undefined4 uStack_48bc;
  undefined4 uStack_48b8;
  undefined4 uStack_48b4;
  undefined4 uStack_48b0;
  undefined4 uStack_48ac;
  undefined4 uStack_48a8;
  undefined4 uStack_48a4;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined4 local_4860;
  undefined4 uStack_485c;
  undefined4 uStack_4858;
  undefined4 uStack_4854;
  undefined4 uStack_4850;
  undefined4 uStack_484c;
  undefined4 uStack_4848;
  undefined4 uStack_4844;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined4 local_4800;
  undefined4 uStack_47fc;
  undefined4 uStack_47f8;
  undefined4 uStack_47f4;
  undefined4 uStack_47f0;
  undefined4 uStack_47ec;
  undefined4 uStack_47e8;
  undefined4 uStack_47e4;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  undefined4 local_46e0;
  undefined4 uStack_46dc;
  undefined4 uStack_46d8;
  undefined4 uStack_46d4;
  undefined4 uStack_46d0;
  undefined4 uStack_46cc;
  undefined4 uStack_46c8;
  undefined4 uStack_46c4;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined4 local_45e4;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined4 local_2f40;
  undefined4 uStack_2f3c;
  undefined4 uStack_2f38;
  undefined4 uStack_2f34;
  undefined4 uStack_2f30;
  undefined4 uStack_2f2c;
  undefined4 uStack_2f28;
  undefined4 uStack_2f24;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined4 local_2f00;
  undefined4 uStack_2efc;
  undefined4 uStack_2ef8;
  undefined4 uStack_2ef4;
  undefined4 uStack_2ef0;
  undefined4 uStack_2eec;
  undefined4 uStack_2ee8;
  undefined4 uStack_2ee4;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  float local_2e80;
  float fStack_2e7c;
  float fStack_2e78;
  float fStack_2e74;
  float fStack_2e70;
  float fStack_2e6c;
  float fStack_2e68;
  float fStack_2e64;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  float local_2e20;
  float fStack_2e1c;
  float fStack_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  float fStack_2e08;
  float fStack_2e04;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined4 local_2ca4;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined4 local_2c64;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined4 local_2a24;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined4 local_29e4;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined1 auStack_2940 [16];
  undefined1 auStack_2930 [16];
  undefined4 local_2920;
  undefined4 local_291c;
  undefined4 uStack_2918;
  undefined4 local_2914;
  undefined4 uStack_2910;
  undefined4 local_290c;
  undefined4 uStack_2908;
  undefined4 local_2904;
  undefined1 auStack_2900 [16];
  undefined1 auStack_28f0 [16];
  undefined4 local_28e0;
  undefined4 local_28dc;
  undefined4 uStack_28d8;
  undefined4 local_28d4;
  undefined4 uStack_28d0;
  undefined4 local_28cc;
  undefined4 uStack_28c8;
  undefined4 local_28c4;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 auStack_2800 [16];
  undefined1 auStack_27f0 [16];
  undefined4 local_27e0;
  undefined4 local_27dc;
  undefined4 uStack_27d8;
  undefined4 local_27d4;
  undefined4 uStack_27d0;
  undefined4 local_27cc;
  undefined4 uStack_27c8;
  undefined4 local_27c4;
  undefined1 auStack_27c0 [16];
  undefined1 auStack_27b0 [16];
  undefined4 local_2790;
  undefined4 local_278c;
  undefined4 uStack_2788;
  undefined4 local_2784;
  undefined4 uStack_2780;
  undefined4 local_277c;
  undefined4 uStack_2778;
  undefined4 local_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  undefined1 local_2750 [8];
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  float local_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined1 local_2680 [8];
  float fStack_2678;
  float fStack_2674;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  float local_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined1 local_2560 [8];
  undefined8 uStack_2558;
  float local_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [8];
  undefined8 uStack_2518;
  undefined1 local_2510 [16];
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [8];
  undefined8 uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 local_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 local_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 local_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 local_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  float local_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  undefined8 local_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 local_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  float local_22f0;
  float fStack_22ec;
  float fStack_22e8;
  float fStack_22e4;
  float local_22c0;
  float fStack_22bc;
  float fStack_22b8;
  float fStack_22b4;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  undefined8 local_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined1 local_2230 [16];
  undefined4 local_2220;
  undefined4 uStack_221c;
  undefined4 uStack_2218;
  undefined4 uStack_2214;
  undefined1 local_2210 [16];
  undefined1 local_2200 [8];
  undefined8 uStack_21f8;
  undefined8 local_21f0;
  undefined8 uStack_21e8;
  undefined1 local_21e0 [16];
  undefined8 local_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 local_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined4 local_2190;
  undefined4 uStack_218c;
  undefined4 uStack_2188;
  undefined4 uStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 local_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined4 local_2150;
  undefined4 uStack_214c;
  undefined4 uStack_2148;
  undefined4 uStack_2144;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined4 local_2130;
  undefined4 uStack_212c;
  undefined4 uStack_2128;
  undefined4 uStack_2124;
  undefined4 local_2114;
  undefined4 local_2110;
  undefined4 uStack_210c;
  undefined4 uStack_2108;
  undefined4 uStack_2104;
  undefined4 local_20f4;
  undefined4 local_2090;
  undefined4 uStack_208c;
  undefined4 uStack_2088;
  undefined4 uStack_2084;
  undefined4 local_2074;
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined1 local_2030 [16];
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 local_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 local_1fb0;
  undefined8 uStack_1fa8;
  undefined1 local_1fa0 [16];
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  undefined8 local_1f50;
  undefined8 uStack_1f48;
  undefined1 local_1f40 [16];
  undefined8 local_1f30;
  undefined8 uStack_1f28;
  undefined1 local_1f20 [8];
  undefined8 uStack_1f18;
  undefined1 local_1f10 [16];
  undefined4 local_1f00;
  undefined4 uStack_1efc;
  undefined4 uStack_1ef8;
  undefined4 uStack_1ef4;
  undefined1 local_1ef0 [16];
  undefined1 local_1ee0 [8];
  undefined8 uStack_1ed8;
  undefined8 local_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [16];
  undefined8 local_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [16];
  undefined8 local_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined4 local_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 local_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined4 local_1e30;
  undefined4 uStack_1e2c;
  undefined4 uStack_1e28;
  undefined4 uStack_1e24;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined4 local_1e10;
  undefined4 uStack_1e0c;
  undefined4 uStack_1e08;
  undefined4 uStack_1e04;
  undefined4 local_1df4;
  undefined8 local_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 local_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 local_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 local_1d10;
  undefined8 uStack_1d08;
  float local_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  float fStack_1ce4;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float local_1c80;
  float fStack_1c7c;
  float fStack_1c78;
  float fStack_1c74;
  float local_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined1 local_1bc0 [16];
  undefined1 local_1b90 [16];
  undefined1 local_1b80 [16];
  undefined1 local_1b70 [16];
  undefined1 local_1b50 [16];
  undefined8 local_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined4 local_1ad0;
  undefined4 uStack_1acc;
  undefined4 uStack_1ac8;
  undefined4 uStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined4 local_1ab0;
  undefined4 uStack_1aac;
  undefined4 uStack_1aa8;
  undefined4 uStack_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined4 local_1a70;
  undefined4 uStack_1a6c;
  undefined4 uStack_1a68;
  undefined4 uStack_1a64;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined4 local_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 local_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined4 local_1910;
  undefined4 uStack_190c;
  undefined4 uStack_1908;
  undefined4 uStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 local_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined4 local_1870;
  undefined4 uStack_186c;
  undefined4 uStack_1868;
  undefined4 uStack_1864;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  undefined8 local_1790;
  undefined8 uStack_1788;
  undefined4 local_1770;
  undefined4 uStack_176c;
  undefined4 uStack_1768;
  undefined4 uStack_1764;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 local_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined4 local_15e0;
  undefined4 uStack_15dc;
  undefined4 uStack_15d8;
  undefined4 uStack_15d4;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined4 local_15b0;
  undefined4 uStack_15ac;
  undefined4 uStack_15a8;
  undefined4 uStack_15a4;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined4 local_1550;
  undefined4 uStack_154c;
  undefined4 uStack_1548;
  undefined4 uStack_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined4 local_1520;
  undefined4 uStack_151c;
  undefined4 uStack_1518;
  undefined4 uStack_1514;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined4 local_14c0;
  undefined4 uStack_14bc;
  undefined4 uStack_14b8;
  undefined4 uStack_14b4;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined4 local_1490;
  undefined4 uStack_148c;
  undefined4 uStack_1488;
  undefined4 uStack_1484;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined4 local_1460;
  undefined4 uStack_145c;
  undefined4 uStack_1458;
  undefined4 uStack_1454;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined4 local_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined4 local_1400;
  undefined4 uStack_13fc;
  undefined4 uStack_13f8;
  undefined4 uStack_13f4;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined4 local_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined4 local_1250;
  undefined4 uStack_124c;
  undefined4 uStack_1248;
  undefined4 uStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined4 local_1220;
  undefined4 uStack_121c;
  undefined4 uStack_1218;
  undefined4 uStack_1214;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined4 local_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined4 local_11c0;
  undefined4 uStack_11bc;
  undefined4 uStack_11b8;
  undefined4 uStack_11b4;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined4 local_1190;
  undefined4 uStack_118c;
  undefined4 uStack_1188;
  undefined4 uStack_1184;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined4 local_1160;
  undefined4 uStack_115c;
  undefined4 uStack_1158;
  undefined4 uStack_1154;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined4 local_1130;
  undefined4 uStack_112c;
  undefined4 uStack_1128;
  undefined4 uStack_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined4 local_1100;
  undefined4 uStack_10fc;
  undefined4 uStack_10f8;
  undefined4 uStack_10f4;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined4 local_e80;
  undefined4 uStack_e7c;
  undefined4 uStack_e78;
  undefined4 uStack_e74;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined4 local_e50;
  undefined4 uStack_e4c;
  undefined4 uStack_e48;
  undefined4 uStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined4 local_e20;
  undefined4 uStack_e1c;
  undefined4 uStack_e18;
  undefined4 uStack_e14;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined4 local_df0;
  undefined4 uStack_dec;
  undefined4 uStack_de8;
  undefined4 uStack_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined4 local_d60;
  undefined4 uStack_d5c;
  undefined4 uStack_d58;
  undefined4 uStack_d54;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  local_7b14 = *(int *)((long)in_RSI + 0x2c);
  local_7b18 = (int)in_RSI[6];
  local_7b1c = (int)in_RSI[7];
  local_7b20 = local_7b14 * local_7b18;
  local_7b24 = (int)in_RSI[3];
  if (local_7b24 == 0x10) {
    local_7af0 = &local_7b70;
    local_7b70 = (void *)0x0;
    _elempack = (int)((ulong)in_stack_ffffffffffff81d8 >> 0x20);
    local_7b68 = (int *)0x0;
    local_7b60 = 0;
    local_7b58 = 0;
    local_7b50 = (long *)0x0;
    local_7b48 = 0;
    local_7b44 = 0;
    local_7b40 = 0;
    local_7b3c = 0;
    local_7b38 = 0;
    local_7b30 = 0;
    local_7b10 = in_RDX;
    convert_packing(in_stack_ffffffffffff81e8,in_stack_ffffffffffff81e0,_elempack,
                    in_stack_ffffffffffff81d0);
    (**(code **)*in_RDI)(in_RDI,&local_7b70,local_7b10);
    convert_packing(in_stack_ffffffffffff81e8,in_stack_ffffffffffff81e0,_elempack,
                    in_stack_ffffffffffff81d0);
    local_7af4 = 0;
    local_7ae8 = &local_7b70;
    if (local_7b68 != (int *)0x0) {
      local_785c = 0xffffffff;
      LOCK();
      local_7860 = *local_7b68;
      *local_7b68 = *local_7b68 + -1;
      UNLOCK();
      if (local_7860 == 1) {
        local_7858 = local_7ae8;
        if (local_7b50 == (long *)0x0) {
          local_7850 = local_7b70;
          if (local_7b70 != (void *)0x0) {
            free(local_7b70);
          }
        }
        else {
          (**(code **)(*local_7b50 + 0x18))(local_7b50,local_7b70);
        }
      }
    }
  }
  else if (local_7b24 == 8) {
    for (local_7b80 = 0; local_7b80 < local_7b1c; local_7b80 = local_7b80 + 1) {
      local_7b88 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_7b80 * in_RSI[2]);
      for (local_7bd4 = 0; local_7bd4 < local_7b20; local_7bd4 = local_7bd4 + 1) {
        auVar117._8_4_ = 0x42b0c0a5;
        auVar117._0_8_ = 0x42b0c0a542b0c0a5;
        auVar117._12_4_ = 0x42b0c0a5;
        auVar117._16_4_ = 0x42b0c0a5;
        auVar117._20_4_ = 0x42b0c0a5;
        auVar117._24_4_ = 0x42b0c0a5;
        auVar117._28_4_ = 0x42b0c0a5;
        auVar270 = vminps_avx(*local_7b88,auVar117);
        auVar33._8_4_ = 0xc2b0c0a5;
        auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar33._12_4_ = 0xc2b0c0a5;
        auVar33._16_4_ = 0xc2b0c0a5;
        auVar33._20_4_ = 0xc2b0c0a5;
        auVar33._24_4_ = 0xc2b0c0a5;
        auVar33._28_4_ = 0xc2b0c0a5;
        auVar266 = vmaxps_avx(auVar270,auVar33);
        auVar73._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar73._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar73._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar73._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar72._8_8_ = 0x3f0000003f000000;
        auVar72._0_8_ = 0x3f0000003f000000;
        auVar72._16_8_ = 0x3f0000003f000000;
        auVar72._24_8_ = 0x3f0000003f000000;
        auVar265 = vfmadd213ps_fma(auVar73,auVar266,auVar72);
        auVar267 = vroundps_avx(ZEXT1632(auVar265),1);
        auVar270 = vcmpps_avx(ZEXT1632(auVar265),auVar267,1);
        auVar41._8_8_ = 0x3f8000003f800000;
        auVar41._0_8_ = 0x3f8000003f800000;
        auVar41._16_8_ = 0x3f8000003f800000;
        auVar41._24_8_ = 0x3f8000003f800000;
        auVar270 = vpand_avx2(auVar270,auVar41);
        auVar270 = vsubps_avx(auVar267,auVar270);
        auVar106._8_8_ = 0x3f3180003f318000;
        auVar106._0_8_ = 0x3f3180003f318000;
        auVar106._16_8_ = 0x3f3180003f318000;
        auVar106._24_8_ = 0x3f3180003f318000;
        auVar265 = vfnmadd213ps_fma(auVar106,auVar270,auVar266);
        auVar107._8_8_ = 0xb95e8083b95e8083;
        auVar107._0_8_ = 0xb95e8083b95e8083;
        auVar107._16_8_ = 0xb95e8083b95e8083;
        auVar107._24_8_ = 0xb95e8083b95e8083;
        auVar263 = vfnmadd213ps_fma(auVar107,auVar270,ZEXT1632(auVar265));
        local_6e40 = auVar263._0_4_;
        fStack_6e3c = auVar263._4_4_;
        fStack_6e38 = auVar263._8_4_;
        fStack_6e34 = auVar263._12_4_;
        _local_6ee0 = CONCAT412(fStack_6e34 * fStack_6e34,
                                CONCAT48(fStack_6e38 * fStack_6e38,
                                         CONCAT44(fStack_6e3c * fStack_6e3c,local_6e40 * local_6e40)
                                        ));
        local_6f80._8_4_ = 0x39506967;
        local_6f80._0_8_ = 0x3950696739506967;
        local_6f80._12_4_ = 0x39506967;
        uStack_6f70._0_4_ = 0x39506967;
        uStack_6f70._4_4_ = 0x39506967;
        uStack_6f68._0_4_ = 0x39506967;
        uStack_6f68._4_4_ = 0x39506967;
        auVar266 = _local_6f80;
        uStack_6f68 = auVar266._24_8_;
        auVar75._16_8_ = uStack_6f70;
        auVar75._0_16_ = local_6f80;
        auVar75._24_8_ = uStack_6f68;
        auVar74._8_8_ = 0x3ab743ce3ab743ce;
        auVar74._0_8_ = 0x3ab743ce3ab743ce;
        auVar74._16_8_ = 0x3ab743ce3ab743ce;
        auVar74._24_8_ = 0x3ab743ce3ab743ce;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar263),auVar75,auVar74);
        auVar76._8_8_ = 0x3c0889083c088908;
        auVar76._0_8_ = 0x3c0889083c088908;
        auVar76._16_8_ = 0x3c0889083c088908;
        auVar76._24_8_ = 0x3c0889083c088908;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar263),ZEXT1632(auVar265),auVar76);
        auVar77._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar77._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar77._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar77._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar263),ZEXT1632(auVar265),auVar77);
        auVar78._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar78._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar78._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar78._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar266 = vfmadd213ps_avx512vl(ZEXT1632(auVar263),ZEXT1632(auVar265),auVar78);
        auVar79._8_8_ = 0x3f0000003f000000;
        auVar79._0_8_ = 0x3f0000003f000000;
        auVar79._16_8_ = 0x3f0000003f000000;
        auVar79._24_8_ = 0x3f0000003f000000;
        auVar266 = vfmadd213ps_avx512vl(ZEXT1632(auVar263),auVar266,auVar79);
        auVar266 = vfmadd213ps_avx512vl(ZEXT1632(_local_6ee0),auVar266,ZEXT1632(auVar263));
        local_6e00 = auVar266._0_4_;
        fStack_6dfc = auVar266._4_4_;
        fStack_6df8 = auVar266._8_4_;
        fStack_6df4 = auVar266._12_4_;
        fStack_6df0 = auVar266._16_4_;
        fStack_6dec = auVar266._20_4_;
        fStack_6de8 = auVar266._24_4_;
        fStack_6de4 = auVar266._28_4_;
        local_2e20 = auVar270._0_4_;
        fStack_2e1c = auVar270._4_4_;
        fStack_2e18 = auVar270._8_4_;
        fStack_2e14 = auVar270._12_4_;
        fStack_2e10 = auVar270._16_4_;
        fStack_2e0c = auVar270._20_4_;
        fStack_2e08 = auVar270._24_4_;
        fStack_2e04 = auVar270._28_4_;
        local_6f20._4_4_ = (int)fStack_2e1c;
        local_6f20._0_4_ = (int)local_2e20;
        local_6f20._8_4_ = (int)fStack_2e18;
        local_6f20._12_4_ = (int)fStack_2e14;
        uStack_6f10._0_4_ = (int)fStack_2e10;
        uStack_6f10._4_4_ = (int)fStack_2e0c;
        uStack_6f08._0_4_ = (int)fStack_2e08;
        uStack_6f08._4_4_ = (int)fStack_2e04;
        auVar270 = _local_6f20;
        uStack_6f08 = auVar270._24_8_;
        auVar119._16_8_ = uStack_6f10;
        auVar119._0_16_ = local_6f20;
        auVar119._24_8_ = uStack_6f08;
        auVar118._8_8_ = 0x7f0000007f;
        auVar118._0_8_ = 0x7f0000007f;
        auVar118._16_8_ = 0x7f0000007f;
        auVar118._24_8_ = 0x7f0000007f;
        auVar270 = vpaddd_avx2(auVar119,auVar118);
        auVar270 = vpslld_avx2(auVar270,ZEXT416(0x17));
        local_6ea0 = auVar270._0_4_;
        fStack_6e9c = auVar270._4_4_;
        fStack_6e98 = auVar270._8_4_;
        fStack_6e94 = auVar270._12_4_;
        fStack_6e90 = auVar270._16_4_;
        fStack_6e8c = auVar270._20_4_;
        fStack_6e88 = auVar270._24_4_;
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        auVar263 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar263 = vinsertps_avx512f(auVar263,ZEXT416(0x3f800000),0x20);
        auVar263 = vinsertps_avx512f(auVar263,ZEXT416(0x3f800000),0x30);
        local_7020 = auVar265._0_4_;
        fStack_701c = auVar265._4_4_;
        fStack_7018 = auVar265._8_4_;
        fStack_7014 = auVar265._12_4_;
        fStack_7010 = auVar263._0_4_;
        fStack_700c = auVar263._4_4_;
        fStack_7008 = auVar263._8_4_;
        fStack_7004 = auVar263._12_4_;
        local_7460._4_4_ = (fStack_6dfc + 1.0) * fStack_6e9c + fStack_701c;
        local_7460._0_4_ = (local_6e00 + 1.0) * local_6ea0 + local_7020;
        fStack_7458 = (fStack_6df8 + 1.0) * fStack_6e98 + fStack_7018;
        fStack_7454 = (fStack_6df4 + 1.0) * fStack_6e94 + fStack_7014;
        uStack_7450._0_4_ = (fStack_6df0 + 1.0) * fStack_6e90 + fStack_7010;
        uStack_7450._4_4_ = (fStack_6dec + 1.0) * fStack_6e8c + fStack_700c;
        uStack_7448._0_4_ = (fStack_6de8 + 1.0) * fStack_6e88 + fStack_7008;
        uStack_7448._4_4_ = fStack_6de4 + 1.0 + fStack_7004;
        auVar266 = _local_7460;
        auVar270 = vcmpps_avx(_local_7460,ZEXT1632(ZEXT816(0)),2);
        uStack_7448 = auVar266._24_8_;
        auVar37._16_8_ = uStack_7450;
        auVar37._0_16_ = _local_7460;
        auVar37._24_8_ = uStack_7448;
        auVar36._8_4_ = 0x800000;
        auVar36._0_8_ = 0x80000000800000;
        auVar36._12_4_ = 0x800000;
        auVar36._16_4_ = 0x800000;
        auVar36._20_4_ = 0x800000;
        auVar36._24_4_ = 0x800000;
        auVar36._28_4_ = 0x800000;
        auVar266 = vmaxps_avx512vl(auVar37,auVar36);
        auVar267 = vpsrld_avx512vl(auVar266,ZEXT416(0x17));
        auVar45._8_4_ = 0x807fffff;
        auVar45._0_8_ = 0x807fffff807fffff;
        auVar45._12_4_ = 0x807fffff;
        auVar45._16_4_ = 0x807fffff;
        auVar45._20_4_ = 0x807fffff;
        auVar45._24_4_ = 0x807fffff;
        auVar45._28_4_ = 0x807fffff;
        auVar268 = vmovdqa64_avx512vl(auVar45);
        auVar266 = vpandd_avx512vl(auVar266,auVar268);
        auVar47._8_4_ = 0x3f000000;
        auVar47._0_8_ = 0x3f0000003f000000;
        auVar47._12_4_ = 0x3f000000;
        auVar47._16_4_ = 0x3f000000;
        auVar47._20_4_ = 0x3f000000;
        auVar47._24_4_ = 0x3f000000;
        auVar47._28_4_ = 0x3f000000;
        auVar268 = vmovdqa64_avx512vl(auVar47);
        auVar268 = vpord_avx512vl(auVar266,auVar268);
        auVar48._8_8_ = 0x7f0000007f;
        auVar48._0_8_ = 0x7f0000007f;
        auVar48._16_8_ = 0x7f0000007f;
        auVar48._24_8_ = 0x7f0000007f;
        auVar266 = vpsubd_avx2(auVar267,auVar48);
        auVar266 = vcvtdq2ps_avx(auVar266);
        local_7040 = auVar266._0_4_;
        fStack_703c = auVar266._4_4_;
        fStack_7038 = auVar266._8_4_;
        fStack_7034 = auVar266._12_4_;
        fStack_7030 = auVar266._16_4_;
        fStack_702c = auVar266._20_4_;
        fStack_7028 = auVar266._24_4_;
        fStack_7024 = auVar266._28_4_;
        local_74e0._4_4_ = fStack_703c + 1.0;
        local_74e0._0_4_ = local_7040 + 1.0;
        fStack_74d8 = fStack_7038 + 1.0;
        fStack_74d4 = fStack_7034 + 1.0;
        uStack_74d0._0_4_ = fStack_7030 + 1.0;
        uStack_74d0._4_4_ = fStack_702c + 1.0;
        uStack_74c8._0_4_ = fStack_7028 + 1.0;
        uStack_74c8._4_4_ = fStack_7024 + 1.0;
        auVar267 = _local_74e0;
        auVar273._8_4_ = 0x3f3504f3;
        auVar273._0_8_ = 0x3f3504f33f3504f3;
        auVar273._12_4_ = 0x3f3504f3;
        auVar273._16_4_ = 0x3f3504f3;
        auVar273._20_4_ = 0x3f3504f3;
        auVar273._24_4_ = 0x3f3504f3;
        auVar273._28_4_ = 0x3f3504f3;
        auVar266 = vcmpps_avx(auVar268,auVar273,1);
        auVar269 = vmovdqa64_avx512vl(auVar266);
        auVar269 = vpandd_avx512vl(auVar268,auVar269);
        auVar29._8_8_ = 0x3f8000003f800000;
        auVar29._0_8_ = 0x3f8000003f800000;
        auVar29._16_8_ = 0x3f8000003f800000;
        auVar29._24_8_ = 0x3f8000003f800000;
        auVar268 = vsubps_avx512vl(auVar268,auVar29);
        uStack_74c8 = auVar267._24_8_;
        auVar44._8_8_ = 0x3f8000003f800000;
        auVar44._0_8_ = 0x3f8000003f800000;
        auVar44._16_8_ = 0x3f8000003f800000;
        auVar44._24_8_ = 0x3f8000003f800000;
        auVar266 = vmovdqa64_avx512vl(auVar266);
        auVar266 = vpandd_avx512vl(auVar44,auVar266);
        auVar28._16_8_ = uStack_74d0;
        auVar28._0_16_ = _local_74e0;
        auVar28._24_8_ = uStack_74c8;
        auVar267 = vsubps_avx512vl(auVar28,auVar266);
        auVar268 = vaddps_avx512vl(auVar268,auVar269);
        auVar269 = vmulps_avx512vl(auVar268,auVar268);
        local_7560._8_4_ = 0x3d9021bb;
        local_7560._0_8_ = 0x3d9021bb3d9021bb;
        local_7560._12_4_ = 0x3d9021bb;
        uStack_7550._0_4_ = 0x3d9021bb;
        uStack_7550._4_4_ = 0x3d9021bb;
        uStack_7548._0_4_ = 0x3d9021bb;
        uStack_7548._4_4_ = 0x3d9021bb;
        auVar266 = _local_7560;
        uStack_7548 = auVar266._24_8_;
        auVar51._16_8_ = uStack_7550;
        auVar51._0_16_ = local_7560;
        auVar51._24_8_ = uStack_7548;
        auVar50._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar50._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar50._16_8_ = 0xbdebd1b8bdebd1b8;
        auVar50._24_8_ = 0xbdebd1b8bdebd1b8;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar51,auVar50);
        auVar52._8_8_ = 0x3def251a3def251a;
        auVar52._0_8_ = 0x3def251a3def251a;
        auVar52._16_8_ = 0x3def251a3def251a;
        auVar52._24_8_ = 0x3def251a3def251a;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar266,auVar52);
        auVar53._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar53._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar53._16_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar53._24_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar266,auVar53);
        auVar54._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar54._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar54._16_8_ = 0x3e11e9bf3e11e9bf;
        auVar54._24_8_ = 0x3e11e9bf3e11e9bf;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar266,auVar54);
        auVar55._8_8_ = 0xbe2aae50be2aae50;
        auVar55._0_8_ = 0xbe2aae50be2aae50;
        auVar55._16_8_ = 0xbe2aae50be2aae50;
        auVar55._24_8_ = 0xbe2aae50be2aae50;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar266,auVar55);
        auVar56._8_8_ = 0x3e4cceac3e4cceac;
        auVar56._0_8_ = 0x3e4cceac3e4cceac;
        auVar56._16_8_ = 0x3e4cceac3e4cceac;
        auVar56._24_8_ = 0x3e4cceac3e4cceac;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar266,auVar56);
        auVar57._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar57._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar57._16_8_ = 0xbe7ffffcbe7ffffc;
        auVar57._24_8_ = 0xbe7ffffcbe7ffffc;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar266,auVar57);
        auVar58._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar58._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar58._16_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar58._24_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar266 = vfmadd213ps_avx512vl(auVar268,auVar266,auVar58);
        auVar266 = vmulps_avx512vl(auVar266,auVar268);
        auVar266 = vmulps_avx512vl(auVar266,auVar269);
        auVar59._8_8_ = 0xb95e8083b95e8083;
        auVar59._0_8_ = 0xb95e8083b95e8083;
        auVar59._16_8_ = 0xb95e8083b95e8083;
        auVar59._24_8_ = 0xb95e8083b95e8083;
        auVar266 = vfmadd213ps_avx512vl(auVar59,auVar267,auVar266);
        auVar104._8_8_ = 0x3f0000003f000000;
        auVar104._0_8_ = 0x3f0000003f000000;
        auVar104._16_8_ = 0x3f0000003f000000;
        auVar104._24_8_ = 0x3f0000003f000000;
        auVar266 = vfnmadd213ps_avx512vl(auVar104,auVar269,auVar266);
        auVar266 = vaddps_avx512vl(auVar268,auVar266);
        auVar60._8_8_ = 0x3f3180003f318000;
        auVar60._0_8_ = 0x3f3180003f318000;
        auVar60._16_8_ = 0x3f3180003f318000;
        auVar60._24_8_ = 0x3f3180003f318000;
        auVar266 = vfmadd213ps_avx512vl(auVar60,auVar267,auVar266);
        auVar270 = vmovdqa64_avx512vl(auVar270);
        auVar270 = vpord_avx512vl(auVar266,auVar270);
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        auVar263 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar263 = vinsertps_avx512f(auVar263,ZEXT416(0x3f800000),0x20);
        auVar263 = vinsertps_avx512f(auVar263,ZEXT416(0x3f800000),0x30);
        uStack_2870 = auVar263._0_8_;
        uStack_2868 = auVar263._8_8_;
        auVar263 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar263 = vinsertps_avx512f(auVar263,ZEXT416(0x40000000),0x20);
        auVar263 = vinsertps_avx512f(auVar263,ZEXT416(0x40000000),0x30);
        auVar264 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar264 = vinsertps_avx512f(auVar264,ZEXT416(0x40000000),0x20);
        auVar264 = vinsertps_avx512f(auVar264,ZEXT416(0x40000000),0x30);
        uStack_2830 = auVar264._0_8_;
        uStack_2828 = auVar264._8_8_;
        auVar19._16_8_ = uStack_2830;
        auVar19._0_16_ = auVar263;
        auVar19._24_8_ = uStack_2828;
        auVar270 = vmulps_avx512vl(auVar270,auVar19);
        auVar264 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar264 = vinsertps_avx512f(auVar264,ZEXT416(0x3f800000),0x20);
        auVar264 = vinsertps_avx512f(auVar264,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx512f(auVar1,ZEXT416(0x3f800000),0x20);
        auVar1 = vinsertps_avx512f(auVar1,ZEXT416(0x3f800000),0x30);
        local_68e0 = auVar264._0_4_;
        fStack_68dc = auVar264._4_4_;
        fStack_68d8 = auVar264._8_4_;
        fStack_68d4 = auVar264._12_4_;
        fStack_68d0 = auVar1._0_4_;
        fStack_68cc = auVar1._4_4_;
        fStack_68c8 = auVar1._8_4_;
        fStack_68c4 = auVar1._12_4_;
        auVar270 = vsubps_avx512vl(ZEXT1632(ZEXT816(0)),auVar270);
        auVar114._8_4_ = 0x42b0c0a5;
        auVar114._0_8_ = 0x42b0c0a542b0c0a5;
        auVar114._12_4_ = 0x42b0c0a5;
        auVar114._16_4_ = 0x42b0c0a5;
        auVar114._20_4_ = 0x42b0c0a5;
        auVar114._24_4_ = 0x42b0c0a5;
        auVar114._28_4_ = 0x42b0c0a5;
        auVar270 = vminps_avx(auVar270,auVar114);
        auVar30._8_4_ = 0xc2b0c0a5;
        auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30._12_4_ = 0xc2b0c0a5;
        auVar30._16_4_ = 0xc2b0c0a5;
        auVar30._20_4_ = 0xc2b0c0a5;
        auVar30._24_4_ = 0xc2b0c0a5;
        auVar30._28_4_ = 0xc2b0c0a5;
        auVar266 = vmaxps_avx(auVar270,auVar30);
        auVar97._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar97._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar97._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar97._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar96._8_8_ = 0x3f0000003f000000;
        auVar96._0_8_ = 0x3f0000003f000000;
        auVar96._16_8_ = 0x3f0000003f000000;
        auVar96._24_8_ = 0x3f0000003f000000;
        auVar1 = vfmadd213ps_fma(auVar97,auVar266,auVar96);
        auVar267 = vroundps_avx(ZEXT1632(auVar1),1);
        auVar270 = vcmpps_avx(ZEXT1632(auVar1),auVar267,1);
        auVar38._8_8_ = 0x3f8000003f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._16_8_ = 0x3f8000003f800000;
        auVar38._24_8_ = 0x3f8000003f800000;
        auVar270 = vpand_avx2(auVar270,auVar38);
        auVar270 = vsubps_avx(auVar267,auVar270);
        auVar112._8_8_ = 0x3f3180003f318000;
        auVar112._0_8_ = 0x3f3180003f318000;
        auVar112._16_8_ = 0x3f3180003f318000;
        auVar112._24_8_ = 0x3f3180003f318000;
        auVar1 = vfnmadd213ps_fma(auVar112,auVar270,auVar266);
        auVar113._8_8_ = 0xb95e8083b95e8083;
        auVar113._0_8_ = 0xb95e8083b95e8083;
        auVar113._16_8_ = 0xb95e8083b95e8083;
        auVar113._24_8_ = 0xb95e8083b95e8083;
        auVar262 = vfnmadd213ps_fma(auVar113,auVar270,ZEXT1632(auVar1));
        local_6700 = auVar262._0_4_;
        fStack_66fc = auVar262._4_4_;
        fStack_66f8 = auVar262._8_4_;
        fStack_66f4 = auVar262._12_4_;
        _local_67a0 = CONCAT412(fStack_66f4 * fStack_66f4,
                                CONCAT48(fStack_66f8 * fStack_66f8,
                                         CONCAT44(fStack_66fc * fStack_66fc,local_6700 * local_6700)
                                        ));
        local_6840._8_4_ = 0x39506967;
        local_6840._0_8_ = 0x3950696739506967;
        local_6840._12_4_ = 0x39506967;
        uStack_6830._0_4_ = 0x39506967;
        uStack_6830._4_4_ = 0x39506967;
        uStack_6828._0_4_ = 0x39506967;
        uStack_6828._4_4_ = 0x39506967;
        auVar266 = _local_6840;
        uStack_6828 = auVar266._24_8_;
        auVar99._16_8_ = uStack_6830;
        auVar99._0_16_ = local_6840;
        auVar99._24_8_ = uStack_6828;
        auVar98._8_8_ = 0x3ab743ce3ab743ce;
        auVar98._0_8_ = 0x3ab743ce3ab743ce;
        auVar98._16_8_ = 0x3ab743ce3ab743ce;
        auVar98._24_8_ = 0x3ab743ce3ab743ce;
        auVar1 = vfmadd213ps_fma(ZEXT1632(auVar262),auVar99,auVar98);
        auVar100._8_8_ = 0x3c0889083c088908;
        auVar100._0_8_ = 0x3c0889083c088908;
        auVar100._16_8_ = 0x3c0889083c088908;
        auVar100._24_8_ = 0x3c0889083c088908;
        auVar1 = vfmadd213ps_fma(ZEXT1632(auVar262),ZEXT1632(auVar1),auVar100);
        auVar101._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar101._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar101._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar101._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar1 = vfmadd213ps_fma(ZEXT1632(auVar262),ZEXT1632(auVar1),auVar101);
        auVar102._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar102._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar102._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar102._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar1 = vfmadd213ps_fma(ZEXT1632(auVar262),ZEXT1632(auVar1),auVar102);
        auVar103._8_8_ = 0x3f0000003f000000;
        auVar103._0_8_ = 0x3f0000003f000000;
        auVar103._16_8_ = 0x3f0000003f000000;
        auVar103._24_8_ = 0x3f0000003f000000;
        auVar1 = vfmadd213ps_fma(ZEXT1632(auVar262),ZEXT1632(auVar1),auVar103);
        auVar1 = vfmadd213ps_fma(ZEXT1632(_local_67a0),ZEXT1632(auVar1),ZEXT1632(auVar262));
        local_66c0 = auVar1._0_4_;
        fStack_66bc = auVar1._4_4_;
        fStack_66b8 = auVar1._8_4_;
        fStack_66b4 = auVar1._12_4_;
        local_2e80 = auVar270._0_4_;
        fStack_2e7c = auVar270._4_4_;
        fStack_2e78 = auVar270._8_4_;
        fStack_2e74 = auVar270._12_4_;
        fStack_2e70 = auVar270._16_4_;
        fStack_2e6c = auVar270._20_4_;
        fStack_2e68 = auVar270._24_4_;
        fStack_2e64 = auVar270._28_4_;
        local_67e0._4_4_ = (int)fStack_2e7c;
        local_67e0._0_4_ = (int)local_2e80;
        local_67e0._8_4_ = (int)fStack_2e78;
        local_67e0._12_4_ = (int)fStack_2e74;
        uStack_67d0._0_4_ = (int)fStack_2e70;
        uStack_67d0._4_4_ = (int)fStack_2e6c;
        uStack_67c8._0_4_ = (int)fStack_2e68;
        uStack_67c8._4_4_ = (int)fStack_2e64;
        auVar270 = _local_67e0;
        uStack_67c8 = auVar270._24_8_;
        auVar125._16_8_ = uStack_67d0;
        auVar125._0_16_ = local_67e0;
        auVar125._24_8_ = uStack_67c8;
        auVar124._8_8_ = 0x7f0000007f;
        auVar124._0_8_ = 0x7f0000007f;
        auVar124._16_8_ = 0x7f0000007f;
        auVar124._24_8_ = 0x7f0000007f;
        auVar270 = vpaddd_avx2(auVar125,auVar124);
        auVar270 = vpslld_avx2(auVar270,ZEXT416(0x17));
        local_6760 = auVar270._0_4_;
        fStack_675c = auVar270._4_4_;
        fStack_6758 = auVar270._8_4_;
        fStack_6754 = auVar270._12_4_;
        fStack_6750 = auVar270._16_4_;
        fStack_674c = auVar270._20_4_;
        fStack_6748 = auVar270._24_4_;
        auVar23._16_4_ = fStack_68d0;
        auVar23._0_16_ = auVar264;
        auVar23._20_4_ = fStack_68cc;
        auVar23._24_4_ = fStack_68c8;
        auVar23._28_4_ = fStack_68c4;
        auVar22._4_4_ = fStack_68dc + (fStack_66bc + 1.0) * fStack_675c;
        auVar22._0_4_ = local_68e0 + (local_66c0 + 1.0) * local_6760;
        auVar22._8_4_ = fStack_68d8 + (fStack_66b8 + 1.0) * fStack_6758;
        auVar22._12_4_ = fStack_68d4 + (fStack_66b4 + 1.0) * fStack_6754;
        auVar22._16_4_ = fStack_68d0 + fStack_6750 * 1.0;
        auVar22._20_4_ = fStack_68cc + fStack_674c * 1.0;
        auVar22._24_4_ = fStack_68c8 + fStack_6748 * 1.0;
        auVar22._28_4_ = fStack_68c4 + 1.0;
        auVar270 = vrcpps_avx(auVar22);
        auVar2._4_4_ = fStack_68dc * auVar270._4_4_;
        auVar2._0_4_ = local_68e0 * auVar270._0_4_;
        auVar2._8_4_ = fStack_68d8 * auVar270._8_4_;
        auVar2._12_4_ = fStack_68d4 * auVar270._12_4_;
        auVar2._16_4_ = fStack_68d0 * auVar270._16_4_;
        auVar2._20_4_ = fStack_68cc * auVar270._20_4_;
        auVar2._24_4_ = fStack_68c8 * auVar270._24_4_;
        auVar2._28_4_ = fStack_68c4;
        auVar264 = vfmsub213ps_fma(auVar2,auVar22,auVar23);
        auVar264 = vfnmadd213ps_fma(ZEXT1632(auVar264),auVar270,auVar2);
        auVar21._16_8_ = uStack_2830;
        auVar21._0_16_ = auVar263;
        auVar21._24_8_ = uStack_2828;
        auVar20._16_8_ = uStack_2870;
        auVar20._0_16_ = auVar265;
        auVar20._24_8_ = uStack_2868;
        auVar279._8_4_ = 0x80000000;
        auVar279._0_8_ = 0x8000000080000000;
        auVar279._12_4_ = 0x80000000;
        auVar279._16_4_ = 0x80000000;
        auVar279._20_4_ = 0x80000000;
        auVar279._24_4_ = 0x80000000;
        auVar279._28_4_ = 0x80000000;
        auVar265 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar264),auVar20 ^ auVar279);
        local_7700 = (float)*(undefined8 *)*local_7b88;
        fStack_76fc = (float)((ulong)*(undefined8 *)*local_7b88 >> 0x20);
        fStack_76f8 = (float)*(undefined8 *)(*local_7b88 + 8);
        fStack_76f4 = (float)((ulong)*(undefined8 *)(*local_7b88 + 8) >> 0x20);
        fStack_76f0 = (float)*(undefined8 *)(*local_7b88 + 0x10);
        fStack_76ec = (float)((ulong)*(undefined8 *)(*local_7b88 + 0x10) >> 0x20);
        fStack_76e8 = (float)*(undefined8 *)(*local_7b88 + 0x18);
        uStack_76e4 = (undefined4)((ulong)*(undefined8 *)(*local_7b88 + 0x18) >> 0x20);
        local_7720 = auVar265._0_4_;
        fStack_771c = auVar265._4_4_;
        fStack_7718 = auVar265._8_4_;
        fStack_7714 = auVar265._12_4_;
        local_7c00 = CONCAT44(fStack_76fc * fStack_771c,local_7700 * local_7720);
        uStack_7bf8 = CONCAT44(fStack_76f4 * fStack_7714,fStack_76f8 * fStack_7718);
        uStack_7bf0 = CONCAT44(fStack_76ec * 0.0,fStack_76f0 * 0.0);
        uStack_7be8 = CONCAT44(uStack_76e4,fStack_76e8 * 0.0);
        auVar17._8_8_ = uStack_7bf8;
        auVar17._0_8_ = local_7c00;
        auVar17._16_8_ = uStack_7bf0;
        auVar17._24_8_ = uStack_7be8;
        *local_7b88 = auVar17;
        local_7b88 = local_7b88 + 1;
      }
    }
    local_7af4 = 0;
  }
  else if (local_7b24 == 4) {
    for (local_7c04 = 0; local_7c04 < local_7b1c; local_7c04 = local_7c04 + 1) {
      local_7c10 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_7c04 * in_RSI[2]);
      for (local_7c5c = 0; local_7c5c < local_7b20; local_7c5c = local_7c5c + 1) {
        auVar262 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar246._8_4_ = 0x42b0c0a5;
        auVar246._0_8_ = 0x42b0c0a542b0c0a5;
        auVar246._12_4_ = 0x42b0c0a5;
        auVar265 = vminps_avx(*local_7c10,auVar246);
        auVar138._8_4_ = 0xc2b0c0a5;
        auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar138._12_4_ = 0xc2b0c0a5;
        auVar264 = vmaxps_avx(auVar265,auVar138);
        local_22a0 = auVar264._0_4_;
        fStack_229c = auVar264._4_4_;
        fStack_2298 = auVar264._8_4_;
        fStack_2294 = auVar264._12_4_;
        fVar271 = local_22a0 * 1.442695 + 0.5;
        fVar275 = fStack_229c * 1.442695 + 0.5;
        fVar276 = fStack_2298 * 1.442695 + 0.5;
        fVar277 = fStack_2294 * 1.442695 + 0.5;
        local_2320 = CONCAT44(fVar275,fVar271);
        uStack_2318._0_4_ = fVar276;
        uStack_2318._4_4_ = fVar277;
        local_2330 = CONCAT44((int)fVar275,(int)fVar271);
        uStack_2328._0_4_ = (int)fVar276;
        uStack_2328._4_4_ = (int)fVar277;
        auVar158._8_8_ = uStack_2328;
        auVar158._0_8_ = local_2330;
        auVar263 = vcvtdq2ps_avx(auVar158);
        auVar250._8_8_ = uStack_2318;
        auVar250._0_8_ = local_2320;
        auVar265 = vcmpps_avx(auVar250,auVar263,1);
        auVar146._8_8_ = 0x3f8000003f800000;
        auVar146._0_8_ = 0x3f8000003f800000;
        auVar265 = vpand_avx(auVar265,auVar146);
        auVar265 = vsubps_avx(auVar263,auVar265);
        auVar235._8_8_ = 0x3f3180003f318000;
        auVar235._0_8_ = 0x3f3180003f318000;
        auVar263 = vfnmadd213ps_fma(auVar235,auVar265,auVar264);
        auVar236._8_8_ = 0xb95e8083b95e8083;
        auVar236._0_8_ = 0xb95e8083b95e8083;
        auVar264 = vfnmadd213ps_fma(auVar236,auVar265,auVar263);
        local_22c0 = auVar264._0_4_;
        fStack_22bc = auVar264._4_4_;
        fStack_22b8 = auVar264._8_4_;
        fStack_22b4 = auVar264._12_4_;
        local_2310 = CONCAT44(fStack_22bc * fStack_22bc,local_22c0 * local_22c0);
        uStack_2308._0_4_ = fStack_22b8 * fStack_22b8;
        uStack_2308._4_4_ = fStack_22b4 * fStack_22b4;
        uStack_2358._0_4_ = 0x39506967;
        local_2360 = 0x3950696739506967;
        uStack_2358._4_4_ = 0x39506967;
        auVar204._8_8_ = uStack_2358;
        auVar204._0_8_ = 0x3950696739506967;
        auVar203._8_8_ = 0x3ab743ce3ab743ce;
        auVar203._0_8_ = 0x3ab743ce3ab743ce;
        auVar263 = vfmadd213ps_fma(auVar264,auVar204,auVar203);
        auVar205._8_8_ = 0x3c0889083c088908;
        auVar205._0_8_ = 0x3c0889083c088908;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar205);
        auVar206._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar206._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar206);
        auVar207._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar207._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar207);
        auVar208._8_8_ = 0x3f0000003f000000;
        auVar208._0_8_ = 0x3f0000003f000000;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar208);
        auVar209._8_8_ = uStack_2308;
        auVar209._0_8_ = local_2310;
        auVar263 = vfmadd213ps_fma(auVar209,auVar263,auVar264);
        local_2280 = auVar263._0_4_;
        fStack_227c = auVar263._4_4_;
        fStack_2278 = auVar263._8_4_;
        fStack_2274 = auVar263._12_4_;
        local_210 = auVar265._0_4_;
        fStack_20c = auVar265._4_4_;
        fStack_208 = auVar265._8_4_;
        fStack_204 = auVar265._12_4_;
        local_2330 = CONCAT44((int)fStack_20c,(int)local_210);
        uStack_2328._0_4_ = (int)fStack_208;
        uStack_2328._4_4_ = (int)fStack_204;
        auVar258._8_8_ = uStack_2328;
        auVar258._0_8_ = local_2330;
        auVar257._8_8_ = 0x7f0000007f;
        auVar257._0_8_ = 0x7f0000007f;
        auVar265 = vpaddd_avx(auVar258,auVar257);
        auVar265 = vpslld_avx(auVar265,ZEXT416(0x17));
        local_22f0 = auVar265._0_4_;
        fStack_22ec = auVar265._4_4_;
        fStack_22e8 = auVar265._8_4_;
        fStack_22e4 = auVar265._12_4_;
        local_25d0 = CONCAT44((fStack_227c + 1.0) * fStack_22ec + 1.0,
                              (local_2280 + 1.0) * local_22f0 + 1.0);
        uStack_25c8._0_4_ = (fStack_2278 + 1.0) * fStack_22e8 + 1.0;
        uStack_25c8._4_4_ = (fStack_2274 + 1.0) * fStack_22e4 + 1.0;
        auVar134._8_8_ = uStack_25c8;
        auVar134._0_8_ = local_25d0;
        auVar265 = vcmpps_avx(auVar134,auVar262,2);
        auVar142._8_8_ = uStack_25c8;
        auVar142._0_8_ = local_25d0;
        auVar141._8_4_ = 0x800000;
        auVar141._0_8_ = 0x80000000800000;
        auVar141._12_4_ = 0x800000;
        auVar263 = vmaxps_avx(auVar142,auVar141);
        auVar264 = vpsrld_avx(auVar263,ZEXT416(0x17));
        auVar150._8_4_ = 0x807fffff;
        auVar150._0_8_ = 0x807fffff807fffff;
        auVar150._12_4_ = 0x807fffff;
        auVar263 = vpand_avx(auVar263,auVar150);
        auVar152._8_4_ = 0x3f000000;
        auVar152._0_8_ = 0x3f0000003f000000;
        auVar152._12_4_ = 0x3f000000;
        auVar1 = vpor_avx(auVar263,auVar152);
        auVar154._8_8_ = 0x7f0000007f;
        auVar154._0_8_ = 0x7f0000007f;
        auVar263 = vpsubd_avx(auVar264,auVar154);
        auVar263 = vcvtdq2ps_avx(auVar263);
        local_23c0 = auVar263._0_4_;
        fStack_23bc = auVar263._4_4_;
        fStack_23b8 = auVar263._8_4_;
        fStack_23b4 = auVar263._12_4_;
        local_2610 = CONCAT44(fStack_23bc + 1.0,local_23c0 + 1.0);
        uStack_2608._0_4_ = fStack_23b8 + 1.0;
        uStack_2608._4_4_ = fStack_23b4 + 1.0;
        auVar160._8_4_ = 0x3f3504f3;
        auVar160._0_8_ = 0x3f3504f33f3504f3;
        auVar160._12_4_ = 0x3f3504f3;
        auVar263 = vcmpps_avx(auVar1,auVar160,1);
        auVar264 = vpand_avx(auVar1,auVar263);
        auVar127._8_8_ = 0x3f8000003f800000;
        auVar127._0_8_ = 0x3f8000003f800000;
        auVar1 = vsubps_avx(auVar1,auVar127);
        auVar149._8_8_ = 0x3f8000003f800000;
        auVar149._0_8_ = 0x3f8000003f800000;
        auVar263 = vmovdqa64_avx512vl(auVar263);
        auVar263 = vpandd_avx512vl(auVar149,auVar263);
        auVar126._8_8_ = uStack_2608;
        auVar126._0_8_ = local_2610;
        auVar263 = vsubps_avx(auVar126,auVar263);
        local_23e0 = auVar1._0_4_;
        fStack_23dc = auVar1._4_4_;
        fStack_23d8 = auVar1._8_4_;
        fStack_23d4 = auVar1._12_4_;
        local_23f0 = auVar264._0_4_;
        fStack_23ec = auVar264._4_4_;
        fStack_23e8 = auVar264._8_4_;
        fStack_23e4 = auVar264._12_4_;
        local_23e0 = local_23e0 + local_23f0;
        fStack_23dc = fStack_23dc + fStack_23ec;
        fStack_23d8 = fStack_23d8 + fStack_23e8;
        fStack_23d4 = fStack_23d4 + fStack_23e4;
        local_25d0 = CONCAT44(fStack_23dc,local_23e0);
        uStack_25c8._0_4_ = fStack_23d8;
        uStack_25c8._4_4_ = fStack_23d4;
        uStack_2648._0_4_ = 0x3d9021bb;
        local_2650 = 0x3d9021bb3d9021bb;
        uStack_2648._4_4_ = 0x3d9021bb;
        auVar163._8_8_ = uStack_2648;
        auVar163._0_8_ = 0x3d9021bb3d9021bb;
        auVar162._8_8_ = uStack_25c8;
        auVar162._0_8_ = local_25d0;
        auVar161._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar161._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar264 = vfmadd213ps_avx512vl(auVar162,auVar163,auVar161);
        auVar165._8_8_ = uStack_25c8;
        auVar165._0_8_ = local_25d0;
        auVar164._8_8_ = 0x3def251a3def251a;
        auVar164._0_8_ = 0x3def251a3def251a;
        auVar264 = vfmadd213ps_avx512vl(auVar165,auVar264,auVar164);
        auVar167._8_8_ = uStack_25c8;
        auVar167._0_8_ = local_25d0;
        auVar166._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar166._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar264 = vfmadd213ps_avx512vl(auVar167,auVar264,auVar166);
        auVar169._8_8_ = uStack_25c8;
        auVar169._0_8_ = local_25d0;
        auVar168._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar168._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar264 = vfmadd213ps_avx512vl(auVar169,auVar264,auVar168);
        auVar171._8_8_ = uStack_25c8;
        auVar171._0_8_ = local_25d0;
        auVar170._8_8_ = 0xbe2aae50be2aae50;
        auVar170._0_8_ = 0xbe2aae50be2aae50;
        auVar264 = vfmadd213ps_avx512vl(auVar171,auVar264,auVar170);
        auVar173._8_8_ = uStack_25c8;
        auVar173._0_8_ = local_25d0;
        auVar172._8_8_ = 0x3e4cceac3e4cceac;
        auVar172._0_8_ = 0x3e4cceac3e4cceac;
        auVar264 = vfmadd213ps_avx512vl(auVar173,auVar264,auVar172);
        auVar175._8_8_ = uStack_25c8;
        auVar175._0_8_ = local_25d0;
        auVar174._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar174._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar264 = vfmadd213ps_avx512vl(auVar175,auVar264,auVar174);
        auVar177._8_8_ = uStack_25c8;
        auVar177._0_8_ = local_25d0;
        auVar176._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar176._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar264 = vfmadd213ps_avx512vl(auVar177,auVar264,auVar176);
        local_2590 = auVar264._0_4_;
        fStack_258c = auVar264._4_4_;
        fStack_2588 = auVar264._8_4_;
        fStack_2584 = auVar264._12_4_;
        local_2650 = CONCAT44(fStack_258c * fStack_23dc * fStack_23dc * fStack_23dc,
                              local_2590 * local_23e0 * local_23e0 * local_23e0);
        uStack_2648._0_4_ = fStack_2588 * fStack_23d8 * fStack_23d8 * fStack_23d8;
        uStack_2648._4_4_ = fStack_2584 * fStack_23d4 * fStack_23d4 * fStack_23d4;
        auVar179._8_8_ = 0xb95e8083b95e8083;
        auVar179._0_8_ = 0xb95e8083b95e8083;
        auVar178._8_8_ = uStack_2648;
        auVar178._0_8_ = local_2650;
        auVar264 = vfmadd213ps_avx512vl(auVar179,auVar263,auVar178);
        auVar232._4_4_ = fStack_23dc * fStack_23dc;
        auVar232._0_4_ = local_23e0 * local_23e0;
        auVar232._12_4_ = fStack_23d4 * fStack_23d4;
        auVar232._8_4_ = fStack_23d8 * fStack_23d8;
        auVar231._8_8_ = 0x3f0000003f000000;
        auVar231._0_8_ = 0x3f0000003f000000;
        auVar264 = vfnmadd213ps_avx512vl(auVar231,auVar232,auVar264);
        local_2410 = auVar264._0_4_;
        fStack_240c = auVar264._4_4_;
        fStack_2408 = auVar264._8_4_;
        fStack_2404 = auVar264._12_4_;
        local_25d0 = CONCAT44(fStack_23dc + fStack_240c,local_23e0 + local_2410);
        uStack_25c8._0_4_ = fStack_23d8 + fStack_2408;
        uStack_25c8._4_4_ = fStack_23d4 + fStack_2404;
        auVar181._8_8_ = 0x3f3180003f318000;
        auVar181._0_8_ = 0x3f3180003f318000;
        auVar180._8_8_ = uStack_25c8;
        auVar180._0_8_ = local_25d0;
        auVar263 = vfmadd213ps_avx512vl(auVar181,auVar263,auVar180);
        auVar265 = vpor_avx(auVar263,auVar265);
        local_26d0 = auVar265._0_4_;
        fStack_26cc = auVar265._4_4_;
        fStack_26c8 = auVar265._8_4_;
        fStack_26c4 = auVar265._12_4_;
        auVar129._8_8_ = 0x3f8000003f800000;
        auVar129._0_8_ = 0x3f8000003f800000;
        auVar130._4_4_ = fStack_26cc * 2.0;
        auVar130._0_4_ = local_26d0 * 2.0;
        auVar130._12_4_ = fStack_26c4 * 2.0;
        auVar130._8_4_ = fStack_26c8 * 2.0;
        auVar265 = vsubps_avx512vl(auVar262,auVar130);
        in_ZMM16 = ZEXT1664(auVar262);
        auVar243._8_4_ = 0x42b0c0a5;
        auVar243._0_8_ = 0x42b0c0a542b0c0a5;
        auVar243._12_4_ = 0x42b0c0a5;
        auVar265 = vminps_avx(auVar265,auVar243);
        auVar135._8_4_ = 0xc2b0c0a5;
        auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar135._12_4_ = 0xc2b0c0a5;
        auVar264 = vmaxps_avx(auVar265,auVar135);
        local_1ca0 = auVar264._0_4_;
        fStack_1c9c = auVar264._4_4_;
        fStack_1c98 = auVar264._8_4_;
        fStack_1c94 = auVar264._12_4_;
        fVar271 = local_1ca0 * 1.442695 + 0.5;
        fVar275 = fStack_1c9c * 1.442695 + 0.5;
        fVar276 = fStack_1c98 * 1.442695 + 0.5;
        fVar277 = fStack_1c94 * 1.442695 + 0.5;
        local_1d20 = CONCAT44(fVar275,fVar271);
        uStack_1d18._0_4_ = fVar276;
        uStack_1d18._4_4_ = fVar277;
        local_1d30 = CONCAT44((int)fVar275,(int)fVar271);
        uStack_1d28._0_4_ = (int)fVar276;
        uStack_1d28._4_4_ = (int)fVar277;
        auVar155._8_8_ = uStack_1d28;
        auVar155._0_8_ = local_1d30;
        auVar263 = vcvtdq2ps_avx(auVar155);
        auVar247._8_8_ = uStack_1d18;
        auVar247._0_8_ = local_1d20;
        auVar265 = vcmpps_avx(auVar247,auVar263,1);
        auVar143._8_8_ = 0x3f8000003f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        auVar265 = vpand_avx(auVar265,auVar143);
        auVar265 = vsubps_avx(auVar263,auVar265);
        auVar241._8_8_ = 0x3f3180003f318000;
        auVar241._0_8_ = 0x3f3180003f318000;
        auVar263 = vfnmadd213ps_fma(auVar241,auVar265,auVar264);
        auVar242._8_8_ = 0xb95e8083b95e8083;
        auVar242._0_8_ = 0xb95e8083b95e8083;
        auVar264 = vfnmadd213ps_fma(auVar242,auVar265,auVar263);
        local_1cc0 = auVar264._0_4_;
        fStack_1cbc = auVar264._4_4_;
        fStack_1cb8 = auVar264._8_4_;
        fStack_1cb4 = auVar264._12_4_;
        local_1d10 = CONCAT44(fStack_1cbc * fStack_1cbc,local_1cc0 * local_1cc0);
        uStack_1d08._0_4_ = fStack_1cb8 * fStack_1cb8;
        uStack_1d08._4_4_ = fStack_1cb4 * fStack_1cb4;
        uStack_1d58._0_4_ = 0x39506967;
        local_1d60 = 0x3950696739506967;
        uStack_1d58._4_4_ = 0x39506967;
        auVar225._8_8_ = uStack_1d58;
        auVar225._0_8_ = 0x3950696739506967;
        auVar224._8_8_ = 0x3ab743ce3ab743ce;
        auVar224._0_8_ = 0x3ab743ce3ab743ce;
        auVar263 = vfmadd213ps_fma(auVar264,auVar225,auVar224);
        auVar226._8_8_ = 0x3c0889083c088908;
        auVar226._0_8_ = 0x3c0889083c088908;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar226);
        auVar227._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar227._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar227);
        auVar228._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar228._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar228);
        auVar229._8_8_ = 0x3f0000003f000000;
        auVar229._0_8_ = 0x3f0000003f000000;
        auVar263 = vfmadd213ps_fma(auVar264,auVar263,auVar229);
        auVar230._8_8_ = uStack_1d08;
        auVar230._0_8_ = local_1d10;
        auVar263 = vfmadd213ps_fma(auVar230,auVar263,auVar264);
        local_1c80 = auVar263._0_4_;
        fStack_1c7c = auVar263._4_4_;
        fStack_1c78 = auVar263._8_4_;
        fStack_1c74 = auVar263._12_4_;
        local_270 = auVar265._0_4_;
        fStack_26c = auVar265._4_4_;
        fStack_268 = auVar265._8_4_;
        fStack_264 = auVar265._12_4_;
        local_1d30 = CONCAT44((int)fStack_26c,(int)local_270);
        uStack_1d28._0_4_ = (int)fStack_268;
        uStack_1d28._4_4_ = (int)fStack_264;
        auVar252._8_8_ = uStack_1d28;
        auVar252._0_8_ = local_1d30;
        auVar251._8_8_ = 0x7f0000007f;
        auVar251._0_8_ = 0x7f0000007f;
        auVar265 = vpaddd_avx(auVar252,auVar251);
        auVar265 = vpslld_avx(auVar265,ZEXT416(0x17));
        local_1cf0 = auVar265._0_4_;
        fStack_1cec = auVar265._4_4_;
        fStack_1ce8 = auVar265._8_4_;
        fStack_1ce4 = auVar265._12_4_;
        auVar131._4_4_ = (fStack_1c7c + 1.0) * fStack_1cec + 1.0;
        auVar131._0_4_ = (local_1c80 + 1.0) * local_1cf0 + 1.0;
        auVar131._8_4_ = (fStack_1c78 + 1.0) * fStack_1ce8 + 1.0;
        auVar131._12_4_ = (fStack_1c74 + 1.0) * fStack_1ce4 + 1.0;
        auVar265 = vdivps_avx(auVar129,auVar131);
        local_26f0 = auVar265._0_4_;
        fStack_26ec = auVar265._4_4_;
        fStack_26e8 = auVar265._8_4_;
        fStack_26e4 = auVar265._12_4_;
        auVar278._0_4_ = local_26f0 * 2.0;
        auVar278._4_4_ = fStack_26ec * 2.0;
        auVar278._8_4_ = fStack_26e8 * 2.0;
        auVar278._12_4_ = fStack_26e4 * 2.0;
        auVar128._8_8_ = 0x3f8000003f800000;
        auVar128._0_8_ = 0x3f8000003f800000;
        auVar265 = vsubps_avx(auVar278,auVar128);
        local_2760 = (float)*(undefined8 *)*local_7c10;
        fStack_275c = (float)((ulong)*(undefined8 *)*local_7c10 >> 0x20);
        fStack_2758 = (float)*(undefined8 *)(*local_7c10 + 8);
        fStack_2754 = (float)((ulong)*(undefined8 *)(*local_7c10 + 8) >> 0x20);
        fStack_2770 = auVar265._0_4_;
        fStack_276c = auVar265._4_4_;
        fStack_2768 = auVar265._8_4_;
        fStack_2764 = auVar265._12_4_;
        local_7c70 = CONCAT44(fStack_275c * fStack_276c,local_2760 * fStack_2770);
        uStack_7c68 = CONCAT44(fStack_2754 * fStack_2764,fStack_2758 * fStack_2768);
        auVar18._8_8_ = uStack_7c68;
        auVar18._0_8_ = local_7c70;
        *local_7c10 = auVar18;
        local_7c10 = local_7c10 + 1;
      }
    }
    local_7af4 = 0;
  }
  else {
    local_7b08 = in_RSI;
    for (local_7c74 = 0; local_7c74 < local_7b1c; local_7c74 = local_7c74 + 1) {
      local_7a98 = &local_7cc8;
      local_775c = *(int *)((long)local_7b08 + 0x2c);
      local_7760 = (int)local_7b08[6];
      local_7764 = *(undefined4 *)((long)local_7b08 + 0x34);
      local_7770 = (undefined1 (*) [32])
                   (*local_7b08 + local_7b08[8] * (long)local_7c74 * local_7b08[2]);
      local_7778 = local_7b08[2];
      local_777c = (undefined4)local_7b08[3];
      local_7788 = local_7b08[4];
      local_7758 = &local_7cc8;
      local_7748 = (long)local_775c * (long)local_7760 * local_7778;
      local_7a48 = &local_7cc8;
      local_7ab8 = &local_7cc8;
      local_774c = 0x10;
      local_7aa4 = local_7c74;
      local_7aa5 = 1;
      local_7cc8 = 0;
      local_7cb8 = 0;
      local_7cb0 = 0;
      local_7ca0 = 0;
      local_7c9c = 0;
      local_7c98 = 0;
      local_7c94 = 0;
      local_7c90 = 0;
      local_7c88 = 0;
      local_7cc0 = 0;
      local_7c80 = local_7770;
      for (local_7ccc = 0; local_7ccc + 7 < local_7b20; local_7ccc = local_7ccc + 8) {
        local_7a30 = local_7c80;
        local_7a20 = *(undefined8 *)*local_7c80;
        uStack_7a18 = *(undefined8 *)(*local_7c80 + 8);
        uStack_7a10 = *(undefined8 *)(*local_7c80 + 0x10);
        auVar259 = *(undefined1 (*) [24])*local_7c80;
        uStack_7a08 = *(undefined8 *)(*local_7c80 + 0x18);
        auVar2 = *local_7c80;
        local_6300 = 0;
        uStack_62f8 = 0;
        uStack_62f0 = 0;
        uStack_62e8 = 0;
        local_6d80 = 0x3f800000;
        uStack_6d7c = 0x3f800000;
        uStack_6d78 = 0x3f800000;
        uStack_6d74 = 0x3f800000;
        uStack_6d70 = 0x3f800000;
        uStack_6d6c = 0x3f800000;
        uStack_6d68 = 0x3f800000;
        uStack_6d64 = 0x3f800000;
        local_6d00._0_8_ = auVar259._0_8_;
        local_2ee0 = local_6d00._0_8_;
        local_6d00._8_8_ = auVar259._8_8_;
        uStack_2ed8 = local_6d00._8_8_;
        local_6d00._16_8_ = auVar259._16_8_;
        uStack_2ed0 = local_6d00._16_8_;
        local_2f00 = 0x42b0c0a5;
        uStack_2efc = 0x42b0c0a5;
        uStack_2ef8 = 0x42b0c0a5;
        uStack_2ef4 = 0x42b0c0a5;
        uStack_2ef0 = 0x42b0c0a5;
        uStack_2eec = 0x42b0c0a5;
        uStack_2ee8 = 0x42b0c0a5;
        uStack_2ee4 = 0x42b0c0a5;
        auVar116._8_4_ = 0x42b0c0a5;
        auVar116._0_8_ = 0x42b0c0a542b0c0a5;
        auVar116._12_4_ = 0x42b0c0a5;
        auVar116._16_4_ = 0x42b0c0a5;
        auVar116._20_4_ = 0x42b0c0a5;
        auVar116._24_4_ = 0x42b0c0a5;
        auVar116._28_4_ = 0x42b0c0a5;
        auVar270 = vminps_avx(*local_7c80,auVar116);
        local_6d00._0_8_ = auVar270._0_8_;
        local_61e0 = local_6d00._0_8_;
        local_6d00._8_8_ = auVar270._8_8_;
        uStack_61d8 = local_6d00._8_8_;
        local_6d00._16_8_ = auVar270._16_8_;
        uStack_61d0 = local_6d00._16_8_;
        local_6d00._24_8_ = auVar270._24_8_;
        uStack_61c8 = local_6d00._24_8_;
        local_6200 = 0xc2b0c0a5;
        uStack_61fc = 0xc2b0c0a5;
        uStack_61f8 = 0xc2b0c0a5;
        uStack_61f4 = 0xc2b0c0a5;
        uStack_61f0 = 0xc2b0c0a5;
        uStack_61ec = 0xc2b0c0a5;
        uStack_61e8 = 0xc2b0c0a5;
        uStack_61e4 = 0xc2b0c0a5;
        auVar32._8_4_ = 0xc2b0c0a5;
        auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar32._12_4_ = 0xc2b0c0a5;
        auVar32._16_4_ = 0xc2b0c0a5;
        auVar32._20_4_ = 0xc2b0c0a5;
        auVar32._24_4_ = 0xc2b0c0a5;
        auVar32._28_4_ = 0xc2b0c0a5;
        auVar266 = vmaxps_avx(auVar270,auVar32);
        local_6d00._0_8_ = auVar266._0_8_;
        local_5440 = local_6d00._0_8_;
        local_6d00._8_8_ = auVar266._8_8_;
        uStack_5438 = local_6d00._8_8_;
        local_6d00._16_8_ = auVar266._16_8_;
        uStack_5430 = local_6d00._16_8_;
        local_6d00._24_8_ = auVar266._24_8_;
        uStack_5428 = local_6d00._24_8_;
        local_5460 = 0x3fb8aa3b;
        uStack_545c = 0x3fb8aa3b;
        uStack_5458 = 0x3fb8aa3b;
        uStack_5454 = 0x3fb8aa3b;
        uStack_5450 = 0x3fb8aa3b;
        uStack_544c = 0x3fb8aa3b;
        uStack_5448 = 0x3fb8aa3b;
        uStack_5444 = 0x3fb8aa3b;
        local_5480 = 0x3f000000;
        uStack_547c = 0x3f000000;
        uStack_5478 = 0x3f000000;
        uStack_5474 = 0x3f000000;
        uStack_5470 = 0x3f000000;
        uStack_546c = 0x3f000000;
        uStack_5468 = 0x3f000000;
        uStack_5464 = 0x3f000000;
        local_3ae0 = local_6d00._0_8_;
        uStack_3ad8 = local_6d00._8_8_;
        uStack_3ad0 = local_6d00._16_8_;
        uStack_3ac8 = local_6d00._24_8_;
        local_3b00 = 0x3fb8aa3b3fb8aa3b;
        uStack_3af8 = 0x3fb8aa3b3fb8aa3b;
        uStack_3af0 = 0x3fb8aa3b3fb8aa3b;
        uStack_3ae8 = 0x3fb8aa3b3fb8aa3b;
        local_3b20 = 0x3f0000003f000000;
        uStack_3b18 = 0x3f0000003f000000;
        uStack_3b10 = 0x3f0000003f000000;
        uStack_3b08 = 0x3f0000003f000000;
        auVar81._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar81._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar81._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar81._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar80._8_8_ = 0x3f0000003f000000;
        auVar80._0_8_ = 0x3f0000003f000000;
        auVar80._16_8_ = 0x3f0000003f000000;
        auVar80._24_8_ = 0x3f0000003f000000;
        auVar265 = vfmadd213ps_fma(auVar81,auVar266,auVar80);
        auVar267 = vroundps_avx(ZEXT1632(auVar265),1);
        auVar270 = vcmpps_avx(ZEXT1632(auVar265),auVar267,1);
        local_6da0._0_8_ = auVar270._0_8_;
        local_5fa0 = local_6da0._0_8_;
        local_6da0._8_8_ = auVar270._8_8_;
        uStack_5f98 = local_6da0._8_8_;
        local_6da0._16_8_ = auVar270._16_8_;
        uStack_5f90 = local_6da0._16_8_;
        local_6da0._24_8_ = auVar270._24_8_;
        uStack_5f88 = local_6da0._24_8_;
        local_5fc0 = 0x3f8000003f800000;
        uStack_5fb8 = 0x3f8000003f800000;
        uStack_5fb0 = 0x3f8000003f800000;
        uStack_5fa8 = 0x3f8000003f800000;
        auVar40._8_8_ = 0x3f8000003f800000;
        auVar40._0_8_ = 0x3f8000003f800000;
        auVar40._16_8_ = 0x3f8000003f800000;
        auVar40._24_8_ = 0x3f8000003f800000;
        local_6da0 = vpand_avx2(auVar270,auVar40);
        local_6d20 = auVar267._0_8_;
        local_64e0 = local_6d20;
        uStack_6d18 = auVar267._8_8_;
        uStack_64d8 = uStack_6d18;
        uStack_6d10 = auVar267._16_8_;
        uStack_64d0 = uStack_6d10;
        uStack_6d08 = auVar267._24_8_;
        uStack_64c8 = uStack_6d08;
        local_6500 = local_6da0._0_8_;
        uStack_64f8 = local_6da0._8_8_;
        uStack_64f0 = local_6da0._16_8_;
        uStack_64e8 = local_6da0._24_8_;
        local_6d40 = vsubps_avx(auVar267,local_6da0);
        local_47e0 = local_6d40._0_8_;
        uStack_47d8 = local_6d40._8_8_;
        uStack_47d0 = local_6d40._16_8_;
        uStack_47c8 = local_6d40._24_8_;
        local_4820 = local_6d00._0_8_;
        uStack_4818 = local_6d00._8_8_;
        uStack_4810 = local_6d00._16_8_;
        uStack_4808 = local_6d00._24_8_;
        local_4800 = 0x3f318000;
        uStack_47fc = 0x3f318000;
        uStack_47f8 = 0x3f318000;
        uStack_47f4 = 0x3f318000;
        uStack_47f0 = 0x3f318000;
        uStack_47ec = 0x3f318000;
        uStack_47e8 = 0x3f318000;
        uStack_47e4 = 0x3f318000;
        local_3180 = local_6d40._0_8_;
        uStack_3178 = local_6d40._8_8_;
        uStack_3170 = local_6d40._16_8_;
        uStack_3168 = local_6d40._24_8_;
        local_31a0 = 0x3f3180003f318000;
        uStack_3198 = 0x3f3180003f318000;
        uStack_3190 = 0x3f3180003f318000;
        uStack_3188 = 0x3f3180003f318000;
        local_31c0 = local_6d00._0_8_;
        uStack_31b8 = local_6d00._8_8_;
        uStack_31b0 = local_6d00._16_8_;
        uStack_31a8 = local_6d00._24_8_;
        auVar108._8_8_ = 0x3f3180003f318000;
        auVar108._0_8_ = 0x3f3180003f318000;
        auVar108._16_8_ = 0x3f3180003f318000;
        auVar108._24_8_ = 0x3f3180003f318000;
        auVar265 = vfnmadd213ps_fma(auVar108,local_6d40,auVar266);
        local_4840 = local_6d40._0_8_;
        uStack_4838 = local_6d40._8_8_;
        uStack_4830 = local_6d40._16_8_;
        uStack_4828 = local_6d40._24_8_;
        local_6d00._0_8_ = auVar265._0_8_;
        local_4880 = local_6d00._0_8_;
        local_6d00._8_8_ = auVar265._8_8_;
        uStack_4878 = local_6d00._8_8_;
        uStack_4870 = 0;
        uStack_4868 = 0;
        local_4860 = 0xb95e8083;
        uStack_485c = 0xb95e8083;
        uStack_4858 = 0xb95e8083;
        uStack_4854 = 0xb95e8083;
        uStack_4850 = 0xb95e8083;
        uStack_484c = 0xb95e8083;
        uStack_4848 = 0xb95e8083;
        uStack_4844 = 0xb95e8083;
        local_3120 = local_6d40._0_8_;
        uStack_3118 = local_6d40._8_8_;
        uStack_3110 = local_6d40._16_8_;
        uStack_3108 = local_6d40._24_8_;
        local_3140 = 0xb95e8083b95e8083;
        uStack_3138 = 0xb95e8083b95e8083;
        uStack_3130 = 0xb95e8083b95e8083;
        uStack_3128 = 0xb95e8083b95e8083;
        local_3160 = local_6d00._0_8_;
        uStack_3158 = local_6d00._8_8_;
        uStack_3150 = 0;
        uStack_3148 = 0;
        auVar109._8_8_ = 0xb95e8083b95e8083;
        auVar109._0_8_ = 0xb95e8083b95e8083;
        auVar109._16_8_ = 0xb95e8083b95e8083;
        auVar109._24_8_ = 0xb95e8083b95e8083;
        auVar263 = vfnmadd213ps_fma(auVar109,local_6d40,ZEXT1632(auVar265));
        local_6d00._0_8_ = auVar263._0_8_;
        local_6ca0 = local_6d00._0_8_;
        local_6d00._8_8_ = auVar263._8_8_;
        uStack_6c98 = local_6d00._8_8_;
        uStack_6c90 = 0;
        uStack_6c88 = 0;
        local_6c80._0_4_ = auVar263._0_4_;
        local_6c80._4_4_ = auVar263._4_4_;
        uStack_6c78._0_4_ = auVar263._8_4_;
        uStack_6c78._4_4_ = auVar263._12_4_;
        local_6d20._4_4_ = local_6c80._4_4_ * local_6c80._4_4_;
        local_6d20._0_4_ = (float)local_6c80 * (float)local_6c80;
        local_56a0 = local_6d20;
        uStack_6d18._0_4_ = (float)uStack_6c78 * (float)uStack_6c78;
        uStack_6d18._4_4_ = uStack_6c78._4_4_ * uStack_6c78._4_4_;
        auVar264 = _local_6d20;
        _local_6d20 = ZEXT1632(_local_6d20);
        auVar40 = _local_6d20;
        uStack_6db8._0_4_ = 0x39506967;
        local_6dc0 = (undefined1  [8])0x3950696739506967;
        uStack_6db8._4_4_ = 0x39506967;
        uStack_6db0._0_4_ = 0x39506967;
        uStack_6db0._4_4_ = 0x39506967;
        auVar260 = _local_6dc0;
        uStack_6da8._0_4_ = 0x39506967;
        uStack_6da8._4_4_ = 0x39506967;
        auVar270 = _local_6dc0;
        local_54a0 = 0x3950696739506967;
        uStack_5498 = uStack_6db8;
        uStack_6db0 = auVar260._16_8_;
        uStack_5490 = uStack_6db0;
        uStack_6da8 = auVar270._24_8_;
        uStack_5488 = uStack_6da8;
        local_54c0 = local_6d00._0_8_;
        uStack_54b8 = local_6d00._8_8_;
        uStack_54b0 = 0;
        uStack_54a8 = 0;
        local_54e0 = 0x3ab743ce;
        uStack_54dc = 0x3ab743ce;
        uStack_54d8 = 0x3ab743ce;
        uStack_54d4 = 0x3ab743ce;
        uStack_54d0 = 0x3ab743ce;
        uStack_54cc = 0x3ab743ce;
        uStack_54c8 = 0x3ab743ce;
        uStack_54c4 = 0x3ab743ce;
        local_3a80 = 0x3950696739506967;
        uStack_3a78 = uStack_6db8;
        uStack_3a70 = uStack_6db0;
        uStack_3a68 = uStack_6da8;
        local_3aa0 = local_6d00._0_8_;
        uStack_3a98 = local_6d00._8_8_;
        uStack_3a90 = 0;
        uStack_3a88 = 0;
        local_3ac0 = 0x3ab743ce3ab743ce;
        uStack_3ab8 = 0x3ab743ce3ab743ce;
        uStack_3ab0 = 0x3ab743ce3ab743ce;
        uStack_3aa8 = 0x3ab743ce3ab743ce;
        auVar83._16_8_ = uStack_6db0;
        auVar83._0_16_ = _local_6dc0;
        auVar83._24_8_ = uStack_6da8;
        auVar82._8_8_ = 0x3ab743ce3ab743ce;
        auVar82._0_8_ = 0x3ab743ce3ab743ce;
        auVar82._16_8_ = 0x3ab743ce3ab743ce;
        auVar82._24_8_ = 0x3ab743ce3ab743ce;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar263),auVar83,auVar82);
        local_6dc0 = auVar265._0_8_;
        local_5500 = local_6dc0;
        uStack_6db8 = auVar265._8_8_;
        uStack_54f8 = uStack_6db8;
        uStack_54f0 = 0;
        uStack_54e8 = 0;
        local_5520 = local_6d00._0_8_;
        uStack_5518 = local_6d00._8_8_;
        uStack_5510 = 0;
        uStack_5508 = 0;
        local_5540 = 0x3c088908;
        uStack_553c = 0x3c088908;
        uStack_5538 = 0x3c088908;
        uStack_5534 = 0x3c088908;
        uStack_5530 = 0x3c088908;
        uStack_552c = 0x3c088908;
        uStack_5528 = 0x3c088908;
        uStack_5524 = 0x3c088908;
        local_3a20 = local_6dc0;
        uStack_3a18 = uStack_6db8;
        uStack_3a10 = 0;
        uStack_3a08 = 0;
        local_3a40 = local_6d00._0_8_;
        uStack_3a38 = local_6d00._8_8_;
        uStack_3a30 = 0;
        uStack_3a28 = 0;
        local_3a60 = 0x3c0889083c088908;
        uStack_3a58 = 0x3c0889083c088908;
        uStack_3a50 = 0x3c0889083c088908;
        uStack_3a48 = 0x3c0889083c088908;
        auVar84._8_8_ = 0x3c0889083c088908;
        auVar84._0_8_ = 0x3c0889083c088908;
        auVar84._16_8_ = 0x3c0889083c088908;
        auVar84._24_8_ = 0x3c0889083c088908;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar263),ZEXT1632(auVar265),auVar84);
        local_6dc0 = auVar265._0_8_;
        local_5560 = local_6dc0;
        uStack_6db8 = auVar265._8_8_;
        uStack_5558 = uStack_6db8;
        uStack_5550 = 0;
        uStack_5548 = 0;
        local_5580 = local_6d00._0_8_;
        uStack_5578 = local_6d00._8_8_;
        uStack_5570 = 0;
        uStack_5568 = 0;
        local_55a0 = 0x3d2aa9c1;
        uStack_559c = 0x3d2aa9c1;
        uStack_5598 = 0x3d2aa9c1;
        uStack_5594 = 0x3d2aa9c1;
        uStack_5590 = 0x3d2aa9c1;
        uStack_558c = 0x3d2aa9c1;
        uStack_5588 = 0x3d2aa9c1;
        uStack_5584 = 0x3d2aa9c1;
        local_39c0 = local_6dc0;
        uStack_39b8 = uStack_6db8;
        uStack_39b0 = 0;
        uStack_39a8 = 0;
        local_39e0 = local_6d00._0_8_;
        uStack_39d8 = local_6d00._8_8_;
        uStack_39d0 = 0;
        uStack_39c8 = 0;
        local_3a00 = 0x3d2aa9c13d2aa9c1;
        uStack_39f8 = 0x3d2aa9c13d2aa9c1;
        uStack_39f0 = 0x3d2aa9c13d2aa9c1;
        uStack_39e8 = 0x3d2aa9c13d2aa9c1;
        auVar85._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar85._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar85._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar85._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar263),ZEXT1632(auVar265),auVar85);
        local_6dc0 = auVar265._0_8_;
        local_55c0 = local_6dc0;
        uStack_6db8 = auVar265._8_8_;
        uStack_55b8 = uStack_6db8;
        uStack_55b0 = 0;
        uStack_55a8 = 0;
        local_55e0 = local_6d00._0_8_;
        uStack_55d8 = local_6d00._8_8_;
        uStack_55d0 = 0;
        uStack_55c8 = 0;
        local_5600 = 0x3e2aaaaa;
        uStack_55fc = 0x3e2aaaaa;
        uStack_55f8 = 0x3e2aaaaa;
        uStack_55f4 = 0x3e2aaaaa;
        uStack_55f0 = 0x3e2aaaaa;
        uStack_55ec = 0x3e2aaaaa;
        uStack_55e8 = 0x3e2aaaaa;
        uStack_55e4 = 0x3e2aaaaa;
        local_3960 = local_6dc0;
        uStack_3958 = uStack_6db8;
        uStack_3950 = 0;
        uStack_3948 = 0;
        local_3980 = local_6d00._0_8_;
        uStack_3978 = local_6d00._8_8_;
        uStack_3970 = 0;
        uStack_3968 = 0;
        local_39a0 = 0x3e2aaaaa3e2aaaaa;
        uStack_3998 = 0x3e2aaaaa3e2aaaaa;
        uStack_3990 = 0x3e2aaaaa3e2aaaaa;
        uStack_3988 = 0x3e2aaaaa3e2aaaaa;
        auVar86._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar86._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar86._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar86._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar270 = vfmadd213ps_avx512vl(ZEXT1632(auVar263),ZEXT1632(auVar265),auVar86);
        local_6dc0 = auVar270._0_8_;
        local_5620 = local_6dc0;
        uStack_6db8 = auVar270._8_8_;
        uStack_5618 = uStack_6db8;
        uStack_6db0 = auVar270._16_8_;
        uStack_5610 = uStack_6db0;
        uStack_6da8 = auVar270._24_8_;
        uStack_5608 = uStack_6da8;
        local_5640 = local_6d00._0_8_;
        uStack_5638 = local_6d00._8_8_;
        uStack_5630 = 0;
        uStack_5628 = 0;
        local_5660 = 0x3f000000;
        uStack_565c = 0x3f000000;
        uStack_5658 = 0x3f000000;
        uStack_5654 = 0x3f000000;
        uStack_5650 = 0x3f000000;
        uStack_564c = 0x3f000000;
        uStack_5648 = 0x3f000000;
        uStack_5644 = 0x3f000000;
        local_3900 = local_6dc0;
        uStack_38f8 = uStack_6db8;
        uStack_38f0 = uStack_6db0;
        uStack_38e8 = uStack_6da8;
        local_3920 = local_6d00._0_8_;
        uStack_3918 = local_6d00._8_8_;
        uStack_3910 = 0;
        uStack_3908 = 0;
        local_3940 = 0x3f0000003f000000;
        uStack_3938 = 0x3f0000003f000000;
        uStack_3930 = 0x3f0000003f000000;
        uStack_3928 = 0x3f0000003f000000;
        auVar87._8_8_ = 0x3f0000003f000000;
        auVar87._0_8_ = 0x3f0000003f000000;
        auVar87._16_8_ = 0x3f0000003f000000;
        auVar87._24_8_ = 0x3f0000003f000000;
        auVar270 = vfmadd213ps_avx512vl(ZEXT1632(auVar263),auVar270,auVar87);
        local_6dc0 = auVar270._0_8_;
        local_5680 = local_6dc0;
        uStack_6db8 = auVar270._8_8_;
        uStack_5678 = uStack_6db8;
        uStack_6db0 = auVar270._16_8_;
        uStack_5670 = uStack_6db0;
        uStack_6da8 = auVar270._24_8_;
        uStack_5668 = uStack_6da8;
        uStack_6d18 = auVar264._8_8_;
        uStack_5698 = uStack_6d18;
        uStack_5690 = 0;
        uStack_5688 = 0;
        local_56c0 = local_6d00._0_8_;
        uStack_56b8 = local_6d00._8_8_;
        uStack_56b0 = 0;
        uStack_56a8 = 0;
        local_38a0 = local_6dc0;
        uStack_3898 = uStack_6db8;
        uStack_3890 = uStack_6db0;
        uStack_3888 = uStack_6da8;
        local_38c0 = local_56a0;
        uStack_38b8 = uStack_6d18;
        uStack_38b0 = 0;
        uStack_38a8 = 0;
        local_38e0 = local_6d00._0_8_;
        uStack_38d8 = local_6d00._8_8_;
        uStack_38d0 = 0;
        uStack_38c8 = 0;
        auVar270 = vfmadd213ps_avx512vl(ZEXT1632(auVar264),auVar270,ZEXT1632(auVar263));
        local_6dc0 = auVar270._0_8_;
        uVar3 = local_6dc0;
        uStack_6db8 = auVar270._8_8_;
        uVar4 = uStack_6db8;
        uStack_6db0 = auVar270._16_8_;
        uVar5 = uStack_6db0;
        uStack_6da8 = auVar270._24_8_;
        uVar6 = uStack_6da8;
        local_6c60 = 0x3f8000003f800000;
        uStack_6c58 = 0x3f8000003f800000;
        uStack_6c50 = 0x3f8000003f800000;
        uStack_6c48 = 0x3f8000003f800000;
        local_6c40._0_4_ = auVar270._0_4_;
        local_6c40._4_4_ = auVar270._4_4_;
        uStack_6c38._0_4_ = auVar270._8_4_;
        uStack_6c38._4_4_ = auVar270._12_4_;
        uStack_6c30._0_4_ = auVar270._16_4_;
        uStack_6c30._4_4_ = auVar270._20_4_;
        uStack_6c28._0_4_ = auVar270._24_4_;
        uStack_6c28._4_4_ = auVar270._28_4_;
        uStack_6c28._4_4_ = uStack_6c28._4_4_ + 1.0;
        local_6dc0._4_4_ = local_6c40._4_4_ + 1.0;
        local_6dc0._0_4_ = (float)local_6c40 + 1.0;
        uStack_6db8._0_4_ = (float)uStack_6c38 + 1.0;
        uStack_6db8._4_4_ = uStack_6c38._4_4_ + 1.0;
        uStack_6db0._0_4_ = (float)uStack_6c30 + 1.0;
        uStack_6db0._4_4_ = uStack_6c30._4_4_ + 1.0;
        auVar260 = _local_6dc0;
        uStack_6da8._0_4_ = (float)uStack_6c28 + 1.0;
        uStack_6da8._4_4_ = uStack_6c28._4_4_;
        auVar266 = _local_6dc0;
        local_2e40._0_4_ = local_6d40._0_4_;
        local_2e40._4_4_ = local_6d40._4_4_;
        uStack_2e38._0_4_ = local_6d40._8_4_;
        uStack_2e38._4_4_ = local_6d40._12_4_;
        uStack_2e30._0_4_ = local_6d40._16_4_;
        uStack_2e30._4_4_ = local_6d40._20_4_;
        uStack_2e28._0_4_ = local_6d40._24_4_;
        uStack_2e28._4_4_ = local_6d40._28_4_;
        local_6d60._4_4_ = (int)local_2e40._4_4_;
        local_6d60._0_4_ = (int)(float)local_2e40;
        local_6d60._8_4_ = (int)(float)uStack_2e38;
        local_6d60._12_4_ = (int)uStack_2e38._4_4_;
        local_6d60._16_4_ = (int)(float)uStack_2e30;
        local_6d60._20_4_ = (int)uStack_2e30._4_4_;
        auVar261 = local_6d60._0_24_;
        local_6d60._24_4_ = (int)(float)uStack_2e28;
        local_6d60._28_4_ = (int)uStack_2e28._4_4_;
        auVar270 = local_6d60;
        local_2d60 = local_6d60._0_8_;
        uStack_2d58 = local_6d60._8_8_;
        local_6d60._16_8_ = auVar261._16_8_;
        uStack_2d50 = local_6d60._16_8_;
        local_6d60._24_8_ = auVar270._24_8_;
        uStack_2d48 = local_6d60._24_8_;
        local_2d80 = 0x7f0000007f;
        uStack_2d78 = 0x7f0000007f;
        uStack_2d70 = 0x7f0000007f;
        uStack_2d68 = 0x7f0000007f;
        local_2b20 = local_6d60._0_8_;
        uStack_2b18 = local_6d60._8_8_;
        uStack_2b10 = local_6d60._16_8_;
        uStack_2b08 = local_6d60._24_8_;
        local_2b40 = 0x7f0000007f;
        uStack_2b38 = 0x7f0000007f;
        uStack_2b30 = 0x7f0000007f;
        uStack_2b28 = 0x7f0000007f;
        auVar121._16_8_ = local_6d60._16_8_;
        auVar121._0_16_ = local_6d60._0_16_;
        auVar121._24_8_ = local_6d60._24_8_;
        auVar120._8_8_ = 0x7f0000007f;
        auVar120._0_8_ = 0x7f0000007f;
        auVar120._16_8_ = 0x7f0000007f;
        auVar120._24_8_ = 0x7f0000007f;
        auVar270 = vpaddd_avx2(auVar121,auVar120);
        local_6d60._0_8_ = auVar270._0_8_;
        local_2c60 = local_6d60._0_8_;
        local_6d60._8_8_ = auVar270._8_8_;
        uStack_2c58 = local_6d60._8_8_;
        local_6d60._16_8_ = auVar270._16_8_;
        uStack_2c50 = local_6d60._16_8_;
        local_6d60._24_8_ = auVar270._24_8_;
        uStack_2c48 = local_6d60._24_8_;
        local_2c64 = 0x17;
        local_2a20 = local_6d60._0_8_;
        uStack_2a18 = local_6d60._8_8_;
        uStack_2a10 = local_6d60._16_8_;
        uStack_2a08 = local_6d60._24_8_;
        local_2a24 = 0x17;
        local_6d60 = vpslld_avx2(auVar270,ZEXT416(0x17));
        local_2bc0 = local_6d60._0_8_;
        uStack_2bb8 = local_6d60._8_8_;
        uStack_2bb0 = local_6d60._16_8_;
        uStack_2ba8 = local_6d60._24_8_;
        local_6de0 = local_6d60._0_8_;
        uStack_6dd8 = local_6d60._8_8_;
        uStack_6dd0 = local_6d60._16_8_;
        uStack_6dc8 = local_6d60._24_8_;
        local_6cc0 = local_6dc0;
        uStack_6cb8 = uStack_6db8;
        uStack_6db0 = auVar260._16_8_;
        uStack_6cb0 = uStack_6db0;
        uStack_6da8 = auVar266._24_8_;
        uStack_6ca8 = uStack_6da8;
        local_6ce0._0_4_ = local_6d60._0_4_;
        local_6ce0._4_4_ = local_6d60._4_4_;
        uStack_6cd8._0_4_ = local_6d60._8_4_;
        uStack_6cd8._4_4_ = local_6d60._12_4_;
        uStack_6cd0._0_4_ = local_6d60._16_4_;
        uStack_6cd0._4_4_ = local_6d60._20_4_;
        uStack_6cc8._0_4_ = local_6d60._24_4_;
        local_6dc0._0_4_ = ((float)local_6c40 + 1.0) * (float)local_6ce0;
        local_6dc0._4_4_ = (local_6c40._4_4_ + 1.0) * local_6ce0._4_4_;
        uStack_6cd8._0_4_ = ((float)uStack_6c38 + 1.0) * (float)uStack_6cd8;
        uStack_6cd8._4_4_ = (uStack_6c38._4_4_ + 1.0) * uStack_6cd8._4_4_;
        uStack_6cd0._0_4_ = ((float)uStack_6c30 + 1.0) * (float)uStack_6cd0;
        uStack_6cd0._4_4_ = (uStack_6c30._4_4_ + 1.0) * uStack_6cd0._4_4_;
        uStack_6cc8._0_4_ = ((float)uStack_6c28 + 1.0) * (float)uStack_6cc8;
        uStack_6db8._0_4_ = (float)uStack_6cd8;
        uStack_6db8._4_4_ = uStack_6cd8._4_4_;
        uStack_6db0._0_4_ = (float)uStack_6cd0;
        uStack_6db0._4_4_ = uStack_6cd0._4_4_;
        auVar260 = _local_6dc0;
        uStack_6da8._0_4_ = (float)uStack_6cc8;
        auVar32 = _local_6dc0;
        local_6fc0 = local_6dc0;
        uStack_6fb8 = uStack_6db8;
        uStack_6db0 = auVar260._16_8_;
        uStack_6fb0 = uStack_6db0;
        uStack_6da8 = auVar32._24_8_;
        uStack_6fa8 = uStack_6da8;
        local_6c04 = 0x3f800000;
        local_28e0 = 0x3f800000;
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auStack_2900 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auStack_28f0 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        local_6fe0._0_4_ = auStack_2900._0_4_;
        local_6fe0._4_4_ = auStack_2900._4_4_;
        uStack_6fd8._0_4_ = auStack_2900._8_4_;
        uStack_6fd8._4_4_ = auStack_2900._12_4_;
        uStack_6fd0._0_4_ = auStack_28f0._0_4_;
        uStack_6fd0._4_4_ = auStack_28f0._4_4_;
        uStack_6fc8._0_4_ = auStack_28f0._8_4_;
        uStack_6fc8._4_4_ = auStack_28f0._12_4_;
        local_7280._4_4_ = (float)local_6dc0._4_4_ + local_6fe0._4_4_;
        local_7280._0_4_ = (float)local_6dc0._0_4_ + (float)local_6fe0;
        uStack_7278._0_4_ = (float)uStack_6cd8 + (float)uStack_6fd8;
        uStack_7278._4_4_ = uStack_6cd8._4_4_ + uStack_6fd8._4_4_;
        uStack_7270._0_4_ = (float)uStack_6cd0 + (float)uStack_6fd0;
        uStack_7270._4_4_ = uStack_6cd0._4_4_ + uStack_6fd0._4_4_;
        auVar260 = _local_7280;
        uStack_7268._0_4_ = (float)uStack_6cc8 + (float)uStack_6fc8;
        uStack_7268._4_4_ = uStack_6c28._4_4_ + uStack_6fc8._4_4_;
        auVar270 = _local_7280;
        local_72c0 = 0x3f800000;
        uStack_72bc = 0x3f800000;
        uStack_72b8 = 0x3f800000;
        uStack_72b4 = 0x3f800000;
        uStack_72b0 = 0x3f800000;
        uStack_72ac = 0x3f800000;
        uStack_72a8 = 0x3f800000;
        uStack_72a4 = 0x3f800000;
        local_62c0 = 0;
        uStack_62b8 = 0;
        uStack_62b0 = 0;
        uStack_62a8 = 0;
        local_72e0 = vcmpps_avx(_local_7280,ZEXT1632(ZEXT816(0)),2);
        local_5cc0 = 0x7f0000007f;
        uStack_5cb8 = 0x7f0000007f;
        uStack_5cb0 = 0x7f0000007f;
        uStack_5ca8 = 0x7f0000007f;
        local_6160 = local_7280;
        uStack_6158 = uStack_7278;
        uStack_7270 = auVar260._16_8_;
        uStack_6150 = uStack_7270;
        uStack_7268 = auVar270._24_8_;
        uStack_6148 = uStack_7268;
        local_6180 = 0x800000;
        uStack_617c = 0x800000;
        uStack_6178 = 0x800000;
        uStack_6174 = 0x800000;
        uStack_6170 = 0x800000;
        uStack_616c = 0x800000;
        uStack_6168 = 0x800000;
        uStack_6164 = 0x800000;
        auVar35._16_8_ = uStack_7270;
        auVar35._0_16_ = _local_7280;
        auVar35._24_8_ = uStack_7268;
        auVar34._8_4_ = 0x800000;
        auVar34._0_8_ = 0x80000000800000;
        auVar34._12_4_ = 0x800000;
        auVar34._16_4_ = 0x800000;
        auVar34._20_4_ = 0x800000;
        auVar34._24_4_ = 0x800000;
        auVar34._28_4_ = 0x800000;
        auVar270 = vmaxps_avx512vl(auVar35,auVar34);
        local_7280 = auVar270._0_8_;
        local_6080 = local_7280;
        uStack_7278 = auVar270._8_8_;
        uStack_6078 = uStack_7278;
        uStack_7270 = auVar270._16_8_;
        uStack_6070 = uStack_7270;
        uStack_7268 = auVar270._24_8_;
        uStack_6068 = uStack_7268;
        local_60e0 = local_7280;
        uStack_60d8 = uStack_7278;
        uStack_60d0 = uStack_7270;
        uStack_60c8 = uStack_7268;
        local_60e4 = 0x17;
        local_45e0 = local_7280;
        uStack_45d8 = uStack_7278;
        uStack_45d0 = uStack_7270;
        uStack_45c8 = uStack_7268;
        local_45e4 = 0x17;
        auVar266 = vpsrld_avx512vl(auVar270,ZEXT416(0x17));
        local_5ea0 = local_7280;
        uStack_5e98 = uStack_7278;
        uStack_5e90 = uStack_7270;
        uStack_5e88 = uStack_7268;
        local_5ec0 = 0x807fffff;
        uStack_5ebc = 0x807fffff;
        uStack_5eb8 = 0x807fffff;
        uStack_5eb4 = 0x807fffff;
        uStack_5eb0 = 0x807fffff;
        uStack_5eac = 0x807fffff;
        uStack_5ea8 = 0x807fffff;
        uStack_5ea4 = 0x807fffff;
        auVar43._8_4_ = 0x807fffff;
        auVar43._0_8_ = 0x807fffff807fffff;
        auVar43._12_4_ = 0x807fffff;
        auVar43._16_4_ = 0x807fffff;
        auVar43._20_4_ = 0x807fffff;
        auVar43._24_4_ = 0x807fffff;
        auVar43._28_4_ = 0x807fffff;
        auVar267 = vmovdqa64_avx512vl(auVar43);
        auVar270 = vpandd_avx512vl(auVar270,auVar267);
        local_7280 = auVar270._0_8_;
        local_5d60 = local_7280;
        uStack_7278 = auVar270._8_8_;
        uStack_5d58 = uStack_7278;
        uStack_7270 = auVar270._16_8_;
        uStack_5d50 = uStack_7270;
        uStack_7268 = auVar270._24_8_;
        uStack_5d48 = uStack_7268;
        local_5d80 = 0x3f000000;
        uStack_5d7c = 0x3f000000;
        uStack_5d78 = 0x3f000000;
        uStack_5d74 = 0x3f000000;
        uStack_5d70 = 0x3f000000;
        uStack_5d6c = 0x3f000000;
        uStack_5d68 = 0x3f000000;
        uStack_5d64 = 0x3f000000;
        auVar46._8_4_ = 0x3f000000;
        auVar46._0_8_ = 0x3f0000003f000000;
        auVar46._12_4_ = 0x3f000000;
        auVar46._16_4_ = 0x3f000000;
        auVar46._20_4_ = 0x3f000000;
        auVar46._24_4_ = 0x3f000000;
        auVar46._28_4_ = 0x3f000000;
        auVar267 = vmovdqa64_avx512vl(auVar46);
        auVar267 = vpord_avx512vl(auVar270,auVar267);
        local_72a0._0_8_ = auVar266._0_8_;
        local_5ca0 = local_72a0._0_8_;
        local_72a0._8_8_ = auVar266._8_8_;
        uStack_5c98 = local_72a0._8_8_;
        local_72a0._16_8_ = auVar266._16_8_;
        uStack_5c90 = local_72a0._16_8_;
        local_72a0._24_8_ = auVar266._24_8_;
        uStack_5c88 = local_72a0._24_8_;
        local_4560 = local_72a0._0_8_;
        uStack_4558 = local_72a0._8_8_;
        uStack_4550 = local_72a0._16_8_;
        uStack_4548 = local_72a0._24_8_;
        local_4580 = 0x7f0000007f;
        uStack_4578 = 0x7f0000007f;
        uStack_4570 = 0x7f0000007f;
        uStack_4568 = 0x7f0000007f;
        auVar49._8_8_ = 0x7f0000007f;
        auVar49._0_8_ = 0x7f0000007f;
        auVar49._16_8_ = 0x7f0000007f;
        auVar49._24_8_ = 0x7f0000007f;
        local_72a0 = vpsubd_avx2(auVar266,auVar49);
        local_5c40 = local_72a0._0_8_;
        uStack_5c38 = local_72a0._8_8_;
        uStack_5c30 = local_72a0._16_8_;
        uStack_5c28 = local_72a0._24_8_;
        auVar270 = vcvtdq2ps_avx(local_72a0);
        local_7300 = auVar270._0_8_;
        uVar7 = local_7300;
        uStack_72f8 = auVar270._8_8_;
        uVar8 = uStack_72f8;
        uStack_72f0 = auVar270._16_8_;
        uVar9 = uStack_72f0;
        uStack_72e8 = auVar270._24_8_;
        uVar10 = uStack_72e8;
        local_7120 = 0x3f8000003f800000;
        uStack_7118 = 0x3f8000003f800000;
        uStack_7110 = 0x3f8000003f800000;
        uStack_7108 = 0x3f8000003f800000;
        local_7100._0_4_ = auVar270._0_4_;
        local_7100._4_4_ = auVar270._4_4_;
        uStack_70f8._0_4_ = auVar270._8_4_;
        uStack_70f8._4_4_ = auVar270._12_4_;
        uStack_70f0._0_4_ = auVar270._16_4_;
        uStack_70f0._4_4_ = auVar270._20_4_;
        uStack_70e8._0_4_ = auVar270._24_4_;
        uStack_70e8._4_4_ = auVar270._28_4_;
        local_7300._4_4_ = local_7100._4_4_ + 1.0;
        local_7300._0_4_ = (float)local_7100 + 1.0;
        uStack_72f8._0_4_ = (float)uStack_70f8 + 1.0;
        uStack_72f8._4_4_ = uStack_70f8._4_4_ + 1.0;
        uStack_72f0._0_4_ = (float)uStack_70f0 + 1.0;
        uStack_72f0._4_4_ = uStack_70f0._4_4_ + 1.0;
        auVar260 = _local_7300;
        uStack_72e8._0_4_ = (float)uStack_70e8 + 1.0;
        uStack_72e8._4_4_ = uStack_70e8._4_4_ + 1.0;
        auVar270 = _local_7300;
        auVar274._8_4_ = 0x3f3504f3;
        auVar274._0_8_ = 0x3f3504f33f3504f3;
        auVar274._12_4_ = 0x3f3504f3;
        auVar274._16_4_ = 0x3f3504f3;
        auVar274._20_4_ = 0x3f3504f3;
        auVar274._24_4_ = 0x3f3504f3;
        auVar274._28_4_ = 0x3f3504f3;
        local_7320 = vcmpps_avx(auVar267,auVar274,1);
        local_2dc0 = 0x7f0000007f;
        uStack_2db8 = 0x7f0000007f;
        uStack_2db0 = 0x7f0000007f;
        uStack_2da8 = 0x7f0000007f;
        local_7280 = auVar267._0_8_;
        local_5ee0 = local_7280;
        uStack_7278 = auVar267._8_8_;
        uStack_5ed8 = uStack_7278;
        uStack_7270 = auVar267._16_8_;
        uStack_5ed0 = uStack_7270;
        uStack_7268 = auVar267._24_8_;
        uStack_5ec8 = uStack_7268;
        local_5f00 = local_7320._0_8_;
        uStack_5ef8 = local_7320._8_8_;
        uStack_5ef0 = local_7320._16_8_;
        uStack_5ee8 = local_7320._24_8_;
        auVar266 = vmovdqa64_avx512vl(local_7320);
        local_7340 = vpandd_avx512vl(auVar267,auVar266);
        local_6420 = local_7280;
        uStack_6418 = uStack_7278;
        uStack_6410 = uStack_7270;
        uStack_6408 = uStack_7268;
        local_6440 = 0x3f8000003f800000;
        uStack_6438 = 0x3f8000003f800000;
        uStack_6430 = 0x3f8000003f800000;
        uStack_6428 = 0x3f8000003f800000;
        auVar27._8_8_ = 0x3f8000003f800000;
        auVar27._0_8_ = 0x3f8000003f800000;
        auVar27._16_8_ = 0x3f8000003f800000;
        auVar27._24_8_ = 0x3f8000003f800000;
        auVar266 = vsubps_avx512vl(auVar267,auVar27);
        local_6460 = local_7300;
        uStack_6458 = uStack_72f8;
        uStack_72f0 = auVar260._16_8_;
        uStack_6450 = uStack_72f0;
        uStack_72e8 = auVar270._24_8_;
        uStack_6448 = uStack_72e8;
        local_5f20 = 0x3f8000003f800000;
        uStack_5f18 = 0x3f8000003f800000;
        uStack_5f10 = 0x3f8000003f800000;
        uStack_5f08 = 0x3f8000003f800000;
        local_5f40 = local_7320._0_8_;
        uStack_5f38 = local_7320._8_8_;
        uStack_5f30 = local_7320._16_8_;
        uStack_5f28 = local_7320._24_8_;
        auVar42._8_8_ = 0x3f8000003f800000;
        auVar42._0_8_ = 0x3f8000003f800000;
        auVar42._16_8_ = 0x3f8000003f800000;
        auVar42._24_8_ = 0x3f8000003f800000;
        auVar270 = vmovdqa64_avx512vl(local_7320);
        local_6480 = vpandd_avx512vl(auVar42,auVar270);
        auVar26._16_8_ = uStack_72f0;
        auVar26._0_16_ = _local_7300;
        auVar26._24_8_ = uStack_72e8;
        _local_7300 = vsubps_avx512vl(auVar26,local_6480);
        local_7280 = auVar266._0_8_;
        local_7140 = local_7280;
        uStack_7278 = auVar266._8_8_;
        uStack_7138 = uStack_7278;
        uStack_7270 = auVar266._16_8_;
        uStack_7130 = uStack_7270;
        uStack_7268 = auVar266._24_8_;
        uStack_7128 = uStack_7268;
        local_7160 = local_7340._0_8_;
        uStack_7158 = local_7340._8_8_;
        uStack_7150 = local_7340._16_8_;
        uStack_7148 = local_7340._24_8_;
        auVar266 = vaddps_avx512vl(auVar266,local_7340);
        local_7280 = auVar266._0_8_;
        local_71e0 = local_7280;
        uStack_7278 = auVar266._8_8_;
        uStack_71d8 = uStack_7278;
        uStack_7270 = auVar266._16_8_;
        uStack_71d0 = uStack_7270;
        uStack_7268 = auVar266._24_8_;
        uStack_71c8 = uStack_7268;
        local_7360 = vmulps_avx512vl(auVar266,auVar266);
        local_7380._8_4_ = 0x3d9021bb;
        local_7380._0_8_ = 0x3d9021bb3d9021bb;
        local_7380._12_4_ = 0x3d9021bb;
        local_7380._16_4_ = 0x3d9021bb;
        local_7380._20_4_ = 0x3d9021bb;
        auVar260 = local_7380._0_24_;
        local_7380._24_4_ = 0x3d9021bb;
        local_7380._28_4_ = 0x3d9021bb;
        auVar270 = local_7380;
        local_4de0 = 0x3d9021bb3d9021bb;
        uStack_4dd8 = local_7380._8_8_;
        local_7380._16_8_ = auVar260._16_8_;
        uStack_4dd0 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_4dc8 = local_7380._24_8_;
        local_4e00 = local_7280;
        uStack_4df8 = uStack_7278;
        uStack_4df0 = uStack_7270;
        uStack_4de8 = uStack_7268;
        local_4e20 = 0xbdebd1b8;
        uStack_4e1c = 0xbdebd1b8;
        uStack_4e18 = 0xbdebd1b8;
        uStack_4e14 = 0xbdebd1b8;
        uStack_4e10 = 0xbdebd1b8;
        uStack_4e0c = 0xbdebd1b8;
        uStack_4e08 = 0xbdebd1b8;
        uStack_4e04 = 0xbdebd1b8;
        local_4140 = 0x3d9021bb3d9021bb;
        uStack_4138 = local_7380._8_8_;
        uStack_4130 = local_7380._16_8_;
        uStack_4128 = local_7380._24_8_;
        local_4160 = local_7280;
        uStack_4158 = uStack_7278;
        uStack_4150 = uStack_7270;
        uStack_4148 = uStack_7268;
        local_4180 = 0xbdebd1b8bdebd1b8;
        uStack_4178 = 0xbdebd1b8bdebd1b8;
        uStack_4170 = 0xbdebd1b8bdebd1b8;
        uStack_4168 = 0xbdebd1b8bdebd1b8;
        auVar62._16_8_ = local_7380._16_8_;
        auVar62._0_16_ = local_7380._0_16_;
        auVar62._24_8_ = local_7380._24_8_;
        auVar61._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar61._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar61._16_8_ = 0xbdebd1b8bdebd1b8;
        auVar61._24_8_ = 0xbdebd1b8bdebd1b8;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar62,auVar61);
        local_7380._0_8_ = auVar270._0_8_;
        local_4e40 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_4e38 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_4e30 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_4e28 = local_7380._24_8_;
        local_4e60 = local_7280;
        uStack_4e58 = uStack_7278;
        uStack_4e50 = uStack_7270;
        uStack_4e48 = uStack_7268;
        local_4e80 = 0x3def251a;
        uStack_4e7c = 0x3def251a;
        uStack_4e78 = 0x3def251a;
        uStack_4e74 = 0x3def251a;
        uStack_4e70 = 0x3def251a;
        uStack_4e6c = 0x3def251a;
        uStack_4e68 = 0x3def251a;
        uStack_4e64 = 0x3def251a;
        local_40e0 = local_7380._0_8_;
        uStack_40d8 = local_7380._8_8_;
        uStack_40d0 = local_7380._16_8_;
        uStack_40c8 = local_7380._24_8_;
        local_4100 = local_7280;
        uStack_40f8 = uStack_7278;
        uStack_40f0 = uStack_7270;
        uStack_40e8 = uStack_7268;
        local_4120 = 0x3def251a3def251a;
        uStack_4118 = 0x3def251a3def251a;
        uStack_4110 = 0x3def251a3def251a;
        uStack_4108 = 0x3def251a3def251a;
        auVar63._8_8_ = 0x3def251a3def251a;
        auVar63._0_8_ = 0x3def251a3def251a;
        auVar63._16_8_ = 0x3def251a3def251a;
        auVar63._24_8_ = 0x3def251a3def251a;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar270,auVar63);
        local_7380._0_8_ = auVar270._0_8_;
        local_4ea0 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_4e98 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_4e90 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_4e88 = local_7380._24_8_;
        local_4ec0 = local_7280;
        uStack_4eb8 = uStack_7278;
        uStack_4eb0 = uStack_7270;
        uStack_4ea8 = uStack_7268;
        local_4ee0 = 0xbdfe5d4f;
        uStack_4edc = 0xbdfe5d4f;
        uStack_4ed8 = 0xbdfe5d4f;
        uStack_4ed4 = 0xbdfe5d4f;
        uStack_4ed0 = 0xbdfe5d4f;
        uStack_4ecc = 0xbdfe5d4f;
        uStack_4ec8 = 0xbdfe5d4f;
        uStack_4ec4 = 0xbdfe5d4f;
        local_4080 = local_7380._0_8_;
        uStack_4078 = local_7380._8_8_;
        uStack_4070 = local_7380._16_8_;
        uStack_4068 = local_7380._24_8_;
        local_40a0 = local_7280;
        uStack_4098 = uStack_7278;
        uStack_4090 = uStack_7270;
        uStack_4088 = uStack_7268;
        local_40c0 = 0xbdfe5d4fbdfe5d4f;
        uStack_40b8 = 0xbdfe5d4fbdfe5d4f;
        uStack_40b0 = 0xbdfe5d4fbdfe5d4f;
        uStack_40a8 = 0xbdfe5d4fbdfe5d4f;
        auVar64._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar64._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar64._16_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar64._24_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar270,auVar64);
        local_7380._0_8_ = auVar270._0_8_;
        local_4f00 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_4ef8 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_4ef0 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_4ee8 = local_7380._24_8_;
        local_4f20 = local_7280;
        uStack_4f18 = uStack_7278;
        uStack_4f10 = uStack_7270;
        uStack_4f08 = uStack_7268;
        local_4f40 = 0x3e11e9bf;
        uStack_4f3c = 0x3e11e9bf;
        uStack_4f38 = 0x3e11e9bf;
        uStack_4f34 = 0x3e11e9bf;
        uStack_4f30 = 0x3e11e9bf;
        uStack_4f2c = 0x3e11e9bf;
        uStack_4f28 = 0x3e11e9bf;
        uStack_4f24 = 0x3e11e9bf;
        local_4020 = local_7380._0_8_;
        uStack_4018 = local_7380._8_8_;
        uStack_4010 = local_7380._16_8_;
        uStack_4008 = local_7380._24_8_;
        local_4040 = local_7280;
        uStack_4038 = uStack_7278;
        uStack_4030 = uStack_7270;
        uStack_4028 = uStack_7268;
        local_4060 = 0x3e11e9bf3e11e9bf;
        uStack_4058 = 0x3e11e9bf3e11e9bf;
        uStack_4050 = 0x3e11e9bf3e11e9bf;
        uStack_4048 = 0x3e11e9bf3e11e9bf;
        auVar65._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar65._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar65._16_8_ = 0x3e11e9bf3e11e9bf;
        auVar65._24_8_ = 0x3e11e9bf3e11e9bf;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar270,auVar65);
        local_7380._0_8_ = auVar270._0_8_;
        local_4f60 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_4f58 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_4f50 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_4f48 = local_7380._24_8_;
        local_4f80 = local_7280;
        uStack_4f78 = uStack_7278;
        uStack_4f70 = uStack_7270;
        uStack_4f68 = uStack_7268;
        local_4fa0 = 0xbe2aae50;
        uStack_4f9c = 0xbe2aae50;
        uStack_4f98 = 0xbe2aae50;
        uStack_4f94 = 0xbe2aae50;
        uStack_4f90 = 0xbe2aae50;
        uStack_4f8c = 0xbe2aae50;
        uStack_4f88 = 0xbe2aae50;
        uStack_4f84 = 0xbe2aae50;
        local_3fc0 = local_7380._0_8_;
        uStack_3fb8 = local_7380._8_8_;
        uStack_3fb0 = local_7380._16_8_;
        uStack_3fa8 = local_7380._24_8_;
        local_3fe0 = local_7280;
        uStack_3fd8 = uStack_7278;
        uStack_3fd0 = uStack_7270;
        uStack_3fc8 = uStack_7268;
        local_4000 = 0xbe2aae50be2aae50;
        uStack_3ff8 = 0xbe2aae50be2aae50;
        uStack_3ff0 = 0xbe2aae50be2aae50;
        uStack_3fe8 = 0xbe2aae50be2aae50;
        auVar66._8_8_ = 0xbe2aae50be2aae50;
        auVar66._0_8_ = 0xbe2aae50be2aae50;
        auVar66._16_8_ = 0xbe2aae50be2aae50;
        auVar66._24_8_ = 0xbe2aae50be2aae50;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar270,auVar66);
        local_7380._0_8_ = auVar270._0_8_;
        local_4fc0 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_4fb8 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_4fb0 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_4fa8 = local_7380._24_8_;
        local_4fe0 = local_7280;
        uStack_4fd8 = uStack_7278;
        uStack_4fd0 = uStack_7270;
        uStack_4fc8 = uStack_7268;
        local_5000 = 0x3e4cceac;
        uStack_4ffc = 0x3e4cceac;
        uStack_4ff8 = 0x3e4cceac;
        uStack_4ff4 = 0x3e4cceac;
        uStack_4ff0 = 0x3e4cceac;
        uStack_4fec = 0x3e4cceac;
        uStack_4fe8 = 0x3e4cceac;
        uStack_4fe4 = 0x3e4cceac;
        local_3f60 = local_7380._0_8_;
        uStack_3f58 = local_7380._8_8_;
        uStack_3f50 = local_7380._16_8_;
        uStack_3f48 = local_7380._24_8_;
        local_3f80 = local_7280;
        uStack_3f78 = uStack_7278;
        uStack_3f70 = uStack_7270;
        uStack_3f68 = uStack_7268;
        local_3fa0 = 0x3e4cceac3e4cceac;
        uStack_3f98 = 0x3e4cceac3e4cceac;
        uStack_3f90 = 0x3e4cceac3e4cceac;
        uStack_3f88 = 0x3e4cceac3e4cceac;
        auVar67._8_8_ = 0x3e4cceac3e4cceac;
        auVar67._0_8_ = 0x3e4cceac3e4cceac;
        auVar67._16_8_ = 0x3e4cceac3e4cceac;
        auVar67._24_8_ = 0x3e4cceac3e4cceac;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar270,auVar67);
        local_7380._0_8_ = auVar270._0_8_;
        local_5020 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_5018 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_5010 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_5008 = local_7380._24_8_;
        local_5040 = local_7280;
        uStack_5038 = uStack_7278;
        uStack_5030 = uStack_7270;
        uStack_5028 = uStack_7268;
        local_5060 = 0xbe7ffffc;
        uStack_505c = 0xbe7ffffc;
        uStack_5058 = 0xbe7ffffc;
        uStack_5054 = 0xbe7ffffc;
        uStack_5050 = 0xbe7ffffc;
        uStack_504c = 0xbe7ffffc;
        uStack_5048 = 0xbe7ffffc;
        uStack_5044 = 0xbe7ffffc;
        local_3f00 = local_7380._0_8_;
        uStack_3ef8 = local_7380._8_8_;
        uStack_3ef0 = local_7380._16_8_;
        uStack_3ee8 = local_7380._24_8_;
        local_3f20 = local_7280;
        uStack_3f18 = uStack_7278;
        uStack_3f10 = uStack_7270;
        uStack_3f08 = uStack_7268;
        local_3f40 = 0xbe7ffffcbe7ffffc;
        uStack_3f38 = 0xbe7ffffcbe7ffffc;
        uStack_3f30 = 0xbe7ffffcbe7ffffc;
        uStack_3f28 = 0xbe7ffffcbe7ffffc;
        auVar68._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar68._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar68._16_8_ = 0xbe7ffffcbe7ffffc;
        auVar68._24_8_ = 0xbe7ffffcbe7ffffc;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar270,auVar68);
        local_7380._0_8_ = auVar270._0_8_;
        local_5080 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_5078 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_5070 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_5068 = local_7380._24_8_;
        local_50a0 = local_7280;
        uStack_5098 = uStack_7278;
        uStack_5090 = uStack_7270;
        uStack_5088 = uStack_7268;
        local_50c0 = 0x3eaaaaaa;
        uStack_50bc = 0x3eaaaaaa;
        uStack_50b8 = 0x3eaaaaaa;
        uStack_50b4 = 0x3eaaaaaa;
        uStack_50b0 = 0x3eaaaaaa;
        uStack_50ac = 0x3eaaaaaa;
        uStack_50a8 = 0x3eaaaaaa;
        uStack_50a4 = 0x3eaaaaaa;
        local_3ea0 = local_7380._0_8_;
        uStack_3e98 = local_7380._8_8_;
        uStack_3e90 = local_7380._16_8_;
        uStack_3e88 = local_7380._24_8_;
        local_3ec0 = local_7280;
        uStack_3eb8 = uStack_7278;
        uStack_3eb0 = uStack_7270;
        uStack_3ea8 = uStack_7268;
        local_3ee0 = 0x3eaaaaaa3eaaaaaa;
        uStack_3ed8 = 0x3eaaaaaa3eaaaaaa;
        uStack_3ed0 = 0x3eaaaaaa3eaaaaaa;
        uStack_3ec8 = 0x3eaaaaaa3eaaaaaa;
        auVar69._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar69._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar69._16_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar69._24_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar270 = vfmadd213ps_avx512vl(auVar266,auVar270,auVar69);
        local_7380._0_8_ = auVar270._0_8_;
        local_7200 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_71f8 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_71f0 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_71e8 = local_7380._24_8_;
        local_7220 = local_7280;
        uStack_7218 = uStack_7278;
        uStack_7210 = uStack_7270;
        uStack_7208 = uStack_7268;
        auVar270 = vmulps_avx512vl(auVar270,auVar266);
        local_7380._0_8_ = auVar270._0_8_;
        local_7240 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_7238 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_7230 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_7228 = local_7380._24_8_;
        local_7260 = local_7360._0_8_;
        uStack_7258 = local_7360._8_8_;
        uStack_7250 = local_7360._16_8_;
        uStack_7248 = local_7360._24_8_;
        auVar270 = vmulps_avx512vl(auVar270,local_7360);
        local_50e0 = local_7300;
        uStack_50d8 = uStack_72f8;
        uStack_50d0 = uStack_72f0;
        uStack_50c8 = uStack_72e8;
        local_7380._0_8_ = auVar270._0_8_;
        local_5120 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_5118 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_5110 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_5108 = local_7380._24_8_;
        local_5100 = 0xb95e8083;
        uStack_50fc = 0xb95e8083;
        uStack_50f8 = 0xb95e8083;
        uStack_50f4 = 0xb95e8083;
        uStack_50f0 = 0xb95e8083;
        uStack_50ec = 0xb95e8083;
        uStack_50e8 = 0xb95e8083;
        uStack_50e4 = 0xb95e8083;
        local_3e40 = local_7300;
        uStack_3e38 = uStack_72f8;
        uStack_3e30 = uStack_72f0;
        uStack_3e28 = uStack_72e8;
        local_3e60 = 0xb95e8083b95e8083;
        uStack_3e58 = 0xb95e8083b95e8083;
        uStack_3e50 = 0xb95e8083b95e8083;
        uStack_3e48 = 0xb95e8083b95e8083;
        local_3e80 = local_7380._0_8_;
        uStack_3e78 = local_7380._8_8_;
        uStack_3e70 = local_7380._16_8_;
        uStack_3e68 = local_7380._24_8_;
        auVar70._8_8_ = 0xb95e8083b95e8083;
        auVar70._0_8_ = 0xb95e8083b95e8083;
        auVar70._16_8_ = 0xb95e8083b95e8083;
        auVar70._24_8_ = 0xb95e8083b95e8083;
        auVar270 = vfmadd213ps_avx512vl(auVar70,_local_7300,auVar270);
        local_46c0 = local_7360._0_8_;
        uStack_46b8 = local_7360._8_8_;
        uStack_46b0 = local_7360._16_8_;
        uStack_46a8 = local_7360._24_8_;
        local_7380._0_8_ = auVar270._0_8_;
        local_4700 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_46f8 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_46f0 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_46e8 = local_7380._24_8_;
        local_46e0 = 0x3f000000;
        uStack_46dc = 0x3f000000;
        uStack_46d8 = 0x3f000000;
        uStack_46d4 = 0x3f000000;
        uStack_46d0 = 0x3f000000;
        uStack_46cc = 0x3f000000;
        uStack_46c8 = 0x3f000000;
        uStack_46c4 = 0x3f000000;
        local_32a0 = local_7360._0_8_;
        uStack_3298 = local_7360._8_8_;
        uStack_3290 = local_7360._16_8_;
        uStack_3288 = local_7360._24_8_;
        local_32c0 = 0x3f0000003f000000;
        uStack_32b8 = 0x3f0000003f000000;
        uStack_32b0 = 0x3f0000003f000000;
        uStack_32a8 = 0x3f0000003f000000;
        local_32e0 = local_7380._0_8_;
        uStack_32d8 = local_7380._8_8_;
        uStack_32d0 = local_7380._16_8_;
        uStack_32c8 = local_7380._24_8_;
        auVar105._8_8_ = 0x3f0000003f000000;
        auVar105._0_8_ = 0x3f0000003f000000;
        auVar105._16_8_ = 0x3f0000003f000000;
        auVar105._24_8_ = 0x3f0000003f000000;
        auVar270 = vfnmadd213ps_avx512vl(auVar105,local_7360,auVar270);
        local_7180 = local_7280;
        uStack_7178 = uStack_7278;
        uStack_7170 = uStack_7270;
        uStack_7168 = uStack_7268;
        local_7380._0_8_ = auVar270._0_8_;
        local_71a0 = local_7380._0_8_;
        local_7380._8_8_ = auVar270._8_8_;
        uStack_7198 = local_7380._8_8_;
        local_7380._16_8_ = auVar270._16_8_;
        uStack_7190 = local_7380._16_8_;
        local_7380._24_8_ = auVar270._24_8_;
        uStack_7188 = local_7380._24_8_;
        auVar270 = vaddps_avx512vl(auVar266,auVar270);
        local_5140 = local_7300;
        uStack_5138 = uStack_72f8;
        uStack_5130 = uStack_72f0;
        uStack_5128 = uStack_72e8;
        local_7280 = auVar270._0_8_;
        local_5180 = local_7280;
        uStack_7278 = auVar270._8_8_;
        uStack_5178 = uStack_7278;
        uStack_7270 = auVar270._16_8_;
        uStack_5170 = uStack_7270;
        uStack_7268 = auVar270._24_8_;
        uStack_5168 = uStack_7268;
        local_5160 = 0x3f318000;
        uStack_515c = 0x3f318000;
        uStack_5158 = 0x3f318000;
        uStack_5154 = 0x3f318000;
        uStack_5150 = 0x3f318000;
        uStack_514c = 0x3f318000;
        uStack_5148 = 0x3f318000;
        uStack_5144 = 0x3f318000;
        local_3de0 = local_7300;
        uStack_3dd8 = uStack_72f8;
        uStack_3dd0 = uStack_72f0;
        uStack_3dc8 = uStack_72e8;
        local_3e00 = 0x3f3180003f318000;
        uStack_3df8 = 0x3f3180003f318000;
        uStack_3df0 = 0x3f3180003f318000;
        uStack_3de8 = 0x3f3180003f318000;
        local_3e20 = local_7280;
        uStack_3e18 = uStack_7278;
        uStack_3e10 = uStack_7270;
        uStack_3e08 = uStack_7268;
        auVar71._8_8_ = 0x3f3180003f318000;
        auVar71._0_8_ = 0x3f3180003f318000;
        auVar71._16_8_ = 0x3f3180003f318000;
        auVar71._24_8_ = 0x3f3180003f318000;
        _local_7280 = vfmadd213ps_avx512vl(auVar71,_local_7300,auVar270);
        local_5da0 = local_7280;
        uStack_5d98 = uStack_7278;
        uStack_5d90 = uStack_7270;
        uStack_5d88 = uStack_7268;
        local_5dc0 = local_72e0._0_8_;
        uStack_5db8 = local_72e0._8_8_;
        uStack_5db0 = local_72e0._16_8_;
        uStack_5da8 = local_72e0._24_8_;
        auVar270 = vmovdqa64_avx512vl(local_72e0);
        local_7380 = vpord_avx512vl(_local_7280,auVar270);
        local_75c0 = local_7380._0_8_;
        uStack_75b8 = local_7380._8_8_;
        uStack_75b0 = local_7380._16_8_;
        uStack_75a8 = local_7380._24_8_;
        local_6c14 = 0x3f800000;
        local_27e0 = 0x3f800000;
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auStack_2800 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auStack_27f0 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        local_75e0 = auStack_2800._0_8_;
        uStack_75d8 = auStack_2800._8_8_;
        uStack_75d0 = auStack_27f0._0_8_;
        uStack_75c8 = auStack_27f0._8_8_;
        local_6c18 = 0x40000000;
        local_2790 = 0x40000000;
        auVar265 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x40000000),0x20);
        auStack_27c0 = vinsertps_avx512f(auVar265,ZEXT416(0x40000000),0x30);
        auVar265 = vinsertps_avx512f(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x40000000),0x20);
        auStack_27b0 = vinsertps_avx512f(auVar265,ZEXT416(0x40000000),0x30);
        local_7600 = auStack_27c0._0_8_;
        uStack_75f8 = auStack_27c0._8_8_;
        uStack_75f0 = auStack_27b0._0_8_;
        uStack_75e8 = auStack_27b0._8_8_;
        local_7580 = local_7380._0_8_;
        uStack_7578 = local_7380._8_8_;
        uStack_7570 = local_7380._16_8_;
        uStack_7568 = local_7380._24_8_;
        local_75a0 = auStack_27c0._0_8_;
        uStack_7598 = auStack_27c0._8_8_;
        uStack_7590 = auStack_27b0._0_8_;
        uStack_7588 = auStack_27b0._8_8_;
        auVar267._16_8_ = auStack_27b0._0_8_;
        auVar267._0_16_ = auStack_27c0;
        auVar267._24_8_ = auStack_27b0._8_8_;
        local_6b20 = vmulps_avx512vl(local_7380,auVar267);
        local_68e4 = 0x3f800000;
        local_2920 = 0x3f800000;
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auStack_2940 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        auVar265 = vinsertps_avx512f(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar265 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x20);
        auStack_2930 = vinsertps_avx512f(auVar265,ZEXT416(0x3f800000),0x30);
        local_6b40._0_4_ = auStack_2940._0_4_;
        local_6ae0 = (float)local_6b40;
        local_6b40._4_4_ = auStack_2940._4_4_;
        fStack_6adc = local_6b40._4_4_;
        uStack_6b38._0_4_ = auStack_2940._8_4_;
        fStack_6ad8 = (float)uStack_6b38;
        uStack_6b38._4_4_ = auStack_2940._12_4_;
        fStack_6ad4 = uStack_6b38._4_4_;
        uStack_6b30._0_4_ = auStack_2930._0_4_;
        fStack_6ad0 = (float)uStack_6b30;
        uStack_6b30._4_4_ = auStack_2930._4_4_;
        fStack_6acc = uStack_6b30._4_4_;
        uStack_6b28._0_4_ = auStack_2930._8_4_;
        fStack_6ac8 = (float)uStack_6b28;
        uStack_6b28._4_4_ = auStack_2930._12_4_;
        fStack_6ac4 = uStack_6b28._4_4_;
        local_6320 = 0;
        uStack_6318 = 0;
        uStack_6310 = 0;
        uStack_6308 = 0;
        local_6520 = 0;
        uStack_6518 = 0;
        uStack_6510 = 0;
        uStack_6508 = 0;
        local_6540 = local_6b20._0_8_;
        uStack_6538 = local_6b20._8_8_;
        uStack_6530 = local_6b20._16_8_;
        uStack_6528 = local_6b20._24_8_;
        auVar270 = vsubps_avx512vl(ZEXT1632(ZEXT816(0)),local_6b20);
        in_ZMM16 = ZEXT3264(auVar270);
        local_6340 = 0;
        uStack_6338 = 0;
        uStack_6330 = 0;
        uStack_6328 = 0;
        local_6a60 = 0x3f800000;
        uStack_6a5c = 0x3f800000;
        uStack_6a58 = 0x3f800000;
        uStack_6a54 = 0x3f800000;
        uStack_6a50 = 0x3f800000;
        uStack_6a4c = 0x3f800000;
        uStack_6a48 = 0x3f800000;
        uStack_6a44 = 0x3f800000;
        local_69e0._0_8_ = auVar270._0_8_;
        local_2f20 = local_69e0._0_8_;
        local_69e0._8_8_ = auVar270._8_8_;
        uStack_2f18 = local_69e0._8_8_;
        local_69e0._16_8_ = auVar270._16_8_;
        uStack_2f10 = local_69e0._16_8_;
        local_69e0._24_8_ = auVar270._24_8_;
        uStack_2f08 = local_69e0._24_8_;
        local_2f40 = 0x42b0c0a5;
        uStack_2f3c = 0x42b0c0a5;
        uStack_2f38 = 0x42b0c0a5;
        uStack_2f34 = 0x42b0c0a5;
        uStack_2f30 = 0x42b0c0a5;
        uStack_2f2c = 0x42b0c0a5;
        uStack_2f28 = 0x42b0c0a5;
        uStack_2f24 = 0x42b0c0a5;
        auVar115._8_4_ = 0x42b0c0a5;
        auVar115._0_8_ = 0x42b0c0a542b0c0a5;
        auVar115._12_4_ = 0x42b0c0a5;
        auVar115._16_4_ = 0x42b0c0a5;
        auVar115._20_4_ = 0x42b0c0a5;
        auVar115._24_4_ = 0x42b0c0a5;
        auVar115._28_4_ = 0x42b0c0a5;
        auVar270 = vminps_avx(auVar270,auVar115);
        local_69e0._0_8_ = auVar270._0_8_;
        local_6220 = local_69e0._0_8_;
        local_69e0._8_8_ = auVar270._8_8_;
        uStack_6218 = local_69e0._8_8_;
        local_69e0._16_8_ = auVar270._16_8_;
        uStack_6210 = local_69e0._16_8_;
        local_69e0._24_8_ = auVar270._24_8_;
        uStack_6208 = local_69e0._24_8_;
        local_6240 = 0xc2b0c0a5;
        uStack_623c = 0xc2b0c0a5;
        uStack_6238 = 0xc2b0c0a5;
        uStack_6234 = 0xc2b0c0a5;
        uStack_6230 = 0xc2b0c0a5;
        uStack_622c = 0xc2b0c0a5;
        uStack_6228 = 0xc2b0c0a5;
        uStack_6224 = 0xc2b0c0a5;
        auVar31._8_4_ = 0xc2b0c0a5;
        auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar31._12_4_ = 0xc2b0c0a5;
        auVar31._16_4_ = 0xc2b0c0a5;
        auVar31._20_4_ = 0xc2b0c0a5;
        auVar31._24_4_ = 0xc2b0c0a5;
        auVar31._28_4_ = 0xc2b0c0a5;
        auVar266 = vmaxps_avx(auVar270,auVar31);
        local_69e0._0_8_ = auVar266._0_8_;
        local_56e0 = local_69e0._0_8_;
        local_69e0._8_8_ = auVar266._8_8_;
        uStack_56d8 = local_69e0._8_8_;
        local_69e0._16_8_ = auVar266._16_8_;
        uStack_56d0 = local_69e0._16_8_;
        local_69e0._24_8_ = auVar266._24_8_;
        uStack_56c8 = local_69e0._24_8_;
        local_5700 = 0x3fb8aa3b;
        uStack_56fc = 0x3fb8aa3b;
        uStack_56f8 = 0x3fb8aa3b;
        uStack_56f4 = 0x3fb8aa3b;
        uStack_56f0 = 0x3fb8aa3b;
        uStack_56ec = 0x3fb8aa3b;
        uStack_56e8 = 0x3fb8aa3b;
        uStack_56e4 = 0x3fb8aa3b;
        local_5720 = 0x3f000000;
        uStack_571c = 0x3f000000;
        uStack_5718 = 0x3f000000;
        uStack_5714 = 0x3f000000;
        uStack_5710 = 0x3f000000;
        uStack_570c = 0x3f000000;
        uStack_5708 = 0x3f000000;
        uStack_5704 = 0x3f000000;
        local_3840 = local_69e0._0_8_;
        uStack_3838 = local_69e0._8_8_;
        uStack_3830 = local_69e0._16_8_;
        uStack_3828 = local_69e0._24_8_;
        local_3860 = 0x3fb8aa3b3fb8aa3b;
        uStack_3858 = 0x3fb8aa3b3fb8aa3b;
        uStack_3850 = 0x3fb8aa3b3fb8aa3b;
        uStack_3848 = 0x3fb8aa3b3fb8aa3b;
        local_3880 = 0x3f0000003f000000;
        uStack_3878 = 0x3f0000003f000000;
        uStack_3870 = 0x3f0000003f000000;
        uStack_3868 = 0x3f0000003f000000;
        auVar89._8_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar89._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar89._16_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar89._24_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar88._8_8_ = 0x3f0000003f000000;
        auVar88._0_8_ = 0x3f0000003f000000;
        auVar88._16_8_ = 0x3f0000003f000000;
        auVar88._24_8_ = 0x3f0000003f000000;
        auVar265 = vfmadd213ps_fma(auVar89,auVar266,auVar88);
        auVar267 = vroundps_avx(ZEXT1632(auVar265),1);
        auVar270 = vcmpps_avx(ZEXT1632(auVar265),auVar267,1);
        local_6a80._0_8_ = auVar270._0_8_;
        local_5fe0 = local_6a80._0_8_;
        local_6a80._8_8_ = auVar270._8_8_;
        uStack_5fd8 = local_6a80._8_8_;
        local_6a80._16_8_ = auVar270._16_8_;
        uStack_5fd0 = local_6a80._16_8_;
        local_6a80._24_8_ = auVar270._24_8_;
        uStack_5fc8 = local_6a80._24_8_;
        local_6000 = 0x3f8000003f800000;
        uStack_5ff8 = 0x3f8000003f800000;
        uStack_5ff0 = 0x3f8000003f800000;
        uStack_5fe8 = 0x3f8000003f800000;
        auVar39._8_8_ = 0x3f8000003f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._16_8_ = 0x3f8000003f800000;
        auVar39._24_8_ = 0x3f8000003f800000;
        local_6a80 = vpand_avx2(auVar270,auVar39);
        local_6a00 = auVar267._0_8_;
        local_6560 = local_6a00;
        uStack_69f8 = auVar267._8_8_;
        uStack_6558 = uStack_69f8;
        uStack_69f0 = auVar267._16_8_;
        uStack_6550 = uStack_69f0;
        uStack_69e8 = auVar267._24_8_;
        uStack_6548 = uStack_69e8;
        local_6580 = local_6a80._0_8_;
        uStack_6578 = local_6a80._8_8_;
        uStack_6570 = local_6a80._16_8_;
        uStack_6568 = local_6a80._24_8_;
        local_6a20 = vsubps_avx(auVar267,local_6a80);
        local_48a0 = local_6a20._0_8_;
        uStack_4898 = local_6a20._8_8_;
        uStack_4890 = local_6a20._16_8_;
        uStack_4888 = local_6a20._24_8_;
        local_48e0 = local_69e0._0_8_;
        uStack_48d8 = local_69e0._8_8_;
        uStack_48d0 = local_69e0._16_8_;
        uStack_48c8 = local_69e0._24_8_;
        local_48c0 = 0x3f318000;
        uStack_48bc = 0x3f318000;
        uStack_48b8 = 0x3f318000;
        uStack_48b4 = 0x3f318000;
        uStack_48b0 = 0x3f318000;
        uStack_48ac = 0x3f318000;
        uStack_48a8 = 0x3f318000;
        uStack_48a4 = 0x3f318000;
        local_30c0 = local_6a20._0_8_;
        uStack_30b8 = local_6a20._8_8_;
        uStack_30b0 = local_6a20._16_8_;
        uStack_30a8 = local_6a20._24_8_;
        local_30e0 = 0x3f3180003f318000;
        uStack_30d8 = 0x3f3180003f318000;
        uStack_30d0 = 0x3f3180003f318000;
        uStack_30c8 = 0x3f3180003f318000;
        local_3100 = local_69e0._0_8_;
        uStack_30f8 = local_69e0._8_8_;
        uStack_30f0 = local_69e0._16_8_;
        uStack_30e8 = local_69e0._24_8_;
        auVar110._8_8_ = 0x3f3180003f318000;
        auVar110._0_8_ = 0x3f3180003f318000;
        auVar110._16_8_ = 0x3f3180003f318000;
        auVar110._24_8_ = 0x3f3180003f318000;
        auVar265 = vfnmadd213ps_fma(auVar110,local_6a20,auVar266);
        local_4900 = local_6a20._0_8_;
        uStack_48f8 = local_6a20._8_8_;
        uStack_48f0 = local_6a20._16_8_;
        uStack_48e8 = local_6a20._24_8_;
        local_69e0._0_8_ = auVar265._0_8_;
        local_4940 = local_69e0._0_8_;
        local_69e0._8_8_ = auVar265._8_8_;
        uStack_4938 = local_69e0._8_8_;
        uStack_4930 = 0;
        uStack_4928 = 0;
        local_4920 = 0xb95e8083;
        uStack_491c = 0xb95e8083;
        uStack_4918 = 0xb95e8083;
        uStack_4914 = 0xb95e8083;
        uStack_4910 = 0xb95e8083;
        uStack_490c = 0xb95e8083;
        uStack_4908 = 0xb95e8083;
        uStack_4904 = 0xb95e8083;
        local_3060 = local_6a20._0_8_;
        uStack_3058 = local_6a20._8_8_;
        uStack_3050 = local_6a20._16_8_;
        uStack_3048 = local_6a20._24_8_;
        local_3080 = 0xb95e8083b95e8083;
        uStack_3078 = 0xb95e8083b95e8083;
        uStack_3070 = 0xb95e8083b95e8083;
        uStack_3068 = 0xb95e8083b95e8083;
        local_30a0 = local_69e0._0_8_;
        uStack_3098 = local_69e0._8_8_;
        uStack_3090 = 0;
        uStack_3088 = 0;
        auVar111._8_8_ = 0xb95e8083b95e8083;
        auVar111._0_8_ = 0xb95e8083b95e8083;
        auVar111._16_8_ = 0xb95e8083b95e8083;
        auVar111._24_8_ = 0xb95e8083b95e8083;
        auVar264 = vfnmadd213ps_fma(auVar111,local_6a20,ZEXT1632(auVar265));
        local_69e0._0_8_ = auVar264._0_8_;
        local_6980 = local_69e0._0_8_;
        local_69e0._8_8_ = auVar264._8_8_;
        uStack_6978 = local_69e0._8_8_;
        uStack_6970 = 0;
        uStack_6968 = 0;
        local_6960._0_4_ = auVar264._0_4_;
        local_6960._4_4_ = auVar264._4_4_;
        uStack_6958._0_4_ = auVar264._8_4_;
        uStack_6958._4_4_ = auVar264._12_4_;
        local_6a00._4_4_ = local_6960._4_4_ * local_6960._4_4_;
        local_6a00._0_4_ = (float)local_6960 * (float)local_6960;
        local_5940 = local_6a00;
        uStack_69f8._0_4_ = (float)uStack_6958 * (float)uStack_6958;
        uStack_69f8._4_4_ = uStack_6958._4_4_ * uStack_6958._4_4_;
        auVar1 = _local_6a00;
        _local_6a00 = ZEXT1632(_local_6a00);
        auVar26 = _local_6a00;
        uStack_6a98._0_4_ = 0x39506967;
        local_6aa0 = (undefined1  [8])0x3950696739506967;
        uStack_6a98._4_4_ = 0x39506967;
        uStack_6a90._0_4_ = 0x39506967;
        uStack_6a90._4_4_ = 0x39506967;
        auVar260 = _local_6aa0;
        uStack_6a88._0_4_ = 0x39506967;
        uStack_6a88._4_4_ = 0x39506967;
        auVar270 = _local_6aa0;
        local_5740 = 0x3950696739506967;
        uStack_5738 = uStack_6a98;
        uStack_6a90 = auVar260._16_8_;
        uStack_5730 = uStack_6a90;
        uStack_6a88 = auVar270._24_8_;
        uStack_5728 = uStack_6a88;
        local_5760 = local_69e0._0_8_;
        uStack_5758 = local_69e0._8_8_;
        uStack_5750 = 0;
        uStack_5748 = 0;
        local_5780 = 0x3ab743ce;
        uStack_577c = 0x3ab743ce;
        uStack_5778 = 0x3ab743ce;
        uStack_5774 = 0x3ab743ce;
        uStack_5770 = 0x3ab743ce;
        uStack_576c = 0x3ab743ce;
        uStack_5768 = 0x3ab743ce;
        uStack_5764 = 0x3ab743ce;
        local_37e0 = 0x3950696739506967;
        uStack_37d8 = uStack_6a98;
        uStack_37d0 = uStack_6a90;
        uStack_37c8 = uStack_6a88;
        local_3800 = local_69e0._0_8_;
        uStack_37f8 = local_69e0._8_8_;
        uStack_37f0 = 0;
        uStack_37e8 = 0;
        local_3820 = 0x3ab743ce3ab743ce;
        uStack_3818 = 0x3ab743ce3ab743ce;
        uStack_3810 = 0x3ab743ce3ab743ce;
        uStack_3808 = 0x3ab743ce3ab743ce;
        auVar91._16_8_ = uStack_6a90;
        auVar91._0_16_ = _local_6aa0;
        auVar91._24_8_ = uStack_6a88;
        auVar90._8_8_ = 0x3ab743ce3ab743ce;
        auVar90._0_8_ = 0x3ab743ce3ab743ce;
        auVar90._16_8_ = 0x3ab743ce3ab743ce;
        auVar90._24_8_ = 0x3ab743ce3ab743ce;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar264),auVar91,auVar90);
        local_6aa0 = auVar265._0_8_;
        local_57a0 = local_6aa0;
        uStack_6a98 = auVar265._8_8_;
        uStack_5798 = uStack_6a98;
        uStack_5790 = 0;
        uStack_5788 = 0;
        local_57c0 = local_69e0._0_8_;
        uStack_57b8 = local_69e0._8_8_;
        uStack_57b0 = 0;
        uStack_57a8 = 0;
        local_57e0 = 0x3c088908;
        uStack_57dc = 0x3c088908;
        uStack_57d8 = 0x3c088908;
        uStack_57d4 = 0x3c088908;
        uStack_57d0 = 0x3c088908;
        uStack_57cc = 0x3c088908;
        uStack_57c8 = 0x3c088908;
        uStack_57c4 = 0x3c088908;
        local_3780 = local_6aa0;
        uStack_3778 = uStack_6a98;
        uStack_3770 = 0;
        uStack_3768 = 0;
        local_37a0 = local_69e0._0_8_;
        uStack_3798 = local_69e0._8_8_;
        uStack_3790 = 0;
        uStack_3788 = 0;
        local_37c0 = 0x3c0889083c088908;
        uStack_37b8 = 0x3c0889083c088908;
        uStack_37b0 = 0x3c0889083c088908;
        uStack_37a8 = 0x3c0889083c088908;
        auVar92._8_8_ = 0x3c0889083c088908;
        auVar92._0_8_ = 0x3c0889083c088908;
        auVar92._16_8_ = 0x3c0889083c088908;
        auVar92._24_8_ = 0x3c0889083c088908;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar264),ZEXT1632(auVar265),auVar92);
        local_6aa0 = auVar265._0_8_;
        local_5800 = local_6aa0;
        uStack_6a98 = auVar265._8_8_;
        uStack_57f8 = uStack_6a98;
        uStack_57f0 = 0;
        uStack_57e8 = 0;
        local_5820 = local_69e0._0_8_;
        uStack_5818 = local_69e0._8_8_;
        uStack_5810 = 0;
        uStack_5808 = 0;
        local_5840 = 0x3d2aa9c1;
        uStack_583c = 0x3d2aa9c1;
        uStack_5838 = 0x3d2aa9c1;
        uStack_5834 = 0x3d2aa9c1;
        uStack_5830 = 0x3d2aa9c1;
        uStack_582c = 0x3d2aa9c1;
        uStack_5828 = 0x3d2aa9c1;
        uStack_5824 = 0x3d2aa9c1;
        local_3720 = local_6aa0;
        uStack_3718 = uStack_6a98;
        uStack_3710 = 0;
        uStack_3708 = 0;
        local_3740 = local_69e0._0_8_;
        uStack_3738 = local_69e0._8_8_;
        uStack_3730 = 0;
        uStack_3728 = 0;
        local_3760 = 0x3d2aa9c13d2aa9c1;
        uStack_3758 = 0x3d2aa9c13d2aa9c1;
        uStack_3750 = 0x3d2aa9c13d2aa9c1;
        uStack_3748 = 0x3d2aa9c13d2aa9c1;
        auVar93._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar93._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar93._16_8_ = 0x3d2aa9c13d2aa9c1;
        auVar93._24_8_ = 0x3d2aa9c13d2aa9c1;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar264),ZEXT1632(auVar265),auVar93);
        local_6aa0 = auVar265._0_8_;
        local_5860 = local_6aa0;
        uStack_6a98 = auVar265._8_8_;
        uStack_5858 = uStack_6a98;
        uStack_5850 = 0;
        uStack_5848 = 0;
        local_5880 = local_69e0._0_8_;
        uStack_5878 = local_69e0._8_8_;
        uStack_5870 = 0;
        uStack_5868 = 0;
        local_58a0 = 0x3e2aaaaa;
        uStack_589c = 0x3e2aaaaa;
        uStack_5898 = 0x3e2aaaaa;
        uStack_5894 = 0x3e2aaaaa;
        uStack_5890 = 0x3e2aaaaa;
        uStack_588c = 0x3e2aaaaa;
        uStack_5888 = 0x3e2aaaaa;
        uStack_5884 = 0x3e2aaaaa;
        local_36c0 = local_6aa0;
        uStack_36b8 = uStack_6a98;
        uStack_36b0 = 0;
        uStack_36a8 = 0;
        local_36e0 = local_69e0._0_8_;
        uStack_36d8 = local_69e0._8_8_;
        uStack_36d0 = 0;
        uStack_36c8 = 0;
        local_3700 = 0x3e2aaaaa3e2aaaaa;
        uStack_36f8 = 0x3e2aaaaa3e2aaaaa;
        uStack_36f0 = 0x3e2aaaaa3e2aaaaa;
        uStack_36e8 = 0x3e2aaaaa3e2aaaaa;
        auVar94._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar94._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar94._16_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar94._24_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar264),ZEXT1632(auVar265),auVar94);
        local_6aa0 = auVar265._0_8_;
        local_58c0 = local_6aa0;
        uStack_6a98 = auVar265._8_8_;
        uStack_58b8 = uStack_6a98;
        uStack_58b0 = 0;
        uStack_58a8 = 0;
        local_58e0 = local_69e0._0_8_;
        uStack_58d8 = local_69e0._8_8_;
        uStack_58d0 = 0;
        uStack_58c8 = 0;
        local_5900 = 0x3f000000;
        uStack_58fc = 0x3f000000;
        uStack_58f8 = 0x3f000000;
        uStack_58f4 = 0x3f000000;
        uStack_58f0 = 0x3f000000;
        uStack_58ec = 0x3f000000;
        uStack_58e8 = 0x3f000000;
        uStack_58e4 = 0x3f000000;
        local_3660 = local_6aa0;
        uStack_3658 = uStack_6a98;
        uStack_3650 = 0;
        uStack_3648 = 0;
        local_3680 = local_69e0._0_8_;
        uStack_3678 = local_69e0._8_8_;
        uStack_3670 = 0;
        uStack_3668 = 0;
        local_36a0 = 0x3f0000003f000000;
        uStack_3698 = 0x3f0000003f000000;
        uStack_3690 = 0x3f0000003f000000;
        uStack_3688 = 0x3f0000003f000000;
        auVar95._8_8_ = 0x3f0000003f000000;
        auVar95._0_8_ = 0x3f0000003f000000;
        auVar95._16_8_ = 0x3f0000003f000000;
        auVar95._24_8_ = 0x3f0000003f000000;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar264),ZEXT1632(auVar265),auVar95);
        local_6aa0 = auVar265._0_8_;
        local_5920 = local_6aa0;
        uStack_6a98 = auVar265._8_8_;
        uStack_5918 = uStack_6a98;
        uStack_5910 = 0;
        uStack_5908 = 0;
        uStack_69f8 = auVar1._8_8_;
        uStack_5938 = uStack_69f8;
        uStack_5930 = 0;
        uStack_5928 = 0;
        local_5960 = local_69e0._0_8_;
        uStack_5958 = local_69e0._8_8_;
        uStack_5950 = 0;
        uStack_5948 = 0;
        local_3600 = local_6aa0;
        uStack_35f8 = uStack_6a98;
        uStack_35f0 = 0;
        uStack_35e8 = 0;
        local_3620 = local_5940;
        uStack_3618 = uStack_69f8;
        uStack_3610 = 0;
        uStack_3608 = 0;
        local_3640 = local_69e0._0_8_;
        uStack_3638 = local_69e0._8_8_;
        uStack_3630 = 0;
        uStack_3628 = 0;
        auVar265 = vfmadd213ps_fma(ZEXT1632(auVar1),ZEXT1632(auVar265),ZEXT1632(auVar264));
        local_6aa0 = auVar265._0_8_;
        uVar11 = local_6aa0;
        uStack_6a98 = auVar265._8_8_;
        uVar12 = uStack_6a98;
        uStack_6910 = 0;
        uStack_6908 = 0;
        local_6940 = 0x3f8000003f800000;
        uStack_6938 = 0x3f8000003f800000;
        uStack_6930 = 0x3f8000003f800000;
        uStack_6928 = 0x3f8000003f800000;
        local_6920._0_4_ = auVar265._0_4_;
        local_6920._4_4_ = auVar265._4_4_;
        uStack_6918._0_4_ = auVar265._8_4_;
        uStack_6918._4_4_ = auVar265._12_4_;
        local_6aa0._4_4_ = local_6920._4_4_ + 1.0;
        local_6aa0._0_4_ = (float)local_6920 + 1.0;
        uStack_6a98._0_4_ = (float)uStack_6918 + 1.0;
        uStack_6a98._4_4_ = uStack_6918._4_4_ + 1.0;
        uStack_6a90._0_4_ = 0x3f800000;
        uStack_6a90._4_4_ = 0x3f800000;
        auVar260 = _local_6aa0;
        uStack_6a88._0_4_ = 0x3f800000;
        uStack_6a88._4_4_ = 0x3f800000;
        auVar266 = _local_6aa0;
        local_2e60._0_4_ = local_6a20._0_4_;
        local_2e60._4_4_ = local_6a20._4_4_;
        uStack_2e58._0_4_ = local_6a20._8_4_;
        uStack_2e58._4_4_ = local_6a20._12_4_;
        uStack_2e50._0_4_ = local_6a20._16_4_;
        uStack_2e50._4_4_ = local_6a20._20_4_;
        uStack_2e48._0_4_ = local_6a20._24_4_;
        uStack_2e48._4_4_ = local_6a20._28_4_;
        local_6a40._4_4_ = (int)local_2e60._4_4_;
        local_6a40._0_4_ = (int)(float)local_2e60;
        local_6a40._8_4_ = (int)(float)uStack_2e58;
        local_6a40._12_4_ = (int)uStack_2e58._4_4_;
        local_6a40._16_4_ = (int)(float)uStack_2e50;
        local_6a40._20_4_ = (int)uStack_2e50._4_4_;
        auVar261 = local_6a40._0_24_;
        local_6a40._24_4_ = (int)(float)uStack_2e48;
        local_6a40._28_4_ = (int)uStack_2e48._4_4_;
        auVar270 = local_6a40;
        local_2da0 = local_6a40._0_8_;
        uStack_2d98 = local_6a40._8_8_;
        local_6a40._16_8_ = auVar261._16_8_;
        uStack_2d90 = local_6a40._16_8_;
        local_6a40._24_8_ = auVar270._24_8_;
        uStack_2d88 = local_6a40._24_8_;
        local_2ae0 = local_6a40._0_8_;
        uStack_2ad8 = local_6a40._8_8_;
        uStack_2ad0 = local_6a40._16_8_;
        uStack_2ac8 = local_6a40._24_8_;
        local_2b00 = 0x7f0000007f;
        uStack_2af8 = 0x7f0000007f;
        uStack_2af0 = 0x7f0000007f;
        uStack_2ae8 = 0x7f0000007f;
        auVar123._16_8_ = local_6a40._16_8_;
        auVar123._0_16_ = local_6a40._0_16_;
        auVar123._24_8_ = local_6a40._24_8_;
        auVar122._8_8_ = 0x7f0000007f;
        auVar122._0_8_ = 0x7f0000007f;
        auVar122._16_8_ = 0x7f0000007f;
        auVar122._24_8_ = 0x7f0000007f;
        auVar270 = vpaddd_avx2(auVar123,auVar122);
        local_6a40._0_8_ = auVar270._0_8_;
        local_2ca0 = local_6a40._0_8_;
        local_6a40._8_8_ = auVar270._8_8_;
        uStack_2c98 = local_6a40._8_8_;
        local_6a40._16_8_ = auVar270._16_8_;
        uStack_2c90 = local_6a40._16_8_;
        local_6a40._24_8_ = auVar270._24_8_;
        uStack_2c88 = local_6a40._24_8_;
        local_2ca4 = 0x17;
        local_29e0 = local_6a40._0_8_;
        uStack_29d8 = local_6a40._8_8_;
        uStack_29d0 = local_6a40._16_8_;
        uStack_29c8 = local_6a40._24_8_;
        local_29e4 = 0x17;
        local_6a40 = vpslld_avx2(auVar270,ZEXT416(0x17));
        local_2be0 = local_6a40._0_8_;
        uStack_2bd8 = local_6a40._8_8_;
        uStack_2bd0 = local_6a40._16_8_;
        uStack_2bc8 = local_6a40._24_8_;
        local_6ac0 = local_6a40._0_8_;
        uStack_6ab8 = local_6a40._8_8_;
        uStack_6ab0 = local_6a40._16_8_;
        uStack_6aa8 = local_6a40._24_8_;
        local_69a0 = local_6aa0;
        uStack_6998 = uStack_6a98;
        uStack_6a90 = auVar260._16_8_;
        uStack_6990 = uStack_6a90;
        uStack_6a88 = auVar266._24_8_;
        uStack_6988 = uStack_6a88;
        local_69c0._0_4_ = local_6a40._0_4_;
        local_69c0._4_4_ = local_6a40._4_4_;
        uStack_69b8._0_4_ = local_6a40._8_4_;
        uStack_69b8._4_4_ = local_6a40._12_4_;
        uStack_69b0._0_4_ = local_6a40._16_4_;
        uStack_69b0._4_4_ = local_6a40._20_4_;
        uStack_69a8._0_4_ = local_6a40._24_4_;
        local_6aa0._0_4_ = ((float)local_6920 + 1.0) * (float)local_69c0;
        local_6aa0._4_4_ = (local_6920._4_4_ + 1.0) * local_69c0._4_4_;
        uStack_69b8._0_4_ = ((float)uStack_6918 + 1.0) * (float)uStack_69b8;
        uStack_69b8._4_4_ = (uStack_6918._4_4_ + 1.0) * uStack_69b8._4_4_;
        uStack_6a98._0_4_ = (float)uStack_69b8;
        uStack_6a98._4_4_ = uStack_69b8._4_4_;
        uStack_6a90._0_4_ = (float)uStack_69b0 * 1.0;
        uStack_6a90._4_4_ = uStack_69b0._4_4_ * 1.0;
        auVar260 = _local_6aa0;
        uStack_6a88._0_4_ = (float)uStack_69a8 * 1.0;
        uStack_6a88._4_4_ = 0x3f800000;
        auVar267 = _local_6aa0;
        local_6b00 = local_6aa0;
        uStack_6af8 = uStack_6a98;
        uStack_6a90 = auVar260._16_8_;
        uStack_6af0 = uStack_6a90;
        uStack_6a88 = auVar267._24_8_;
        uStack_6ae8 = uStack_6a88;
        local_6640 = (float)local_6b40 + (float)local_6aa0._0_4_;
        fStack_663c = local_6b40._4_4_ + (float)local_6aa0._4_4_;
        fStack_6638 = (float)uStack_6b38 + (float)uStack_69b8;
        fStack_6634 = uStack_6b38._4_4_ + uStack_69b8._4_4_;
        fStack_6630 = (float)uStack_6b30 + (float)uStack_69b0 * 1.0;
        fStack_662c = uStack_6b30._4_4_ + uStack_69b0._4_4_ * 1.0;
        fStack_6628 = (float)uStack_6b28 + (float)uStack_69a8 * 1.0;
        fStack_6624 = uStack_6b28._4_4_ + 1.0;
        auVar25._16_4_ = (float)uStack_6b30;
        auVar25._0_16_ = auStack_2940;
        auVar25._20_4_ = uStack_6b30._4_4_;
        auVar25._24_4_ = (float)uStack_6b28;
        auVar25._28_4_ = uStack_6b28._4_4_;
        auVar24._4_4_ = fStack_663c;
        auVar24._0_4_ = local_6640;
        auVar24._8_4_ = fStack_6638;
        auVar24._12_4_ = fStack_6634;
        auVar24._16_4_ = fStack_6630;
        auVar24._20_4_ = fStack_662c;
        auVar24._24_4_ = fStack_6628;
        auVar24._28_4_ = fStack_6624;
        auVar270 = vrcpps_avx(auVar24);
        auVar266._4_4_ = local_6b40._4_4_ * auVar270._4_4_;
        auVar266._0_4_ = (float)local_6b40 * auVar270._0_4_;
        auVar266._8_4_ = (float)uStack_6b38 * auVar270._8_4_;
        auVar266._12_4_ = uStack_6b38._4_4_ * auVar270._12_4_;
        auVar266._16_4_ = (float)uStack_6b30 * auVar270._16_4_;
        auVar266._20_4_ = uStack_6b30._4_4_ * auVar270._20_4_;
        auVar266._24_4_ = (float)uStack_6b28 * auVar270._24_4_;
        auVar266._28_4_ = uStack_6b28._4_4_;
        auVar265 = vfmsub213ps_fma(auVar266,auVar24,auVar25);
        auVar265 = vfnmadd213ps_fma(ZEXT1632(auVar265),auVar270,auVar266);
        local_6be0 = auStack_27c0._0_8_;
        uStack_6bd8 = auStack_27c0._8_8_;
        uStack_6bd0 = auStack_27b0._0_8_;
        uStack_6bc8 = auStack_27b0._8_8_;
        local_6c00 = auStack_2800._0_8_;
        uStack_6bf8 = auStack_2800._8_8_;
        uStack_6bf0 = auStack_27f0._0_8_;
        uStack_6be8 = auStack_27f0._8_8_;
        local_6bc0 = ZEXT1632(auVar265);
        auVar269._16_8_ = auStack_27b0._0_8_;
        auVar269._0_16_ = auStack_27c0;
        auVar269._24_8_ = auStack_27b0._8_8_;
        auVar268._16_8_ = auStack_27f0._0_8_;
        auVar268._0_16_ = auStack_2800;
        auVar268._24_8_ = auStack_27f0._8_8_;
        auVar280._8_4_ = 0x80000000;
        auVar280._0_8_ = 0x8000000080000000;
        auVar280._12_4_ = 0x80000000;
        auVar280._16_4_ = 0x80000000;
        auVar280._20_4_ = 0x80000000;
        auVar280._24_4_ = 0x80000000;
        auVar280._28_4_ = 0x80000000;
        auVar265 = vfmadd213ps_fma(auVar269,local_6bc0,auVar268 ^ auVar280);
        local_76c0._0_4_ = auVar259._0_4_;
        local_76c0._4_4_ = auVar259._4_4_;
        fStack_76b8 = auVar259._8_4_;
        fStack_76b4 = auVar259._12_4_;
        fStack_76b0 = auVar259._16_4_;
        fStack_76ac = auVar259._20_4_;
        fStack_76a8 = (float)uStack_7a08;
        uStack_76a4 = (undefined4)((ulong)uStack_7a08 >> 0x20);
        local_76e0._0_4_ = auVar265._0_4_;
        local_76e0._4_4_ = auVar265._4_4_;
        fStack_76d8 = auVar265._8_4_;
        fStack_76d4 = auVar265._12_4_;
        local_7d00 = CONCAT44((float)local_76c0._4_4_ * (float)local_76e0._4_4_,
                              (float)local_76c0._0_4_ * (float)local_76e0._0_4_);
        uStack_7cf8 = CONCAT44(fStack_76b4 * fStack_76d4,fStack_76b8 * fStack_76d8);
        uStack_7cf0 = CONCAT44(fStack_76ac * 0.0,fStack_76b0 * 0.0);
        uStack_7ce8 = CONCAT44(uStack_76a4,fStack_76a8 * 0.0);
        local_79a8 = local_7c80;
        local_79e0 = local_7d00;
        uStack_79d8 = uStack_7cf8;
        uStack_79d0 = uStack_7cf0;
        uStack_79c8 = uStack_7ce8;
        auVar270._8_8_ = uStack_7cf8;
        auVar270._0_8_ = local_7d00;
        auVar270._16_8_ = uStack_7cf0;
        auVar270._24_8_ = uStack_7ce8;
        *local_7c80 = auVar270;
        local_7c80 = local_7c80 + 1;
        _local_76e0 = ZEXT1632(auVar265);
        _local_76c0 = auVar2;
        local_71c0 = local_71e0;
        uStack_71b8 = uStack_71d8;
        uStack_71b0 = uStack_71d0;
        uStack_71a8 = uStack_71c8;
        local_7100 = uVar7;
        uStack_70f8 = uVar8;
        uStack_70f0 = uVar9;
        uStack_70e8 = uVar10;
        local_6fe0 = auStack_2900._0_8_;
        uStack_6fd8 = auStack_2900._8_8_;
        uStack_6fd0 = auStack_28f0._0_8_;
        uStack_6fc8 = auStack_28f0._8_8_;
        _local_6dc0 = auVar32;
        _local_6d20 = auVar40;
        local_6d00 = ZEXT1632(auVar263);
        local_6ce0 = local_6d60._0_8_;
        uStack_6cd8 = local_6d60._8_8_;
        uStack_6cd0 = local_6d60._16_8_;
        uStack_6cc8 = local_6d60._24_8_;
        local_6c80 = local_6ca0;
        uStack_6c78 = uStack_6c98;
        uStack_6c70 = uStack_6c90;
        uStack_6c68 = uStack_6c88;
        local_6c40 = uVar3;
        uStack_6c38 = uVar4;
        uStack_6c30 = uVar5;
        uStack_6c28 = uVar6;
        local_6b40 = auStack_2940._0_8_;
        uStack_6b38 = auStack_2940._8_8_;
        uStack_6b30 = auStack_2930._0_8_;
        uStack_6b28 = auStack_2930._8_8_;
        _local_6aa0 = auVar267;
        _local_6a00 = auVar26;
        local_69e0 = ZEXT1632(auVar264);
        local_69c0 = local_6a40._0_8_;
        uStack_69b8 = local_6a40._8_8_;
        uStack_69b0 = local_6a40._16_8_;
        uStack_69a8 = local_6a40._24_8_;
        local_6960 = local_6980;
        uStack_6958 = uStack_6978;
        uStack_6950 = uStack_6970;
        uStack_6948 = uStack_6968;
        local_6920 = uVar11;
        uStack_6918 = uVar12;
        local_6620 = local_6ae0;
        fStack_661c = fStack_6adc;
        fStack_6618 = fStack_6ad8;
        fStack_6614 = fStack_6ad4;
        fStack_6610 = fStack_6ad0;
        fStack_660c = fStack_6acc;
        fStack_6608 = fStack_6ac8;
        fStack_6604 = fStack_6ac4;
        uStack_2ec8 = uStack_7a08;
        local_2e60 = local_6a20._0_8_;
        uStack_2e58 = local_6a20._8_8_;
        uStack_2e50 = local_6a20._16_8_;
        uStack_2e48 = local_6a20._24_8_;
        local_2e40 = local_6d40._0_8_;
        uStack_2e38 = local_6d40._8_8_;
        uStack_2e30 = local_6d40._16_8_;
        uStack_2e28 = local_6d40._24_8_;
        local_291c = local_2920;
        uStack_2918 = local_2920;
        local_2914 = local_2920;
        uStack_2910 = local_2920;
        local_290c = local_2920;
        uStack_2908 = local_2920;
        local_2904 = local_2920;
        local_28dc = local_28e0;
        uStack_28d8 = local_28e0;
        local_28d4 = local_28e0;
        uStack_28d0 = local_28e0;
        local_28cc = local_28e0;
        uStack_28c8 = local_28e0;
        local_28c4 = local_28e0;
        local_27dc = local_27e0;
        uStack_27d8 = local_27e0;
        local_27d4 = local_27e0;
        uStack_27d0 = local_27e0;
        local_27cc = local_27e0;
        uStack_27c8 = local_27e0;
        local_27c4 = local_27e0;
        local_278c = local_2790;
        uStack_2788 = local_2790;
        local_2784 = local_2790;
        uStack_2780 = local_2790;
        local_277c = local_2790;
        uStack_2778 = local_2790;
        local_2774 = local_2790;
      }
      for (; local_78b8 = local_7ab8, local_7ca8 = local_7788, local_7ccc + 3 < local_7b20;
          local_7ccc = local_7ccc + 4) {
        local_7970 = local_7c80;
        local_7960 = *(undefined8 *)*local_7c80;
        uStack_7958 = *(undefined8 *)(*local_7c80 + 8);
        auVar18 = *(undefined1 (*) [16])*local_7c80;
        local_1b90 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        local_2220 = 0x3f800000;
        uStack_221c = 0x3f800000;
        uStack_2218 = 0x3f800000;
        uStack_2214 = 0x3f800000;
        local_2b0 = 0x42b0c0a5;
        uStack_2ac = 0x42b0c0a5;
        uStack_2a8 = 0x42b0c0a5;
        uStack_2a4 = 0x42b0c0a5;
        auVar245._8_4_ = 0x42b0c0a5;
        auVar245._0_8_ = 0x42b0c0a542b0c0a5;
        auVar245._12_4_ = 0x42b0c0a5;
        auVar265 = vminps_avx(*(undefined1 (*) [16])*local_7c80,auVar245);
        local_21e0._0_8_ = auVar265._0_8_;
        local_1aa0 = local_21e0._0_8_;
        local_21e0._8_8_ = auVar265._8_8_;
        uStack_1a98 = local_21e0._8_8_;
        local_1ab0 = 0xc2b0c0a5;
        uStack_1aac = 0xc2b0c0a5;
        uStack_1aa8 = 0xc2b0c0a5;
        uStack_1aa4 = 0xc2b0c0a5;
        auVar137._8_4_ = 0xc2b0c0a5;
        auVar137._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar137._12_4_ = 0xc2b0c0a5;
        auVar264 = vmaxps_avx(auVar265,auVar137);
        local_21e0._0_8_ = auVar264._0_8_;
        uVar3 = local_21e0._0_8_;
        local_21e0._8_8_ = auVar264._8_8_;
        uVar4 = local_21e0._8_8_;
        local_2190 = 0x3fb8aa3b;
        uStack_218c = 0x3fb8aa3b;
        uStack_2188 = 0x3fb8aa3b;
        uStack_2184 = 0x3fb8aa3b;
        local_2180._0_4_ = auVar264._0_4_;
        local_2180._4_4_ = auVar264._4_4_;
        uStack_2178._0_4_ = auVar264._8_4_;
        uStack_2178._4_4_ = auVar264._12_4_;
        local_2200._4_4_ = local_2180._4_4_ * 1.442695;
        local_2200._0_4_ = (float)local_2180 * 1.442695;
        uStack_21f8._0_4_ = (float)uStack_2178 * 1.442695;
        uStack_21f8._4_4_ = uStack_2178._4_4_ * 1.442695;
        local_2140 = local_2200;
        uStack_2138 = uStack_21f8;
        local_2150 = 0x3f000000;
        uStack_214c = 0x3f000000;
        uStack_2148 = 0x3f000000;
        uStack_2144 = 0x3f000000;
        local_2200._0_4_ = (float)local_2180 * 1.442695 + 0.5;
        local_2200._4_4_ = local_2180._4_4_ * 1.442695 + 0.5;
        fVar271 = (float)uStack_2178 * 1.442695 + 0.5;
        fVar275 = uStack_2178._4_4_ * 1.442695 + 0.5;
        uStack_21f8._0_4_ = fVar271;
        uStack_21f8._4_4_ = fVar275;
        local_220 = local_2200;
        uStack_218 = uStack_21f8;
        local_2210._4_4_ = (int)(float)local_2200._4_4_;
        local_2210._0_4_ = (int)(float)local_2200._0_4_;
        local_2210._8_4_ = (int)fVar271;
        local_2210._12_4_ = (int)fVar275;
        local_17b0 = local_2210._0_8_;
        uStack_17a8 = local_2210._8_8_;
        auVar157._8_8_ = local_2210._8_8_;
        auVar157._0_8_ = local_2210._0_8_;
        auVar263 = vcvtdq2ps_avx(auVar157);
        local_21f0 = auVar263._0_8_;
        local_1a0 = local_21f0;
        uStack_21e8 = auVar263._8_8_;
        uStack_198 = uStack_21e8;
        local_1b0 = local_2200;
        uStack_1a8 = uStack_21f8;
        auVar249._8_8_ = uStack_21f8;
        auVar249._0_8_ = local_2200;
        auVar265 = vcmpps_avx(auVar249,auVar263,1);
        local_2230._0_8_ = auVar265._0_8_;
        local_1980 = local_2230._0_8_;
        local_2230._8_8_ = auVar265._8_8_;
        uStack_1978 = local_2230._8_8_;
        local_1990 = 0x3f8000003f800000;
        uStack_1988 = 0x3f8000003f800000;
        auVar145._8_8_ = 0x3f8000003f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        local_2230 = vpand_avx(auVar265,auVar145);
        local_2060 = local_21f0;
        uStack_2058 = uStack_21e8;
        local_2070 = local_2230._0_8_;
        uStack_2068 = local_2230._8_8_;
        _local_2200 = vsubps_avx(auVar263,local_2230);
        local_de0 = local_2200;
        uStack_dd8 = uStack_21f8;
        local_e00 = local_21e0._0_8_;
        uStack_df8 = local_21e0._8_8_;
        local_df0 = 0x3f318000;
        uStack_dec = 0x3f318000;
        uStack_de8 = 0x3f318000;
        uStack_de4 = 0x3f318000;
        local_3f0 = local_2200;
        uStack_3e8 = uStack_21f8;
        local_400 = 0x3f3180003f318000;
        uStack_3f8 = 0x3f3180003f318000;
        local_410 = local_21e0._0_8_;
        uStack_408 = local_21e0._8_8_;
        auVar237._8_8_ = 0x3f3180003f318000;
        auVar237._0_8_ = 0x3f3180003f318000;
        auVar265 = vfnmadd213ps_fma(auVar237,_local_2200,auVar264);
        local_e10 = local_2200;
        uStack_e08 = uStack_21f8;
        local_21e0._0_8_ = auVar265._0_8_;
        local_e30 = local_21e0._0_8_;
        local_21e0._8_8_ = auVar265._8_8_;
        uStack_e28 = local_21e0._8_8_;
        local_e20 = 0xb95e8083;
        uStack_e1c = 0xb95e8083;
        uStack_e18 = 0xb95e8083;
        uStack_e14 = 0xb95e8083;
        local_3c0 = local_2200;
        uStack_3b8 = uStack_21f8;
        local_3d0 = 0xb95e8083b95e8083;
        uStack_3c8 = 0xb95e8083b95e8083;
        local_3e0 = local_21e0._0_8_;
        uStack_3d8 = local_21e0._8_8_;
        auVar238._8_8_ = 0xb95e8083b95e8083;
        auVar238._0_8_ = 0xb95e8083b95e8083;
        local_21e0 = vfnmadd213ps_fma(auVar238,_local_2200,auVar265);
        local_21b0 = local_21e0._0_8_;
        uStack_21a8 = local_21e0._8_8_;
        local_21a0._0_4_ = local_21e0._0_4_;
        local_21a0._4_4_ = local_21e0._4_4_;
        uStack_2198._0_4_ = local_21e0._8_4_;
        uStack_2198._4_4_ = local_21e0._12_4_;
        local_21f0 = CONCAT44(local_21a0._4_4_ * local_21a0._4_4_,
                              (float)local_21a0 * (float)local_21a0);
        uStack_21e8._0_4_ = (float)uStack_2198 * (float)uStack_2198;
        uStack_21e8._4_4_ = uStack_2198._4_4_ * uStack_2198._4_4_;
        uStack_2238._0_4_ = 0x39506967;
        local_2240 = 0x3950696739506967;
        uStack_2238._4_4_ = 0x39506967;
        local_13e0 = 0x3950696739506967;
        uStack_13d8 = uStack_2238;
        local_13f0 = local_21e0._0_8_;
        uStack_13e8 = local_21e0._8_8_;
        local_1400 = 0x3ab743ce;
        uStack_13fc = 0x3ab743ce;
        uStack_13f8 = 0x3ab743ce;
        uStack_13f4 = 0x3ab743ce;
        local_810 = 0x3950696739506967;
        uStack_808 = uStack_2238;
        local_820 = local_21e0._0_8_;
        uStack_818 = local_21e0._8_8_;
        local_830 = 0x3ab743ce3ab743ce;
        uStack_828 = 0x3ab743ce3ab743ce;
        auVar211._8_8_ = uStack_2238;
        auVar211._0_8_ = 0x3950696739506967;
        auVar210._8_8_ = 0x3ab743ce3ab743ce;
        auVar210._0_8_ = 0x3ab743ce3ab743ce;
        auVar265 = vfmadd213ps_fma(local_21e0,auVar211,auVar210);
        local_2240 = auVar265._0_8_;
        local_1410 = local_2240;
        uStack_2238 = auVar265._8_8_;
        uStack_1408 = uStack_2238;
        local_1420 = local_21e0._0_8_;
        uStack_1418 = local_21e0._8_8_;
        local_1430 = 0x3c088908;
        uStack_142c = 0x3c088908;
        uStack_1428 = 0x3c088908;
        uStack_1424 = 0x3c088908;
        local_7e0 = local_2240;
        uStack_7d8 = uStack_2238;
        local_7f0 = local_21e0._0_8_;
        uStack_7e8 = local_21e0._8_8_;
        local_800 = 0x3c0889083c088908;
        uStack_7f8 = 0x3c0889083c088908;
        auVar212._8_8_ = 0x3c0889083c088908;
        auVar212._0_8_ = 0x3c0889083c088908;
        auVar265 = vfmadd213ps_fma(local_21e0,auVar265,auVar212);
        local_2240 = auVar265._0_8_;
        local_1440 = local_2240;
        uStack_2238 = auVar265._8_8_;
        uStack_1438 = uStack_2238;
        local_1450 = local_21e0._0_8_;
        uStack_1448 = local_21e0._8_8_;
        local_1460 = 0x3d2aa9c1;
        uStack_145c = 0x3d2aa9c1;
        uStack_1458 = 0x3d2aa9c1;
        uStack_1454 = 0x3d2aa9c1;
        local_7b0 = local_2240;
        uStack_7a8 = uStack_2238;
        local_7c0 = local_21e0._0_8_;
        uStack_7b8 = local_21e0._8_8_;
        local_7d0 = 0x3d2aa9c13d2aa9c1;
        uStack_7c8 = 0x3d2aa9c13d2aa9c1;
        auVar213._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar213._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar265 = vfmadd213ps_fma(local_21e0,auVar265,auVar213);
        local_2240 = auVar265._0_8_;
        local_1470 = local_2240;
        uStack_2238 = auVar265._8_8_;
        uStack_1468 = uStack_2238;
        local_1480 = local_21e0._0_8_;
        uStack_1478 = local_21e0._8_8_;
        local_1490 = 0x3e2aaaaa;
        uStack_148c = 0x3e2aaaaa;
        uStack_1488 = 0x3e2aaaaa;
        uStack_1484 = 0x3e2aaaaa;
        local_780 = local_2240;
        uStack_778 = uStack_2238;
        local_790 = local_21e0._0_8_;
        uStack_788 = local_21e0._8_8_;
        local_7a0 = 0x3e2aaaaa3e2aaaaa;
        uStack_798 = 0x3e2aaaaa3e2aaaaa;
        auVar214._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar214._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar265 = vfmadd213ps_fma(local_21e0,auVar265,auVar214);
        local_2240 = auVar265._0_8_;
        local_14a0 = local_2240;
        uStack_2238 = auVar265._8_8_;
        uStack_1498 = uStack_2238;
        local_14b0 = local_21e0._0_8_;
        uStack_14a8 = local_21e0._8_8_;
        local_14c0 = 0x3f000000;
        uStack_14bc = 0x3f000000;
        uStack_14b8 = 0x3f000000;
        uStack_14b4 = 0x3f000000;
        local_750 = local_2240;
        uStack_748 = uStack_2238;
        local_760 = local_21e0._0_8_;
        uStack_758 = local_21e0._8_8_;
        local_770 = 0x3f0000003f000000;
        uStack_768 = 0x3f0000003f000000;
        auVar215._8_8_ = 0x3f0000003f000000;
        auVar215._0_8_ = 0x3f0000003f000000;
        auVar265 = vfmadd213ps_fma(local_21e0,auVar265,auVar215);
        local_2240 = auVar265._0_8_;
        local_14d0 = local_2240;
        uStack_2238 = auVar265._8_8_;
        uStack_14c8 = uStack_2238;
        local_14e0 = local_21f0;
        uStack_14d8 = uStack_21e8;
        local_14f0 = local_21e0._0_8_;
        uStack_14e8 = local_21e0._8_8_;
        local_720 = local_2240;
        uStack_718 = uStack_2238;
        local_730 = local_21f0;
        uStack_728 = uStack_21e8;
        local_740 = local_21e0._0_8_;
        uStack_738 = local_21e0._8_8_;
        auVar216._8_8_ = uStack_21e8;
        auVar216._0_8_ = local_21f0;
        auVar265 = vfmadd213ps_fma(auVar216,auVar265,local_21e0);
        local_2240 = auVar265._0_8_;
        uVar5 = local_2240;
        uStack_2238 = auVar265._8_8_;
        uVar6 = uStack_2238;
        local_2170 = 0x3f8000003f800000;
        uStack_2168 = 0x3f8000003f800000;
        local_2160._0_4_ = auVar265._0_4_;
        local_2160._4_4_ = auVar265._4_4_;
        uStack_2158._0_4_ = auVar265._8_4_;
        uStack_2158._4_4_ = auVar265._12_4_;
        local_2240 = CONCAT44(local_2160._4_4_ + 1.0,(float)local_2160 + 1.0);
        uStack_2238._0_4_ = (float)uStack_2158 + 1.0;
        uStack_2238._4_4_ = uStack_2158._4_4_ + 1.0;
        local_230._0_4_ = local_2200._0_4_;
        local_230._4_4_ = local_2200._4_4_;
        uStack_228._0_4_ = local_2200._8_4_;
        uStack_228._4_4_ = local_2200._12_4_;
        local_2210._4_4_ = (int)local_230._4_4_;
        local_2210._0_4_ = (int)(float)local_230;
        local_2210._8_4_ = (int)(float)uStack_228;
        local_2210._12_4_ = (int)uStack_228._4_4_;
        local_120 = local_2210._0_8_;
        uStack_118 = local_2210._8_8_;
        local_130 = 0x7f0000007f;
        uStack_128 = 0x7f0000007f;
        auVar256._8_8_ = local_2210._8_8_;
        auVar256._0_8_ = local_2210._0_8_;
        auVar255._8_8_ = 0x7f0000007f;
        auVar255._0_8_ = 0x7f0000007f;
        auVar265 = vpaddd_avx(auVar256,auVar255);
        local_2210._0_8_ = auVar265._0_8_;
        local_a0 = local_2210._0_8_;
        local_2210._8_8_ = auVar265._8_8_;
        uStack_98 = local_2210._8_8_;
        local_a4 = 0x17;
        local_2210 = vpslld_avx(auVar265,ZEXT416(0x17));
        local_50 = local_2210._0_8_;
        uStack_48 = local_2210._8_8_;
        local_2250 = local_2210._0_8_;
        uStack_2248 = local_2210._8_8_;
        local_21c0 = local_2240;
        uStack_21b8 = uStack_2238;
        local_21d0._0_4_ = local_2210._0_4_;
        local_21d0._4_4_ = local_2210._4_4_;
        uStack_21c8._0_4_ = local_2210._8_4_;
        uStack_21c8._4_4_ = local_2210._12_4_;
        local_21d0._0_4_ = ((float)local_2160 + 1.0) * (float)local_21d0;
        local_21d0._4_4_ = (local_2160._4_4_ + 1.0) * local_21d0._4_4_;
        uStack_21c8._0_4_ = ((float)uStack_2158 + 1.0) * (float)uStack_21c8;
        uStack_21c8._4_4_ = (uStack_2158._4_4_ + 1.0) * uStack_21c8._4_4_;
        local_2240 = CONCAT44(local_21d0._4_4_,(float)local_21d0);
        uStack_2238._0_4_ = (float)uStack_21c8;
        uStack_2238._4_4_ = uStack_21c8._4_4_;
        local_2380 = local_2240;
        uStack_2378 = uStack_2238;
        local_2074 = 0x3f800000;
        local_2090 = 0x3f800000;
        local_2390 = 0x3f8000003f800000;
        uStack_2388 = 0x3f8000003f800000;
        local_24e0._4_4_ = local_21d0._4_4_ + 1.0;
        local_24e0._0_4_ = (float)local_21d0 + 1.0;
        uStack_24d8._0_4_ = (float)uStack_21c8 + 1.0;
        uStack_24d8._4_4_ = uStack_21c8._4_4_ + 1.0;
        local_2500 = 0x3f800000;
        uStack_24fc = 0x3f800000;
        uStack_24f8 = 0x3f800000;
        uStack_24f4 = 0x3f800000;
        local_1b20 = local_24e0;
        uStack_1b18 = uStack_24d8;
        local_1b50._0_8_ = local_1b90._0_8_;
        local_1b30 = local_1b50._0_8_;
        local_1b50._8_8_ = local_1b90._8_8_;
        uStack_1b28 = local_1b50._8_8_;
        auVar133._8_8_ = uStack_24d8;
        auVar133._0_8_ = local_24e0;
        local_2510 = vcmpps_avx(auVar133,local_1b90,2);
        local_1a60 = local_24e0;
        uStack_1a58 = uStack_24d8;
        local_1a70 = 0x800000;
        uStack_1a6c = 0x800000;
        uStack_1a68 = 0x800000;
        uStack_1a64 = 0x800000;
        auVar140._8_8_ = uStack_24d8;
        auVar140._0_8_ = local_24e0;
        auVar139._8_4_ = 0x800000;
        auVar139._0_8_ = 0x80000000800000;
        auVar139._12_4_ = 0x800000;
        auVar265 = vmaxps_avx(auVar140,auVar139);
        local_24e0 = auVar265._0_8_;
        local_19f0 = local_24e0;
        uStack_24d8 = auVar265._8_8_;
        uStack_19e8 = uStack_24d8;
        local_1a20 = local_24e0;
        uStack_1a18 = uStack_24d8;
        local_1a24 = 0x17;
        auVar264 = vpsrld_avx(auVar265,ZEXT416(0x17));
        local_1900 = local_24e0;
        uStack_18f8 = uStack_24d8;
        local_1910 = 0x807fffff;
        uStack_190c = 0x807fffff;
        uStack_1908 = 0x807fffff;
        uStack_1904 = 0x807fffff;
        auVar148._8_4_ = 0x807fffff;
        auVar148._0_8_ = 0x807fffff807fffff;
        auVar148._12_4_ = 0x807fffff;
        auVar265 = vpand_avx(auVar265,auVar148);
        local_24e0 = auVar265._0_8_;
        local_1860 = local_24e0;
        uStack_24d8 = auVar265._8_8_;
        uStack_1858 = uStack_24d8;
        local_1870 = 0x3f000000;
        uStack_186c = 0x3f000000;
        uStack_1868 = 0x3f000000;
        uStack_1864 = 0x3f000000;
        auVar151._8_4_ = 0x3f000000;
        auVar151._0_8_ = 0x3f0000003f000000;
        auVar151._12_4_ = 0x3f000000;
        auVar263 = vpor_avx(auVar265,auVar151);
        local_24f0._0_8_ = auVar264._0_8_;
        local_1800 = local_24f0._0_8_;
        local_24f0._8_8_ = auVar264._8_8_;
        uStack_17f8 = local_24f0._8_8_;
        local_1810 = 0x7f0000007f;
        uStack_1808 = 0x7f0000007f;
        auVar153._8_8_ = 0x7f0000007f;
        auVar153._0_8_ = 0x7f0000007f;
        local_24f0 = vpsubd_avx(auVar264,auVar153);
        local_1790 = local_24f0._0_8_;
        uStack_1788 = local_24f0._8_8_;
        auVar265 = vcvtdq2ps_avx(local_24f0);
        local_2520 = auVar265._0_8_;
        uVar7 = local_2520;
        uStack_2518 = auVar265._8_8_;
        uVar8 = uStack_2518;
        local_2430 = 0x3f8000003f800000;
        uStack_2428 = 0x3f8000003f800000;
        local_2420._0_4_ = auVar265._0_4_;
        local_2420._4_4_ = auVar265._4_4_;
        uStack_2418._0_4_ = auVar265._8_4_;
        uStack_2418._4_4_ = auVar265._12_4_;
        local_2520._4_4_ = local_2420._4_4_ + 1.0;
        local_2520._0_4_ = (float)local_2420 + 1.0;
        uStack_2518._0_4_ = (float)uStack_2418 + 1.0;
        uStack_2518._4_4_ = uStack_2418._4_4_ + 1.0;
        local_24e0 = auVar263._0_8_;
        local_1760 = local_24e0;
        uStack_24d8 = auVar263._8_8_;
        uStack_1758 = uStack_24d8;
        local_1770 = 0x3f3504f3;
        uStack_176c = 0x3f3504f3;
        uStack_1768 = 0x3f3504f3;
        uStack_1764 = 0x3f3504f3;
        auVar159._8_4_ = 0x3f3504f3;
        auVar159._0_8_ = 0x3f3504f33f3504f3;
        auVar159._12_4_ = 0x3f3504f3;
        local_2530 = vcmpps_avx(auVar263,auVar159,1);
        local_1920 = local_24e0;
        uStack_1918 = uStack_24d8;
        local_1930 = local_2530._0_8_;
        uStack_1928 = local_2530._8_8_;
        local_2540 = vpand_avx(auVar263,local_2530);
        local_2000 = local_24e0;
        uStack_1ff8 = uStack_24d8;
        local_2010 = 0x3f8000003f800000;
        uStack_2008 = 0x3f8000003f800000;
        auVar264._8_8_ = 0x3f8000003f800000;
        auVar264._0_8_ = 0x3f8000003f800000;
        auVar265 = vsubps_avx(auVar263,auVar264);
        local_2020 = local_2520;
        uStack_2018 = uStack_2518;
        local_1940 = 0x3f8000003f800000;
        uStack_1938 = 0x3f8000003f800000;
        local_1950 = local_2530._0_8_;
        uStack_1948 = local_2530._8_8_;
        auVar147._8_8_ = 0x3f8000003f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar263 = vmovdqa64_avx512vl(local_2530);
        local_2030 = vpandd_avx512vl(auVar147,auVar263);
        auVar263._8_8_ = uStack_2518;
        auVar263._0_8_ = local_2520;
        _local_2520 = vsubps_avx(auVar263,local_2030);
        local_24e0 = auVar265._0_8_;
        uVar9 = local_24e0;
        uStack_24d8 = auVar265._8_8_;
        uVar10 = uStack_24d8;
        local_2440._0_4_ = auVar265._0_4_;
        local_2440._4_4_ = auVar265._4_4_;
        uStack_2438._0_4_ = auVar265._8_4_;
        uStack_2438._4_4_ = auVar265._12_4_;
        local_2450._0_4_ = local_2540._0_4_;
        local_2450._4_4_ = local_2540._4_4_;
        uStack_2448._0_4_ = local_2540._8_4_;
        uStack_2448._4_4_ = local_2540._12_4_;
        local_24e0._0_4_ = (float)local_2440 + (float)local_2450;
        local_24e0._4_4_ = local_2440._4_4_ + local_2450._4_4_;
        uStack_2438._0_4_ = (float)uStack_2438 + (float)uStack_2448;
        uStack_2438._4_4_ = uStack_2438._4_4_ + uStack_2448._4_4_;
        uStack_24d8._0_4_ = (float)uStack_2438;
        uStack_24d8._4_4_ = uStack_2438._4_4_;
        local_2490 = local_24e0;
        uStack_2488 = uStack_24d8;
        local_2550 = (float)local_24e0._0_4_ * (float)local_24e0._0_4_;
        fStack_254c = (float)local_24e0._4_4_ * (float)local_24e0._4_4_;
        fStack_2548 = (float)uStack_2438 * (float)uStack_2438;
        fStack_2544 = uStack_2438._4_4_ * uStack_2438._4_4_;
        uStack_2558._0_4_ = 0x3d9021bb;
        local_2560 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_2558._4_4_ = 0x3d9021bb;
        local_10e0 = 0x3d9021bb3d9021bb;
        uStack_10d8 = uStack_2558;
        local_10f0 = local_24e0;
        uStack_10e8 = uStack_24d8;
        local_1100 = 0xbdebd1b8;
        uStack_10fc = 0xbdebd1b8;
        uStack_10f8 = 0xbdebd1b8;
        uStack_10f4 = 0xbdebd1b8;
        local_b10 = 0x3d9021bb3d9021bb;
        uStack_b08 = uStack_2558;
        local_b20 = local_24e0;
        uStack_b18 = uStack_24d8;
        local_b30 = 0xbdebd1b8bdebd1b8;
        uStack_b28 = 0xbdebd1b8bdebd1b8;
        auVar184._8_8_ = uStack_2558;
        auVar184._0_8_ = 0x3d9021bb3d9021bb;
        auVar183._8_8_ = uStack_24d8;
        auVar183._0_8_ = local_24e0;
        auVar182._8_8_ = 0xbdebd1b8bdebd1b8;
        auVar182._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar265 = vfmadd213ps_avx512vl(auVar183,auVar184,auVar182);
        local_2560 = auVar265._0_8_;
        local_1110 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_1108 = uStack_2558;
        local_1120 = local_24e0;
        uStack_1118 = uStack_24d8;
        local_1130 = 0x3def251a;
        uStack_112c = 0x3def251a;
        uStack_1128 = 0x3def251a;
        uStack_1124 = 0x3def251a;
        local_ae0 = local_2560;
        uStack_ad8 = uStack_2558;
        local_af0 = local_24e0;
        uStack_ae8 = uStack_24d8;
        local_b00 = 0x3def251a3def251a;
        uStack_af8 = 0x3def251a3def251a;
        auVar186._8_8_ = uStack_24d8;
        auVar186._0_8_ = local_24e0;
        auVar185._8_8_ = 0x3def251a3def251a;
        auVar185._0_8_ = 0x3def251a3def251a;
        auVar265 = vfmadd213ps_avx512vl(auVar186,auVar265,auVar185);
        local_2560 = auVar265._0_8_;
        local_1140 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_1138 = uStack_2558;
        local_1150 = local_24e0;
        uStack_1148 = uStack_24d8;
        local_1160 = 0xbdfe5d4f;
        uStack_115c = 0xbdfe5d4f;
        uStack_1158 = 0xbdfe5d4f;
        uStack_1154 = 0xbdfe5d4f;
        local_ab0 = local_2560;
        uStack_aa8 = uStack_2558;
        local_ac0 = local_24e0;
        uStack_ab8 = uStack_24d8;
        local_ad0 = 0xbdfe5d4fbdfe5d4f;
        uStack_ac8 = 0xbdfe5d4fbdfe5d4f;
        auVar188._8_8_ = uStack_24d8;
        auVar188._0_8_ = local_24e0;
        auVar187._8_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar187._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar265 = vfmadd213ps_avx512vl(auVar188,auVar265,auVar187);
        local_2560 = auVar265._0_8_;
        local_1170 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_1168 = uStack_2558;
        local_1180 = local_24e0;
        uStack_1178 = uStack_24d8;
        local_1190 = 0x3e11e9bf;
        uStack_118c = 0x3e11e9bf;
        uStack_1188 = 0x3e11e9bf;
        uStack_1184 = 0x3e11e9bf;
        local_a80 = local_2560;
        uStack_a78 = uStack_2558;
        local_a90 = local_24e0;
        uStack_a88 = uStack_24d8;
        local_aa0 = 0x3e11e9bf3e11e9bf;
        uStack_a98 = 0x3e11e9bf3e11e9bf;
        auVar190._8_8_ = uStack_24d8;
        auVar190._0_8_ = local_24e0;
        auVar189._8_8_ = 0x3e11e9bf3e11e9bf;
        auVar189._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar265 = vfmadd213ps_avx512vl(auVar190,auVar265,auVar189);
        local_2560 = auVar265._0_8_;
        local_11a0 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_1198 = uStack_2558;
        local_11b0 = local_24e0;
        uStack_11a8 = uStack_24d8;
        local_11c0 = 0xbe2aae50;
        uStack_11bc = 0xbe2aae50;
        uStack_11b8 = 0xbe2aae50;
        uStack_11b4 = 0xbe2aae50;
        local_a50 = local_2560;
        uStack_a48 = uStack_2558;
        local_a60 = local_24e0;
        uStack_a58 = uStack_24d8;
        local_a70 = 0xbe2aae50be2aae50;
        uStack_a68 = 0xbe2aae50be2aae50;
        auVar192._8_8_ = uStack_24d8;
        auVar192._0_8_ = local_24e0;
        auVar191._8_8_ = 0xbe2aae50be2aae50;
        auVar191._0_8_ = 0xbe2aae50be2aae50;
        auVar265 = vfmadd213ps_avx512vl(auVar192,auVar265,auVar191);
        local_2560 = auVar265._0_8_;
        local_11d0 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_11c8 = uStack_2558;
        local_11e0 = local_24e0;
        uStack_11d8 = uStack_24d8;
        local_11f0 = 0x3e4cceac;
        uStack_11ec = 0x3e4cceac;
        uStack_11e8 = 0x3e4cceac;
        uStack_11e4 = 0x3e4cceac;
        local_a20 = local_2560;
        uStack_a18 = uStack_2558;
        local_a30 = local_24e0;
        uStack_a28 = uStack_24d8;
        local_a40 = 0x3e4cceac3e4cceac;
        uStack_a38 = 0x3e4cceac3e4cceac;
        auVar194._8_8_ = uStack_24d8;
        auVar194._0_8_ = local_24e0;
        auVar193._8_8_ = 0x3e4cceac3e4cceac;
        auVar193._0_8_ = 0x3e4cceac3e4cceac;
        auVar265 = vfmadd213ps_avx512vl(auVar194,auVar265,auVar193);
        local_2560 = auVar265._0_8_;
        local_1200 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_11f8 = uStack_2558;
        local_1210 = local_24e0;
        uStack_1208 = uStack_24d8;
        local_1220 = 0xbe7ffffc;
        uStack_121c = 0xbe7ffffc;
        uStack_1218 = 0xbe7ffffc;
        uStack_1214 = 0xbe7ffffc;
        local_9f0 = local_2560;
        uStack_9e8 = uStack_2558;
        local_a00 = local_24e0;
        uStack_9f8 = uStack_24d8;
        local_a10 = 0xbe7ffffcbe7ffffc;
        uStack_a08 = 0xbe7ffffcbe7ffffc;
        auVar196._8_8_ = uStack_24d8;
        auVar196._0_8_ = local_24e0;
        auVar195._8_8_ = 0xbe7ffffcbe7ffffc;
        auVar195._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar265 = vfmadd213ps_avx512vl(auVar196,auVar265,auVar195);
        local_2560 = auVar265._0_8_;
        local_1230 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_1228 = uStack_2558;
        local_1240 = local_24e0;
        uStack_1238 = uStack_24d8;
        local_1250 = 0x3eaaaaaa;
        uStack_124c = 0x3eaaaaaa;
        uStack_1248 = 0x3eaaaaaa;
        uStack_1244 = 0x3eaaaaaa;
        local_9c0 = local_2560;
        uStack_9b8 = uStack_2558;
        local_9d0 = local_24e0;
        uStack_9c8 = uStack_24d8;
        local_9e0 = 0x3eaaaaaa3eaaaaaa;
        uStack_9d8 = 0x3eaaaaaa3eaaaaaa;
        auVar198._8_8_ = uStack_24d8;
        auVar198._0_8_ = local_24e0;
        auVar197._8_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar197._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar265 = vfmadd213ps_avx512vl(auVar198,auVar265,auVar197);
        local_2560 = auVar265._0_8_;
        uVar11 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uVar12 = uStack_2558;
        local_24b0 = local_24e0;
        uStack_24a8 = uStack_24d8;
        local_24a0._0_4_ = auVar265._0_4_;
        local_24a0._4_4_ = auVar265._4_4_;
        uStack_2498._0_4_ = auVar265._8_4_;
        uStack_2498._4_4_ = auVar265._12_4_;
        local_2560._4_4_ = local_24a0._4_4_ * (float)local_24e0._4_4_;
        local_2560._0_4_ = (float)local_24a0 * (float)local_24e0._0_4_;
        uStack_2558._0_4_ = (float)uStack_2498 * (float)uStack_2438;
        uStack_2558._4_4_ = uStack_2498._4_4_ * uStack_2438._4_4_;
        local_24c0 = local_2560;
        uStack_24b8 = uStack_2558;
        local_24d0 = CONCAT44(fStack_254c,local_2550);
        uStack_24c8 = CONCAT44(fStack_2544,fStack_2548);
        local_2560._4_4_ = local_24a0._4_4_ * (float)local_24e0._4_4_ * fStack_254c;
        local_2560._0_4_ = (float)local_24a0 * (float)local_24e0._0_4_ * local_2550;
        uStack_2558._0_4_ = (float)uStack_2498 * (float)uStack_2438 * fStack_2548;
        uStack_2558._4_4_ = uStack_2498._4_4_ * uStack_2438._4_4_ * fStack_2544;
        local_1260 = local_2520;
        uStack_1258 = uStack_2518;
        local_1280 = local_2560;
        uStack_1278 = uStack_2558;
        local_1270 = 0xb95e8083;
        uStack_126c = 0xb95e8083;
        uStack_1268 = 0xb95e8083;
        uStack_1264 = 0xb95e8083;
        local_990 = local_2520;
        uStack_988 = uStack_2518;
        local_9a0 = 0xb95e8083b95e8083;
        uStack_998 = 0xb95e8083b95e8083;
        local_9b0 = local_2560;
        uStack_9a8 = uStack_2558;
        auVar200._8_8_ = 0xb95e8083b95e8083;
        auVar200._0_8_ = 0xb95e8083b95e8083;
        auVar199._8_8_ = uStack_2558;
        auVar199._0_8_ = local_2560;
        auVar265 = vfmadd213ps_avx512vl(auVar200,_local_2520,auVar199);
        local_d50 = CONCAT44(fStack_254c,local_2550);
        uStack_d48 = CONCAT44(fStack_2544,fStack_2548);
        local_2560 = auVar265._0_8_;
        local_d70 = local_2560;
        uStack_2558 = auVar265._8_8_;
        uStack_d68 = uStack_2558;
        local_d60 = 0x3f000000;
        uStack_d5c = 0x3f000000;
        uStack_d58 = 0x3f000000;
        uStack_d54 = 0x3f000000;
        local_490 = 0x3f0000003f000000;
        uStack_488 = 0x3f0000003f000000;
        local_4a0 = local_2560;
        uStack_498 = uStack_2558;
        auVar234._8_8_ = uStack_d48;
        auVar234._0_8_ = local_d50;
        auVar233._8_8_ = 0x3f0000003f000000;
        auVar233._0_8_ = 0x3f0000003f000000;
        _local_2560 = vfnmadd213ps_avx512vl(auVar233,auVar234,auVar265);
        local_2460 = local_24e0;
        uStack_2458 = uStack_24d8;
        local_2470._0_4_ = local_2560._0_4_;
        local_2470._4_4_ = local_2560._4_4_;
        uStack_2468._0_4_ = local_2560._8_4_;
        uStack_2468._4_4_ = local_2560._12_4_;
        local_24e0._4_4_ = (float)local_24e0._4_4_ + local_2470._4_4_;
        local_24e0._0_4_ = (float)local_24e0._0_4_ + (float)local_2470;
        uStack_24d8._0_4_ = (float)uStack_2438 + (float)uStack_2468;
        uStack_24d8._4_4_ = uStack_2438._4_4_ + uStack_2468._4_4_;
        local_1290 = local_2520;
        uStack_1288 = uStack_2518;
        local_12b0 = local_24e0;
        uStack_12a8 = uStack_24d8;
        local_12a0 = 0x3f318000;
        uStack_129c = 0x3f318000;
        uStack_1298 = 0x3f318000;
        uStack_1294 = 0x3f318000;
        local_960 = local_2520;
        uStack_958 = uStack_2518;
        local_970 = 0x3f3180003f318000;
        uStack_968 = 0x3f3180003f318000;
        local_980 = local_24e0;
        uStack_978 = uStack_24d8;
        auVar202._8_8_ = 0x3f3180003f318000;
        auVar202._0_8_ = 0x3f3180003f318000;
        auVar201._8_8_ = uStack_24d8;
        auVar201._0_8_ = local_24e0;
        auVar265 = vfmadd213ps_avx512vl(auVar202,_local_2520,auVar201);
        local_24e0 = auVar265._0_8_;
        local_1880 = local_24e0;
        uStack_24d8 = auVar265._8_8_;
        uStack_1878 = uStack_24d8;
        local_1890 = local_2510._0_8_;
        uStack_1888 = local_2510._8_8_;
        _local_24e0 = vpor_avx(auVar265,local_2510);
        local_26a0 = local_24e0;
        uStack_2698 = uStack_24d8;
        local_20f4 = 0x3f800000;
        local_2110 = 0x3f800000;
        local_26b0 = 0x3f8000003f800000;
        uStack_26a8 = 0x3f8000003f800000;
        local_2114 = 0x40000000;
        local_2130 = 0x40000000;
        local_26c0 = 0x4000000040000000;
        uStack_26b8 = 0x4000000040000000;
        local_2660._0_4_ = local_24e0._0_4_;
        local_2660._4_4_ = local_24e0._4_4_;
        uStack_2658._0_4_ = local_24e0._8_4_;
        uStack_2658._4_4_ = local_24e0._12_4_;
        local_1f60 = (float)local_2660 * 2.0;
        fStack_1f5c = local_2660._4_4_ * 2.0;
        fStack_1f58 = (float)uStack_2658 * 2.0;
        fStack_1f54 = uStack_2658._4_4_ * 2.0;
        local_1df4 = 0x3f800000;
        local_1e10 = 0x3f800000;
        local_1f70 = 0x3f8000003f800000;
        uStack_1f68 = 0x3f8000003f800000;
        local_1f40._8_8_ = 0x3f8000003f800000;
        local_1f40._0_8_ = 0x3f8000003f800000;
        local_1dc0 = local_1b50._0_8_;
        uStack_1db8 = local_1b50._8_8_;
        local_1dd0 = CONCAT44(fStack_1f5c,local_1f60);
        uStack_1dc8 = CONCAT44(fStack_1f54,fStack_1f58);
        auVar262._8_8_ = uStack_1dc8;
        auVar262._0_8_ = local_1dd0;
        auVar265 = vsubps_avx512vl(local_1b90,auVar262);
        in_ZMM16 = ZEXT1664(local_1b90);
        local_1f00 = 0x3f800000;
        uStack_1efc = 0x3f800000;
        uStack_1ef8 = 0x3f800000;
        uStack_1ef4 = 0x3f800000;
        local_1ec0._0_8_ = auVar265._0_8_;
        local_2c0 = local_1ec0._0_8_;
        local_1ec0._8_8_ = auVar265._8_8_;
        uStack_2b8 = local_1ec0._8_8_;
        local_2d0 = 0x42b0c0a5;
        uStack_2cc = 0x42b0c0a5;
        uStack_2c8 = 0x42b0c0a5;
        uStack_2c4 = 0x42b0c0a5;
        auVar244._8_4_ = 0x42b0c0a5;
        auVar244._0_8_ = 0x42b0c0a542b0c0a5;
        auVar244._12_4_ = 0x42b0c0a5;
        auVar265 = vminps_avx(auVar265,auVar244);
        local_1ec0._0_8_ = auVar265._0_8_;
        local_1ac0 = local_1ec0._0_8_;
        local_1ec0._8_8_ = auVar265._8_8_;
        uStack_1ab8 = local_1ec0._8_8_;
        local_1ad0 = 0xc2b0c0a5;
        uStack_1acc = 0xc2b0c0a5;
        uStack_1ac8 = 0xc2b0c0a5;
        uStack_1ac4 = 0xc2b0c0a5;
        auVar136._8_4_ = 0xc2b0c0a5;
        auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar136._12_4_ = 0xc2b0c0a5;
        auVar264 = vmaxps_avx(auVar265,auVar136);
        local_1ec0._0_8_ = auVar264._0_8_;
        uVar13 = local_1ec0._0_8_;
        local_1ec0._8_8_ = auVar264._8_8_;
        uVar14 = local_1ec0._8_8_;
        local_1e70 = 0x3fb8aa3b;
        uStack_1e6c = 0x3fb8aa3b;
        uStack_1e68 = 0x3fb8aa3b;
        uStack_1e64 = 0x3fb8aa3b;
        local_1e60._0_4_ = auVar264._0_4_;
        local_1e60._4_4_ = auVar264._4_4_;
        uStack_1e58._0_4_ = auVar264._8_4_;
        uStack_1e58._4_4_ = auVar264._12_4_;
        local_1ee0._4_4_ = local_1e60._4_4_ * 1.442695;
        local_1ee0._0_4_ = (float)local_1e60 * 1.442695;
        uStack_1ed8._0_4_ = (float)uStack_1e58 * 1.442695;
        uStack_1ed8._4_4_ = uStack_1e58._4_4_ * 1.442695;
        local_1e20 = local_1ee0;
        uStack_1e18 = uStack_1ed8;
        local_1e30 = 0x3f000000;
        uStack_1e2c = 0x3f000000;
        uStack_1e28 = 0x3f000000;
        uStack_1e24 = 0x3f000000;
        local_1ee0._0_4_ = (float)local_1e60 * 1.442695 + 0.5;
        local_1ee0._4_4_ = local_1e60._4_4_ * 1.442695 + 0.5;
        fVar271 = (float)uStack_1e58 * 1.442695 + 0.5;
        fVar275 = uStack_1e58._4_4_ * 1.442695 + 0.5;
        uStack_1ed8._0_4_ = fVar271;
        uStack_1ed8._4_4_ = fVar275;
        local_240 = local_1ee0;
        uStack_238 = uStack_1ed8;
        local_1ef0._4_4_ = (int)(float)local_1ee0._4_4_;
        local_1ef0._0_4_ = (int)(float)local_1ee0._0_4_;
        local_1ef0._8_4_ = (int)fVar271;
        local_1ef0._12_4_ = (int)fVar275;
        local_17c0 = local_1ef0._0_8_;
        uStack_17b8 = local_1ef0._8_8_;
        auVar156._8_8_ = local_1ef0._8_8_;
        auVar156._0_8_ = local_1ef0._0_8_;
        auVar263 = vcvtdq2ps_avx(auVar156);
        local_1ed0 = auVar263._0_8_;
        local_1c0 = local_1ed0;
        uStack_1ec8 = auVar263._8_8_;
        uStack_1b8 = uStack_1ec8;
        local_1d0 = local_1ee0;
        uStack_1c8 = uStack_1ed8;
        auVar248._8_8_ = uStack_1ed8;
        auVar248._0_8_ = local_1ee0;
        auVar265 = vcmpps_avx(auVar248,auVar263,1);
        local_1f10._0_8_ = auVar265._0_8_;
        local_19a0 = local_1f10._0_8_;
        local_1f10._8_8_ = auVar265._8_8_;
        uStack_1998 = local_1f10._8_8_;
        local_19b0 = 0x3f8000003f800000;
        uStack_19a8 = 0x3f8000003f800000;
        auVar144._8_8_ = 0x3f8000003f800000;
        auVar144._0_8_ = 0x3f8000003f800000;
        local_1f10 = vpand_avx(auVar265,auVar144);
        local_1de0 = local_1ed0;
        uStack_1dd8 = uStack_1ec8;
        local_1df0 = local_1f10._0_8_;
        uStack_1de8 = local_1f10._8_8_;
        _local_1ee0 = vsubps_avx(auVar263,local_1f10);
        local_e40 = local_1ee0;
        uStack_e38 = uStack_1ed8;
        local_e60 = local_1ec0._0_8_;
        uStack_e58 = local_1ec0._8_8_;
        local_e50 = 0x3f318000;
        uStack_e4c = 0x3f318000;
        uStack_e48 = 0x3f318000;
        uStack_e44 = 0x3f318000;
        local_390 = local_1ee0;
        uStack_388 = uStack_1ed8;
        local_3a0 = 0x3f3180003f318000;
        uStack_398 = 0x3f3180003f318000;
        local_3b0 = local_1ec0._0_8_;
        uStack_3a8 = local_1ec0._8_8_;
        auVar239._8_8_ = 0x3f3180003f318000;
        auVar239._0_8_ = 0x3f3180003f318000;
        auVar265 = vfnmadd213ps_fma(auVar239,_local_1ee0,auVar264);
        local_e70 = local_1ee0;
        uStack_e68 = uStack_1ed8;
        local_1ec0._0_8_ = auVar265._0_8_;
        local_e90 = local_1ec0._0_8_;
        local_1ec0._8_8_ = auVar265._8_8_;
        uStack_e88 = local_1ec0._8_8_;
        local_e80 = 0xb95e8083;
        uStack_e7c = 0xb95e8083;
        uStack_e78 = 0xb95e8083;
        uStack_e74 = 0xb95e8083;
        local_360 = local_1ee0;
        uStack_358 = uStack_1ed8;
        local_370 = 0xb95e8083b95e8083;
        uStack_368 = 0xb95e8083b95e8083;
        local_380 = local_1ec0._0_8_;
        uStack_378 = local_1ec0._8_8_;
        auVar240._8_8_ = 0xb95e8083b95e8083;
        auVar240._0_8_ = 0xb95e8083b95e8083;
        local_1ec0 = vfnmadd213ps_fma(auVar240,_local_1ee0,auVar265);
        local_1e90 = local_1ec0._0_8_;
        uStack_1e88 = local_1ec0._8_8_;
        local_1e80._0_4_ = local_1ec0._0_4_;
        local_1e80._4_4_ = local_1ec0._4_4_;
        uStack_1e78._0_4_ = local_1ec0._8_4_;
        uStack_1e78._4_4_ = local_1ec0._12_4_;
        local_1ed0 = CONCAT44(local_1e80._4_4_ * local_1e80._4_4_,
                              (float)local_1e80 * (float)local_1e80);
        uStack_1ec8._0_4_ = (float)uStack_1e78 * (float)uStack_1e78;
        uStack_1ec8._4_4_ = uStack_1e78._4_4_ * uStack_1e78._4_4_;
        uStack_1f18._0_4_ = 0x39506967;
        local_1f20 = (undefined1  [8])0x3950696739506967;
        uStack_1f18._4_4_ = 0x39506967;
        local_1500 = 0x3950696739506967;
        uStack_14f8 = uStack_1f18;
        local_1510 = local_1ec0._0_8_;
        uStack_1508 = local_1ec0._8_8_;
        local_1520 = 0x3ab743ce;
        uStack_151c = 0x3ab743ce;
        uStack_1518 = 0x3ab743ce;
        uStack_1514 = 0x3ab743ce;
        local_6f0 = 0x3950696739506967;
        uStack_6e8 = uStack_1f18;
        local_700 = local_1ec0._0_8_;
        uStack_6f8 = local_1ec0._8_8_;
        local_710 = 0x3ab743ce3ab743ce;
        uStack_708 = 0x3ab743ce3ab743ce;
        auVar218._8_8_ = uStack_1f18;
        auVar218._0_8_ = 0x3950696739506967;
        auVar217._8_8_ = 0x3ab743ce3ab743ce;
        auVar217._0_8_ = 0x3ab743ce3ab743ce;
        auVar265 = vfmadd213ps_fma(local_1ec0,auVar218,auVar217);
        local_1f20 = auVar265._0_8_;
        local_1530 = local_1f20;
        uStack_1f18 = auVar265._8_8_;
        uStack_1528 = uStack_1f18;
        local_1540 = local_1ec0._0_8_;
        uStack_1538 = local_1ec0._8_8_;
        local_1550 = 0x3c088908;
        uStack_154c = 0x3c088908;
        uStack_1548 = 0x3c088908;
        uStack_1544 = 0x3c088908;
        local_6c0 = local_1f20;
        uStack_6b8 = uStack_1f18;
        local_6d0 = local_1ec0._0_8_;
        uStack_6c8 = local_1ec0._8_8_;
        local_6e0 = 0x3c0889083c088908;
        uStack_6d8 = 0x3c0889083c088908;
        auVar219._8_8_ = 0x3c0889083c088908;
        auVar219._0_8_ = 0x3c0889083c088908;
        auVar265 = vfmadd213ps_fma(local_1ec0,auVar265,auVar219);
        local_1f20 = auVar265._0_8_;
        local_1560 = local_1f20;
        uStack_1f18 = auVar265._8_8_;
        uStack_1558 = uStack_1f18;
        local_1570 = local_1ec0._0_8_;
        uStack_1568 = local_1ec0._8_8_;
        local_1580 = 0x3d2aa9c1;
        uStack_157c = 0x3d2aa9c1;
        uStack_1578 = 0x3d2aa9c1;
        uStack_1574 = 0x3d2aa9c1;
        local_690 = local_1f20;
        uStack_688 = uStack_1f18;
        local_6a0 = local_1ec0._0_8_;
        uStack_698 = local_1ec0._8_8_;
        local_6b0 = 0x3d2aa9c13d2aa9c1;
        uStack_6a8 = 0x3d2aa9c13d2aa9c1;
        auVar220._8_8_ = 0x3d2aa9c13d2aa9c1;
        auVar220._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar265 = vfmadd213ps_fma(local_1ec0,auVar265,auVar220);
        local_1f20 = auVar265._0_8_;
        local_1590 = local_1f20;
        uStack_1f18 = auVar265._8_8_;
        uStack_1588 = uStack_1f18;
        local_15a0 = local_1ec0._0_8_;
        uStack_1598 = local_1ec0._8_8_;
        local_15b0 = 0x3e2aaaaa;
        uStack_15ac = 0x3e2aaaaa;
        uStack_15a8 = 0x3e2aaaaa;
        uStack_15a4 = 0x3e2aaaaa;
        local_660 = local_1f20;
        uStack_658 = uStack_1f18;
        local_670 = local_1ec0._0_8_;
        uStack_668 = local_1ec0._8_8_;
        local_680 = 0x3e2aaaaa3e2aaaaa;
        uStack_678 = 0x3e2aaaaa3e2aaaaa;
        auVar221._8_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar221._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar265 = vfmadd213ps_fma(local_1ec0,auVar265,auVar221);
        local_1f20 = auVar265._0_8_;
        local_15c0 = local_1f20;
        uStack_1f18 = auVar265._8_8_;
        uStack_15b8 = uStack_1f18;
        local_15d0 = local_1ec0._0_8_;
        uStack_15c8 = local_1ec0._8_8_;
        local_15e0 = 0x3f000000;
        uStack_15dc = 0x3f000000;
        uStack_15d8 = 0x3f000000;
        uStack_15d4 = 0x3f000000;
        local_630 = local_1f20;
        uStack_628 = uStack_1f18;
        local_640 = local_1ec0._0_8_;
        uStack_638 = local_1ec0._8_8_;
        local_650 = 0x3f0000003f000000;
        uStack_648 = 0x3f0000003f000000;
        auVar222._8_8_ = 0x3f0000003f000000;
        auVar222._0_8_ = 0x3f0000003f000000;
        auVar265 = vfmadd213ps_fma(local_1ec0,auVar265,auVar222);
        local_1f20 = auVar265._0_8_;
        local_15f0 = local_1f20;
        uStack_1f18 = auVar265._8_8_;
        uStack_15e8 = uStack_1f18;
        local_1600 = local_1ed0;
        uStack_15f8 = uStack_1ec8;
        local_1610 = local_1ec0._0_8_;
        uStack_1608 = local_1ec0._8_8_;
        local_600 = local_1f20;
        uStack_5f8 = uStack_1f18;
        local_610 = local_1ed0;
        uStack_608 = uStack_1ec8;
        local_620 = local_1ec0._0_8_;
        uStack_618 = local_1ec0._8_8_;
        auVar223._8_8_ = uStack_1ec8;
        auVar223._0_8_ = local_1ed0;
        auVar265 = vfmadd213ps_fma(auVar223,auVar265,local_1ec0);
        local_1f20 = auVar265._0_8_;
        uVar15 = local_1f20;
        uStack_1f18 = auVar265._8_8_;
        uVar16 = uStack_1f18;
        local_1e50 = 0x3f8000003f800000;
        uStack_1e48 = 0x3f8000003f800000;
        local_1e40._0_4_ = auVar265._0_4_;
        local_1e40._4_4_ = auVar265._4_4_;
        uStack_1e38._0_4_ = auVar265._8_4_;
        uStack_1e38._4_4_ = auVar265._12_4_;
        local_1f20._4_4_ = local_1e40._4_4_ + 1.0;
        local_1f20._0_4_ = (float)local_1e40 + 1.0;
        uStack_1f18._0_4_ = (float)uStack_1e38 + 1.0;
        uStack_1f18._4_4_ = uStack_1e38._4_4_ + 1.0;
        local_250._0_4_ = local_1ee0._0_4_;
        local_250._4_4_ = local_1ee0._4_4_;
        uStack_248._0_4_ = local_1ee0._8_4_;
        uStack_248._4_4_ = local_1ee0._12_4_;
        local_1ef0._4_4_ = (int)local_250._4_4_;
        local_1ef0._0_4_ = (int)(float)local_250;
        local_1ef0._8_4_ = (int)(float)uStack_248;
        local_1ef0._12_4_ = (int)uStack_248._4_4_;
        local_140 = local_1ef0._0_8_;
        uStack_138 = local_1ef0._8_8_;
        local_150 = 0x7f0000007f;
        uStack_148 = 0x7f0000007f;
        auVar254._8_8_ = local_1ef0._8_8_;
        auVar254._0_8_ = local_1ef0._0_8_;
        auVar253._8_8_ = 0x7f0000007f;
        auVar253._0_8_ = 0x7f0000007f;
        auVar265 = vpaddd_avx(auVar254,auVar253);
        local_1ef0._0_8_ = auVar265._0_8_;
        local_c0 = local_1ef0._0_8_;
        local_1ef0._8_8_ = auVar265._8_8_;
        uStack_b8 = local_1ef0._8_8_;
        local_c4 = 0x17;
        local_1ef0 = vpslld_avx(auVar265,ZEXT416(0x17));
        local_60 = local_1ef0._0_8_;
        uStack_58 = local_1ef0._8_8_;
        local_1f30 = local_1ef0._0_8_;
        uStack_1f28 = local_1ef0._8_8_;
        local_1ea0 = _local_1f20;
        local_1eb0._0_4_ = local_1ef0._0_4_;
        local_1eb0._4_4_ = local_1ef0._4_4_;
        uStack_1ea8._0_4_ = local_1ef0._8_4_;
        uStack_1ea8._4_4_ = local_1ef0._12_4_;
        local_1f20._0_4_ = ((float)local_1e40 + 1.0) * (float)local_1eb0;
        local_1f20._4_4_ = (local_1e40._4_4_ + 1.0) * local_1eb0._4_4_;
        uStack_1ea8._0_4_ = ((float)uStack_1e38 + 1.0) * (float)uStack_1ea8;
        uStack_1ea8._4_4_ = (uStack_1e38._4_4_ + 1.0) * uStack_1ea8._4_4_;
        uStack_1f18._0_4_ = (float)uStack_1ea8;
        uStack_1f18._4_4_ = uStack_1ea8._4_4_;
        local_1f50 = local_1f20;
        uStack_1f48 = uStack_1f18;
        local_1bd0 = (float)local_1f20._0_4_ + 1.0;
        fStack_1bcc = (float)local_1f20._4_4_ + 1.0;
        fStack_1bc8 = (float)uStack_1ea8 + 1.0;
        fStack_1bc4 = uStack_1ea8._4_4_ + 1.0;
        auVar132._4_4_ = fStack_1bcc;
        auVar132._0_4_ = local_1bd0;
        auVar132._8_4_ = fStack_1bc8;
        auVar132._12_4_ = fStack_1bc4;
        _local_2680 = vdivps_avx(local_1f40,auVar132);
        local_1fa0._0_4_ = (float)local_2680._0_4_ * 2.0;
        local_1fa0._4_4_ = (float)local_2680._4_4_ * 2.0;
        local_1fa0._8_4_ = fStack_2678 * 2.0;
        local_1fa0._12_4_ = fStack_2674 * 2.0;
        auVar1._8_8_ = 0x3f8000003f800000;
        auVar1._0_8_ = 0x3f8000003f800000;
        _local_2750 = vsubps_avx(local_1fa0,auVar1);
        local_2740._0_4_ = (undefined4)local_7960;
        local_2740._4_4_ = (undefined4)((ulong)local_7960 >> 0x20);
        fStack_2738 = (float)uStack_7958;
        fStack_2734 = (float)((ulong)uStack_7958 >> 0x20);
        local_7d10 = CONCAT44((float)local_2740._4_4_ * (float)local_2750._4_4_,
                              (float)local_2740._0_4_ * (float)local_2750._0_4_);
        uStack_7d08 = CONCAT44(fStack_2734 * fStack_2744,fStack_2738 * fStack_2748);
        local_7928 = local_7c80;
        local_7940 = local_7d10;
        uStack_7938 = uStack_7d08;
        auVar265._8_8_ = uStack_7d08;
        auVar265._0_8_ = local_7d10;
        *(undefined1 (*) [16])*local_7c80 = auVar265;
        local_7c80 = (undefined1 (*) [32])(*local_7c80 + 0x10);
        _local_2740 = auVar18;
        local_2690 = local_26c0;
        uStack_2688 = uStack_26b8;
        local_2670 = local_26c0;
        uStack_2668 = uStack_26b8;
        local_2660 = local_24e0;
        uStack_2658 = uStack_24d8;
        local_24a0 = uVar11;
        uStack_2498 = uVar12;
        local_2480 = local_2490;
        uStack_2478 = uStack_2488;
        local_2470 = local_2560;
        uStack_2468 = uStack_2558;
        local_2450 = local_2540._0_8_;
        uStack_2448 = local_2540._8_8_;
        local_2440 = uVar9;
        uStack_2438 = uVar10;
        local_2420 = uVar7;
        uStack_2418 = uVar8;
        local_21d0 = local_2210._0_8_;
        uStack_21c8 = local_2210._8_8_;
        local_21a0 = local_21b0;
        uStack_2198 = uStack_21a8;
        local_2180 = uVar3;
        uStack_2178 = uVar4;
        local_2160 = uVar5;
        uStack_2158 = uVar6;
        uStack_212c = local_2130;
        uStack_2128 = local_2130;
        uStack_2124 = local_2130;
        uStack_210c = local_2110;
        uStack_2108 = local_2110;
        uStack_2104 = local_2110;
        uStack_208c = local_2090;
        uStack_2088 = local_2090;
        uStack_2084 = local_2090;
        local_1fb0 = local_26b0;
        uStack_1fa8 = uStack_26a8;
        local_1eb0 = local_1ef0._0_8_;
        uStack_1ea8 = local_1ef0._8_8_;
        local_1e80 = local_1e90;
        uStack_1e78 = uStack_1e88;
        local_1e60 = uVar13;
        uStack_1e58 = uVar14;
        local_1e40 = uVar15;
        uStack_1e38 = uVar16;
        uStack_1e0c = local_1e10;
        uStack_1e08 = local_1e10;
        uStack_1e04 = local_1e10;
        local_1bc0 = local_1f40;
        local_1b80 = local_1b90;
        local_1b70 = local_1b90;
        local_1b50 = local_1b90;
        local_480 = local_d50;
        uStack_478 = uStack_d48;
        local_2a0 = local_7960;
        uStack_298 = uStack_7958;
        local_250 = local_1ee0;
        uStack_248 = uStack_1ed8;
        local_230 = local_2200;
        uStack_228 = uStack_21f8;
      }
      for (; local_7ccc < local_7b20; local_7ccc = local_7ccc + 1) {
        fVar271 = *(float *)*local_7c80;
        dVar272 = std::exp((double)(ulong)*(uint *)*local_7c80);
        dVar272 = std::log((double)(ulong)(uint)(SUB84(dVar272,0) + 1.0));
        dVar272 = std::tanh(dVar272);
        *(float *)*local_7c80 = fVar271 * SUB84(dVar272,0);
        local_7c80 = (undefined1 (*) [32])(*local_7c80 + 4);
      }
    }
    local_7af4 = 0;
  }
  return local_7af4;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}